

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

vbool<8>_conflict __thiscall
embree::avx512::InstanceArrayIntersectorKMB<8>::occluded
          (InstanceArrayIntersectorKMB<8> *this,vbool<8>_conflict *valid_i,Precalculations *pre,
          RayK<8> *ray,RayQueryContext *context,Primitive_conflict4 *prim)

{
  BBox1f BVar1;
  RTCFormat RVar2;
  InstanceArray *this_00;
  RTCRayQueryContext *pRVar3;
  RawBufferView *pRVar4;
  char *pcVar5;
  RawBufferView *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  ulong uVar17;
  undefined8 uVar18;
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [12];
  ulong uVar135;
  byte bVar136;
  long lVar137;
  byte bVar138;
  undefined8 unaff_R15;
  ulong uVar140;
  ulong uVar141;
  uint uVar142;
  uint uVar208;
  uint uVar209;
  undefined1 auVar143 [16];
  uint uVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  uint uVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  uint uVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar151 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar171 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar199 [32];
  undefined1 auVar201 [32];
  uint uVar210;
  uint uVar224;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar225;
  float fVar226;
  float fVar234;
  float fVar235;
  undefined1 auVar227 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar236;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined4 uVar240;
  undefined1 auVar241 [16];
  undefined1 auVar247 [32];
  undefined1 auVar242 [16];
  undefined1 auVar248 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [16];
  undefined1 auVar253 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  float fVar259;
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar268;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  float fVar266;
  float fVar267;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar265 [64];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar294 [32];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar295 [64];
  undefined1 auVar296 [16];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar304;
  undefined1 auVar310 [16];
  float fVar319;
  float fVar323;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar305 [16];
  float fVar317;
  float fVar318;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 in_ZMM10 [64];
  undefined1 auVar316 [64];
  undefined1 auVar327 [16];
  undefined1 auVar331 [32];
  float fVar324;
  float fVar340;
  undefined1 auVar332 [32];
  undefined1 auVar328 [16];
  undefined1 auVar333 [32];
  float fVar325;
  float fVar337;
  float fVar339;
  float fVar341;
  undefined1 auVar334 [32];
  undefined1 auVar326 [16];
  undefined1 auVar329 [32];
  float fVar336;
  float fVar338;
  float fVar342;
  float fVar343;
  float fVar344;
  undefined1 in_ZMM11 [64];
  undefined1 auVar335 [64];
  undefined1 auVar345 [16];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar351 [16];
  undefined1 auVar353 [32];
  undefined1 auVar352 [16];
  undefined1 auVar354 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar355 [16];
  undefined1 auVar356 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar357 [28];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar361 [16];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 in_ZMM26 [64];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 in_ZMM28 [64];
  undefined1 auVar373 [16];
  undefined1 in_ZMM29 [64];
  undefined1 auVar374 [16];
  undefined1 in_ZMM30 [64];
  undefined1 auVar375 [16];
  undefined1 in_ZMM31 [64];
  vint<8> itime_k;
  RayQueryContext newcontext;
  undefined1 local_340 [8];
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  uint uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  uint uStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  int iStack_1a4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  uint uStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  uint uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  uint uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  uint uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  uint uStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  uint uStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  uint uStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  uint uStack_84;
  Accel *local_70;
  RTCRayQueryContext *local_68;
  RTCIntersectArguments *local_60;
  ulong uVar139;
  undefined1 auVar184 [32];
  undefined1 auVar152 [32];
  undefined1 auVar170 [32];
  undefined1 auVar172 [32];
  undefined1 auVar175 [32];
  undefined1 auVar198 [32];
  undefined1 auVar200 [32];
  undefined1 auVar301 [32];
  undefined1 auVar311 [32];
  undefined1 auVar330 [32];
  
  bVar138 = valid_i->v;
  this_00 = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  local_70 = InstanceArray::getObject(this_00,(ulong)prim->primID_);
  auVar155 = in_ZMM22._0_32_;
  auVar167 = in_ZMM21._0_32_;
  auVar165 = in_ZMM23._0_32_;
  auVar168 = in_ZMM20._0_32_;
  auVar149 = in_ZMM6._0_32_;
  auVar163 = in_ZMM19._0_32_;
  auVar161 = in_ZMM17._0_32_;
  auVar158 = in_ZMM15._0_32_;
  auVar156 = in_ZMM10._0_32_;
  if (local_70 != (Accel *)0x0) {
    uVar142 = (this_00->super_Geometry).mask;
    auVar166._4_4_ = uVar142;
    auVar166._0_4_ = uVar142;
    auVar166._8_4_ = uVar142;
    auVar166._12_4_ = uVar142;
    auVar166._16_4_ = uVar142;
    auVar166._20_4_ = uVar142;
    auVar166._24_4_ = uVar142;
    auVar166._28_4_ = uVar142;
    uVar18 = vptestmd_avx512vl(auVar166,*(undefined1 (*) [32])(ray + 0x120));
    bVar138 = bVar138 & (byte)uVar18;
    uVar139 = CONCAT71((int7)((ulong)unaff_R15 >> 8),bVar138);
    if (bVar138 != 0) {
      pRVar3 = context->user;
      *this = (InstanceArrayIntersectorKMB<8>)0x0;
      if (pRVar3->instID[0] == 0xffffffff) {
        auVar143._8_8_ = 0;
        auVar143._0_4_ = prim->primID_;
        auVar143._4_4_ = prim->instID_;
        auVar143 = vprolq_avx512vl(auVar143,0x20);
        *pRVar3 = auVar143._0_8_;
        uVar135 = (ulong)prim->primID_;
        if ((this_00->super_Geometry).field_8.field_0x1 == '\x01') {
          BVar1 = (this_00->super_Geometry).time_range;
          auVar148._8_8_ = 0;
          auVar148._0_4_ = BVar1.lower;
          auVar148._4_4_ = BVar1.upper;
          fVar226 = BVar1.lower;
          auVar158._4_4_ = fVar226;
          auVar158._0_4_ = fVar226;
          auVar158._8_4_ = fVar226;
          auVar158._12_4_ = fVar226;
          auVar158._16_4_ = fVar226;
          auVar158._20_4_ = fVar226;
          auVar158._24_4_ = fVar226;
          auVar158._28_4_ = fVar226;
          fVar226 = (this_00->super_Geometry).fnumTimeSegments;
          auVar158 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar158);
          auVar143 = vmovshdup_avx(auVar148);
          auVar166 = ZEXT1632(auVar143);
          auVar143 = vsubps_avx(auVar143,auVar148);
          auVar163._0_4_ = auVar143._0_4_;
          auVar163._4_4_ = auVar163._0_4_;
          auVar163._8_4_ = auVar163._0_4_;
          auVar163._12_4_ = auVar163._0_4_;
          auVar163._16_4_ = auVar163._0_4_;
          auVar163._20_4_ = auVar163._0_4_;
          auVar163._24_4_ = auVar163._0_4_;
          auVar163._28_4_ = auVar163._0_4_;
          auVar158 = vdivps_avx(auVar158,auVar163);
          auVar161._4_4_ = fVar226 * auVar158._4_4_;
          auVar161._0_4_ = fVar226 * auVar158._0_4_;
          auVar161._8_4_ = fVar226 * auVar158._8_4_;
          auVar161._12_4_ = fVar226 * auVar158._12_4_;
          auVar161._16_4_ = fVar226 * auVar158._16_4_;
          auVar161._20_4_ = fVar226 * auVar158._20_4_;
          auVar161._24_4_ = fVar226 * auVar158._24_4_;
          auVar161._28_4_ = auVar158._28_4_;
          auVar158 = vroundps_avx(auVar161,1);
          fVar226 = fVar226 + -1.0;
          auVar153._4_4_ = fVar226;
          auVar153._0_4_ = fVar226;
          auVar153._8_4_ = fVar226;
          auVar153._12_4_ = fVar226;
          auVar153._16_4_ = fVar226;
          auVar153._20_4_ = fVar226;
          auVar153._24_4_ = fVar226;
          auVar153._28_4_ = fVar226;
          auVar158 = vminps_avx(auVar158,auVar153);
          auVar258 = ZEXT1264(ZEXT412(0)) << 0x20;
          auVar158 = vmaxps_avx(auVar158,ZEXT1232(ZEXT412(0)) << 0x20);
          auVar161 = vsubps_avx(auVar161,auVar158);
          local_1e0 = vcvtps2dq_avx(auVar158);
          uVar142 = 0;
          for (uVar208 = (uint)bVar138; (uVar208 & 1) == 0; uVar208 = uVar208 >> 1 | 0x80000000) {
            uVar142 = uVar142 + 1;
          }
          auVar154 = vpbroadcastd_avx512vl();
          auVar265 = ZEXT3264(auVar154);
          uVar18 = vpcmpeqd_avx512vl(local_1e0,auVar154);
          fVar226 = auVar161._0_4_;
          fVar234 = auVar161._4_4_;
          fVar235 = auVar161._8_4_;
          fVar236 = auVar161._12_4_;
          fVar237 = auVar161._16_4_;
          fVar238 = auVar161._20_4_;
          fVar239 = auVar161._24_4_;
          if ((byte)(~bVar138 | (byte)uVar18) == 0xff) {
            pRVar4 = (this_00->l2w_buf).items;
            pRVar6 = pRVar4 + *(int *)(local_1e0 + (ulong)uVar142 * 4);
            RVar2 = pRVar4[*(int *)(local_1e0 + (ulong)uVar142 * 4)].format;
            if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar5 = pRVar6->ptr_ofs;
              lVar137 = pRVar6->stride * uVar135;
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x10)),0x1c);
              auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x20)),0x28);
              auVar154 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x14)),0x1c);
              auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),0x28);
              auVar166 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),0x1c);
              auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x28)),0x28);
              auVar149 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x1c)),0x1c);
              auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x2c)),0x28);
              auVar156 = ZEXT1632(auVar143);
            }
            else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar5 = pRVar6->ptr_ofs;
              lVar137 = pRVar6->stride * uVar135;
              auVar250._8_8_ = 0;
              auVar250._0_8_ = *(ulong *)(pcVar5 + lVar137 + 4);
              auVar284._8_8_ = 0;
              auVar284._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
              auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137)),_DAT_01fbb140,
                                            auVar250);
              auVar154 = ZEXT1632(auVar143);
              auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),_DAT_01fbb140
                                            ,auVar284);
              auVar166 = ZEXT1632(auVar143);
              auVar251._8_8_ = 0;
              auVar251._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
              auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),
                                            _DAT_01fbb140,auVar251);
              auVar149 = ZEXT1632(auVar143);
              auVar252._8_8_ = 0;
              auVar252._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x28);
              auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),
                                            _DAT_01fbb140,auVar252);
              auVar156 = ZEXT1632(auVar143);
            }
            else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar5 = pRVar6->ptr_ofs;
              lVar137 = pRVar6->stride * uVar135;
              auVar243._8_8_ = 0;
              auVar243._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
              auVar143 = vinsertps_avx(auVar243,ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),0x20);
              auVar244._8_8_ = 0;
              auVar244._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x34);
              auVar144 = vpermt2ps_avx512vl(auVar244,_DAT_01fbb150,
                                            ZEXT416(*(uint *)(pcVar5 + lVar137)));
              auVar288._8_8_ = 0;
              auVar288._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
              fVar324 = *(float *)(pcVar5 + lVar137 + 0x24);
              fVar336 = *(float *)(pcVar5 + lVar137 + 0x28);
              fVar338 = *(float *)(pcVar5 + lVar137 + 0x2c);
              auVar145 = vpermt2ps_avx512vl(auVar288,_DAT_01fbb150,
                                            ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)));
              fVar340 = *(float *)(pcVar5 + lVar137 + 0x30);
              auVar148 = vfmadd231ss_fma(ZEXT416((uint)(fVar336 * fVar336)),ZEXT416((uint)fVar324),
                                         ZEXT416((uint)fVar324));
              auVar148 = vfmadd231ss_fma(auVar148,ZEXT416((uint)fVar338),ZEXT416((uint)fVar338));
              auVar148 = vfmadd231ss_fma(auVar148,ZEXT416((uint)fVar340),ZEXT416((uint)fVar340));
              auVar146 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar148._0_4_));
              fVar342 = auVar146._0_4_;
              fVar342 = fVar342 * 1.5 + fVar342 * fVar342 * fVar342 * auVar148._0_4_ * -0.5;
              auVar148 = vinsertps_avx(auVar145,ZEXT416((uint)(fVar324 * fVar342)),0x30);
              auVar156 = ZEXT1632(auVar148);
              auVar148 = vinsertps_avx(auVar144,ZEXT416((uint)(fVar336 * fVar342)),0x30);
              auVar154 = ZEXT1632(auVar148);
              auVar143 = vinsertps_avx(auVar143,ZEXT416((uint)(fVar340 * fVar342)),0x30);
              auVar149 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),0x10);
              auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x3c)),0x20);
              auVar143 = vinsertps_avx(auVar143,ZEXT416((uint)(fVar338 * fVar342)),0x30);
              auVar166 = ZEXT1632(auVar143);
            }
            else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar5 = pRVar6->ptr_ofs;
              lVar137 = pRVar6->stride * uVar135;
              auVar154 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137));
              auVar166 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x10));
              auVar149 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x20));
              auVar156 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x30));
            }
            local_2c0._4_4_ = auVar154._0_4_;
            auVar353._8_4_ = 1;
            auVar353._0_8_ = 0x100000001;
            auVar353._12_4_ = 1;
            auVar353._16_4_ = 1;
            auVar353._20_4_ = 1;
            auVar353._24_4_ = 1;
            auVar353._28_4_ = 1;
            auVar158 = vpermps_avx2(auVar353,auVar154);
            auVar356._8_4_ = 2;
            auVar356._0_8_ = 0x200000002;
            auVar356._12_4_ = 2;
            auVar356._16_4_ = 2;
            auVar356._20_4_ = 2;
            auVar356._24_4_ = 2;
            auVar356._28_4_ = 2;
            auVar163 = vpermps_avx2(auVar356,auVar154);
            auVar159 = vbroadcastss_avx512vl(ZEXT416(3));
            auVar160 = vpermps_avx512vl(auVar159,auVar154);
            local_320._4_4_ = auVar166._0_4_;
            auVar153 = vpermps_avx2(auVar353,auVar166);
            auVar154 = vpermps_avx2(auVar356,auVar166);
            auVar162 = vpermps_avx512vl(auVar159,auVar166);
            local_340._4_4_ = auVar149._0_4_;
            auVar166 = vpermps_avx2(auVar353,auVar149);
            _local_1c0 = vpermps_avx2(auVar356,auVar149);
            auVar150 = vpermps_avx512vl(auVar159,auVar149);
            local_300._4_4_ = auVar156._0_4_;
            auVar149 = vpermps_avx2(auVar353,auVar156);
            auVar157 = vpermps_avx2(auVar356,auVar156);
            auVar156 = vpermps_avx512vl(auVar159,auVar156);
            RVar2 = pRVar6[1].format;
            local_2c0._0_4_ = local_2c0._4_4_;
            local_2c0._8_4_ = local_2c0._4_4_;
            local_2c0._12_4_ = local_2c0._4_4_;
            local_2c0._16_4_ = local_2c0._4_4_;
            local_2c0._20_4_ = local_2c0._4_4_;
            local_2c0._24_4_ = local_2c0._4_4_;
            local_2c0._28_4_ = local_2c0._4_4_;
            local_300._0_4_ = local_300._4_4_;
            uStack_2f8._0_4_ = local_300._4_4_;
            uStack_2f8._4_4_ = local_300._4_4_;
            uStack_2f0._0_4_ = local_300._4_4_;
            uStack_2f0._4_4_ = local_300._4_4_;
            uStack_2e8._0_4_ = local_300._4_4_;
            uStack_2e8._4_4_ = local_300._4_4_;
            local_320._0_4_ = local_320._4_4_;
            local_320._8_4_ = local_320._4_4_;
            local_320._12_4_ = local_320._4_4_;
            local_320._16_4_ = local_320._4_4_;
            local_320._20_4_ = local_320._4_4_;
            local_320._24_4_ = local_320._4_4_;
            local_320._28_4_ = local_320._4_4_;
            local_340._0_4_ = local_340._4_4_;
            uStack_338._0_4_ = local_340._4_4_;
            uStack_338._4_4_ = local_340._4_4_;
            uStack_330._0_4_ = local_340._4_4_;
            uStack_330._4_4_ = local_340._4_4_;
            uStack_328._0_4_ = local_340._4_4_;
            uStack_328._4_4_ = local_340._4_4_;
            if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar5 = pRVar6[1].ptr_ofs;
              lVar137 = uVar135 * pRVar6[1].stride;
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x10)),0x1c);
              auVar143 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x20)),0x28
                                          );
              auVar168 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x14)),0x1c);
              auVar143 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),0x28
                                          );
              auVar165 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),0x1c);
              auVar143 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x28)),0x28
                                          );
              auVar167 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x1c)),0x1c);
              auVar143 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x2c)),0x28
                                          );
              auVar155 = ZEXT1632(auVar143);
            }
            else {
              auVar175._16_16_ = auVar156._16_16_;
              if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar5 = pRVar6[1].ptr_ofs;
                lVar137 = uVar135 * pRVar6[1].stride;
                auVar306._8_8_ = 0;
                auVar306._0_8_ = *(ulong *)(pcVar5 + lVar137 + 4);
                auVar345._8_8_ = 0;
                auVar345._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
                auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137)),_DAT_01fbb140,
                                              auVar306);
                auVar168 = ZEXT1632(auVar143);
                auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                              _DAT_01fbb140,auVar345);
                auVar165 = ZEXT1632(auVar143);
                auVar307._8_8_ = 0;
                auVar307._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
                auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),
                                              _DAT_01fbb140,auVar307);
                auVar167 = ZEXT1632(auVar143);
                auVar308._8_8_ = 0;
                auVar308._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x28);
                auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),
                                              _DAT_01fbb140,auVar308);
                auVar155 = ZEXT1632(auVar143);
              }
              else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                pcVar5 = pRVar6[1].ptr_ofs;
                lVar137 = uVar135 * pRVar6[1].stride;
                auVar309._8_8_ = 0;
                auVar309._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
                auVar143 = vinsertps_avx(auVar309,ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),0x20);
                auVar327._8_8_ = 0;
                auVar327._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x34);
                auVar144 = vpermt2ps_avx512vl(auVar327,_DAT_01fbb150,
                                              ZEXT416(*(uint *)(pcVar5 + lVar137)));
                uVar142 = *(uint *)(pcVar5 + lVar137 + 0x24);
                uVar208 = *(uint *)(pcVar5 + lVar137 + 0x28);
                uVar209 = *(uint *)(pcVar5 + lVar137 + 0x2c);
                auVar361._8_8_ = 0;
                auVar361._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
                auVar145 = vpermt2ps_avx512vl(auVar361,_DAT_01fbb150,
                                              ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)));
                fVar324 = *(float *)(pcVar5 + lVar137 + 0x30);
                auVar148 = vmulss_avx512f(ZEXT416(uVar208),ZEXT416(uVar208));
                auVar148 = vfmadd231ss_avx512f(auVar148,ZEXT416(uVar142),ZEXT416(uVar142));
                auVar148 = vfmadd231ss_avx512f(auVar148,ZEXT416(uVar209),ZEXT416(uVar209));
                auVar148 = vfmadd231ss_fma(auVar148,ZEXT416((uint)fVar324),ZEXT416((uint)fVar324));
                auVar175._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
                auVar174._4_28_ = auVar175._4_28_;
                auVar174._0_4_ = auVar148._0_4_;
                auVar146 = vrsqrt14ss_avx512f(auVar175._0_16_,auVar174._0_16_);
                auVar147 = vmulss_avx512f(auVar146,ZEXT416(0x3fc00000));
                auVar148 = vmulss_avx512f(auVar146,ZEXT416((uint)(auVar148._0_4_ * -0.5)));
                auVar146 = vmulss_avx512f(auVar146,auVar146);
                auVar148 = vmulss_avx512f(auVar146,auVar148);
                auVar146 = vaddss_avx512f(auVar147,auVar148);
                auVar148 = vmulss_avx512f(ZEXT416(uVar142),auVar146);
                auVar148 = vinsertps_avx512f(auVar145,auVar148,0x30);
                auVar155 = ZEXT1632(auVar148);
                auVar148 = vmulss_avx512f(ZEXT416(uVar208),auVar146);
                auVar148 = vinsertps_avx512f(auVar144,auVar148,0x30);
                auVar168 = ZEXT1632(auVar148);
                auVar148 = vmulss_avx512f(ZEXT416(uVar209),auVar146);
                auVar143 = vinsertps_avx512f(auVar143,ZEXT416((uint)(fVar324 * auVar146._0_4_)),0x30
                                            );
                auVar167 = ZEXT1632(auVar143);
                auVar143 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                             ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),0x10);
                auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x3c)),0x20);
                auVar143 = vinsertps_avx512f(auVar143,auVar148,0x30);
                auVar165 = ZEXT1632(auVar143);
              }
              else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar5 = pRVar6[1].ptr_ofs;
                lVar137 = uVar135 * pRVar6[1].stride;
                auVar168 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137));
                auVar165 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x10));
                auVar167 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x20));
                auVar155 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x30));
              }
            }
            auVar176 = vpermps_avx512vl(auVar159,auVar168);
            auVar177 = vpermps_avx512vl(auVar159,auVar165);
            auVar178 = vpermps_avx512vl(auVar159,auVar167);
            auVar179 = vpermps_avx512vl(auVar159,auVar155);
            auVar164 = vmulps_avx512vl(auVar156,auVar179);
            auVar180 = vmulps_avx512vl(auVar160,auVar176);
            auVar181 = vmulps_avx512vl(auVar162,auVar177);
            auVar182 = vmulps_avx512vl(auVar150,auVar178);
            fVar324 = auVar182._0_4_;
            auVar331._0_4_ = fVar324 + auVar181._0_4_ + auVar180._0_4_ + auVar164._0_4_;
            fVar336 = auVar182._4_4_;
            auVar331._4_4_ = fVar336 + auVar181._4_4_ + auVar180._4_4_ + auVar164._4_4_;
            fVar338 = auVar182._8_4_;
            auVar331._8_4_ = fVar338 + auVar181._8_4_ + auVar180._8_4_ + auVar164._8_4_;
            fVar340 = auVar182._12_4_;
            auVar331._12_4_ = fVar340 + auVar181._12_4_ + auVar180._12_4_ + auVar164._12_4_;
            fVar342 = auVar182._16_4_;
            auVar331._16_4_ = fVar342 + auVar181._16_4_ + auVar180._16_4_ + auVar164._16_4_;
            fVar343 = auVar182._20_4_;
            auVar331._20_4_ = fVar343 + auVar181._20_4_ + auVar180._20_4_ + auVar164._20_4_;
            fVar344 = auVar182._24_4_;
            auVar331._24_4_ = fVar344 + auVar181._24_4_ + auVar180._24_4_ + auVar164._24_4_;
            auVar331._28_4_ = auVar182._28_4_ + auVar181._28_4_ + auVar180._28_4_ + auVar164._28_4_;
            auVar20._8_4_ = 0x7fffffff;
            auVar20._0_8_ = 0x7fffffff7fffffff;
            auVar20._12_4_ = 0x7fffffff;
            auVar20._16_4_ = 0x7fffffff;
            auVar20._20_4_ = 0x7fffffff;
            auVar20._24_4_ = 0x7fffffff;
            auVar20._28_4_ = 0x7fffffff;
            vandps_avx512vl(auVar331,auVar20);
            auVar181 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar21._8_4_ = 0xbb8d3753;
            auVar21._0_8_ = 0xbb8d3753bb8d3753;
            auVar21._12_4_ = 0xbb8d3753;
            auVar21._16_4_ = 0xbb8d3753;
            auVar21._20_4_ = 0xbb8d3753;
            auVar21._24_4_ = 0xbb8d3753;
            auVar21._28_4_ = 0xbb8d3753;
            auVar164 = vmulps_avx512vl(auVar182,auVar21);
            auVar22._8_4_ = 0x3c9df1b8;
            auVar22._0_8_ = 0x3c9df1b83c9df1b8;
            auVar22._12_4_ = 0x3c9df1b8;
            auVar22._16_4_ = 0x3c9df1b8;
            auVar22._20_4_ = 0x3c9df1b8;
            auVar22._24_4_ = 0x3c9df1b8;
            auVar22._28_4_ = 0x3c9df1b8;
            auVar164 = vaddps_avx512vl(auVar164,auVar22);
            auVar47._4_4_ = fVar336 * auVar164._4_4_;
            auVar47._0_4_ = fVar324 * auVar164._0_4_;
            auVar47._8_4_ = fVar338 * auVar164._8_4_;
            auVar47._12_4_ = fVar340 * auVar164._12_4_;
            auVar47._16_4_ = fVar342 * auVar164._16_4_;
            auVar47._20_4_ = fVar343 * auVar164._20_4_;
            auVar47._24_4_ = fVar344 * auVar164._24_4_;
            auVar47._28_4_ = auVar164._28_4_;
            auVar23._8_4_ = 0xbd37e81c;
            auVar23._0_8_ = 0xbd37e81cbd37e81c;
            auVar23._12_4_ = 0xbd37e81c;
            auVar23._16_4_ = 0xbd37e81c;
            auVar23._20_4_ = 0xbd37e81c;
            auVar23._24_4_ = 0xbd37e81c;
            auVar23._28_4_ = 0xbd37e81c;
            auVar164 = vaddps_avx512vl(auVar47,auVar23);
            auVar48._4_4_ = fVar336 * auVar164._4_4_;
            auVar48._0_4_ = fVar324 * auVar164._0_4_;
            auVar48._8_4_ = fVar338 * auVar164._8_4_;
            auVar48._12_4_ = fVar340 * auVar164._12_4_;
            auVar48._16_4_ = fVar342 * auVar164._16_4_;
            auVar48._20_4_ = fVar343 * auVar164._20_4_;
            auVar48._24_4_ = fVar344 * auVar164._24_4_;
            auVar48._28_4_ = auVar164._28_4_;
            auVar24._8_4_ = 0x3db3edac;
            auVar24._0_8_ = 0x3db3edac3db3edac;
            auVar24._12_4_ = 0x3db3edac;
            auVar24._16_4_ = 0x3db3edac;
            auVar24._20_4_ = 0x3db3edac;
            auVar24._24_4_ = 0x3db3edac;
            auVar24._28_4_ = 0x3db3edac;
            auVar164 = vaddps_avx512vl(auVar48,auVar24);
            auVar49._4_4_ = fVar336 * auVar164._4_4_;
            auVar49._0_4_ = fVar324 * auVar164._0_4_;
            auVar49._8_4_ = fVar338 * auVar164._8_4_;
            auVar49._12_4_ = fVar340 * auVar164._12_4_;
            auVar49._16_4_ = fVar342 * auVar164._16_4_;
            auVar49._20_4_ = fVar343 * auVar164._20_4_;
            auVar49._24_4_ = fVar344 * auVar164._24_4_;
            auVar49._28_4_ = auVar164._28_4_;
            auVar25._8_4_ = 0xbe5ba881;
            auVar25._0_8_ = 0xbe5ba881be5ba881;
            auVar25._12_4_ = 0xbe5ba881;
            auVar25._16_4_ = 0xbe5ba881;
            auVar25._20_4_ = 0xbe5ba881;
            auVar25._24_4_ = 0xbe5ba881;
            auVar25._28_4_ = 0xbe5ba881;
            auVar164 = vaddps_avx512vl(auVar49,auVar25);
            auVar50._4_4_ = fVar336 * auVar164._4_4_;
            auVar50._0_4_ = fVar324 * auVar164._0_4_;
            auVar50._8_4_ = fVar338 * auVar164._8_4_;
            auVar50._12_4_ = fVar340 * auVar164._12_4_;
            auVar50._16_4_ = fVar342 * auVar164._16_4_;
            auVar50._20_4_ = fVar343 * auVar164._20_4_;
            auVar50._24_4_ = fVar344 * auVar164._24_4_;
            auVar50._28_4_ = auVar164._28_4_;
            auVar26._8_4_ = 0x3fc90fd1;
            auVar26._0_8_ = 0x3fc90fd13fc90fd1;
            auVar26._12_4_ = 0x3fc90fd1;
            auVar26._16_4_ = 0x3fc90fd1;
            auVar26._20_4_ = 0x3fc90fd1;
            auVar26._24_4_ = 0x3fc90fd1;
            auVar26._28_4_ = 0x3fc90fd1;
            auVar180 = vaddps_avx512vl(auVar50,auVar26);
            uVar135 = vcmpps_avx512vl(auVar182,auVar181,6);
            auVar164 = vsubps_avx512vl(auVar181,auVar182);
            auVar164 = vsqrtps_avx(auVar164);
            auVar51._4_4_ = auVar164._4_4_ * auVar180._4_4_;
            auVar51._0_4_ = auVar164._0_4_ * auVar180._0_4_;
            auVar51._8_4_ = auVar164._8_4_ * auVar180._8_4_;
            auVar51._12_4_ = auVar164._12_4_ * auVar180._12_4_;
            auVar51._16_4_ = auVar164._16_4_ * auVar180._16_4_;
            auVar51._20_4_ = auVar164._20_4_ * auVar180._20_4_;
            auVar51._24_4_ = auVar164._24_4_ * auVar180._24_4_;
            auVar51._28_4_ = auVar180._28_4_;
            auVar312._8_4_ = 0x80000000;
            auVar312._0_8_ = 0x8000000080000000;
            auVar312._12_4_ = 0x80000000;
            auVar312._16_4_ = 0x80000000;
            auVar312._20_4_ = 0x80000000;
            auVar312._24_4_ = 0x80000000;
            auVar312._28_4_ = 0x80000000;
            auVar180 = vxorps_avx512vl(auVar331,auVar312);
            auVar293 = ZEXT816(0) << 0x40;
            auVar182 = vmaxps_avx512vl(auVar180,auVar331);
            uVar140 = vcmpps_avx512vl(auVar182,ZEXT1632(auVar293),1);
            auVar254._8_4_ = 0x3fc90fdb;
            auVar254._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar254._12_4_ = 0x3fc90fdb;
            auVar254._16_4_ = 0x3fc90fdb;
            auVar254._20_4_ = 0x3fc90fdb;
            auVar254._24_4_ = 0x3fc90fdb;
            auVar254._28_4_ = 0x3fc90fdb;
            auVar164 = vsubps_avx(auVar254,auVar51);
            auVar164 = vmaxps_avx(ZEXT1632(auVar293),auVar164);
            auVar183 = vxorps_avx512vl(auVar164,auVar312);
            bVar7 = (bool)((byte)uVar140 & 1);
            auVar184._0_4_ = (uint)bVar7 * auVar183._0_4_ | (uint)!bVar7 * auVar164._0_4_;
            bVar7 = (bool)((byte)(uVar140 >> 1) & 1);
            auVar184._4_4_ = (uint)bVar7 * auVar183._4_4_ | (uint)!bVar7 * auVar164._4_4_;
            bVar7 = (bool)((byte)(uVar140 >> 2) & 1);
            auVar184._8_4_ = (uint)bVar7 * auVar183._8_4_ | (uint)!bVar7 * auVar164._8_4_;
            bVar7 = (bool)((byte)(uVar140 >> 3) & 1);
            auVar184._12_4_ = (uint)bVar7 * auVar183._12_4_ | (uint)!bVar7 * auVar164._12_4_;
            bVar7 = (bool)((byte)(uVar140 >> 4) & 1);
            auVar184._16_4_ = (uint)bVar7 * auVar183._16_4_ | (uint)!bVar7 * auVar164._16_4_;
            bVar7 = (bool)((byte)(uVar140 >> 5) & 1);
            auVar184._20_4_ = (uint)bVar7 * auVar183._20_4_ | (uint)!bVar7 * auVar164._20_4_;
            bVar7 = (bool)((byte)(uVar140 >> 6) & 1);
            auVar184._24_4_ = (uint)bVar7 * auVar183._24_4_ | (uint)!bVar7 * auVar164._24_4_;
            bVar7 = SUB81(uVar140 >> 7,0);
            auVar184._28_4_ = (uint)bVar7 * auVar183._28_4_ | (uint)!bVar7 * auVar164._28_4_;
            auVar164 = vsubps_avx(auVar254,auVar184);
            auVar183 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
            bVar7 = (bool)((byte)uVar135 & 1);
            bVar8 = (bool)((byte)(uVar135 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar135 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar135 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar135 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar135 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar135 >> 6) & 1);
            uVar135 = vcmpps_avx512vl(auVar331,auVar180,1);
            auVar52._4_4_ =
                 (float)((uint)bVar8 * auVar183._4_4_ | (uint)!bVar8 * auVar164._4_4_) * fVar234;
            auVar52._0_4_ =
                 (float)((uint)bVar7 * auVar183._0_4_ | (uint)!bVar7 * auVar164._0_4_) * fVar226;
            auVar52._8_4_ =
                 (float)((uint)bVar9 * auVar183._8_4_ | (uint)!bVar9 * auVar164._8_4_) * fVar235;
            auVar52._12_4_ =
                 (float)((uint)bVar10 * auVar183._12_4_ | (uint)!bVar10 * auVar164._12_4_) * fVar236
            ;
            auVar52._16_4_ =
                 (float)((uint)bVar11 * auVar183._16_4_ | (uint)!bVar11 * auVar164._16_4_) * fVar237
            ;
            auVar52._20_4_ =
                 (float)((uint)bVar12 * auVar183._20_4_ | (uint)!bVar12 * auVar164._20_4_) * fVar238
            ;
            auVar52._24_4_ =
                 (float)((uint)bVar13 * auVar183._24_4_ | (uint)!bVar13 * auVar164._24_4_) * fVar239
            ;
            auVar52._28_4_ = auVar331._28_4_;
            auVar27._8_4_ = 0x3f22f983;
            auVar27._0_8_ = 0x3f22f9833f22f983;
            auVar27._12_4_ = 0x3f22f983;
            auVar27._16_4_ = 0x3f22f983;
            auVar27._20_4_ = 0x3f22f983;
            auVar27._24_4_ = 0x3f22f983;
            auVar27._28_4_ = 0x3f22f983;
            auVar183 = vmulps_avx512vl(auVar52,auVar27);
            auVar164 = vroundps_avx(auVar183,1);
            auVar53._4_4_ = auVar164._4_4_ * 1.5707964;
            auVar53._0_4_ = auVar164._0_4_ * 1.5707964;
            auVar53._8_4_ = auVar164._8_4_ * 1.5707964;
            auVar53._12_4_ = auVar164._12_4_ * 1.5707964;
            auVar53._16_4_ = auVar164._16_4_ * 1.5707964;
            auVar53._20_4_ = auVar164._20_4_ * 1.5707964;
            auVar53._24_4_ = auVar164._24_4_ * 1.5707964;
            auVar53._28_4_ = 0x3fc90fdb;
            auVar180 = vsubps_avx(auVar52,auVar53);
            auVar164 = vcvtps2dq_avx(auVar164);
            vandps_avx512vl(auVar164,auVar159);
            uVar19 = vptestnmd_avx512vl(auVar164,auVar353);
            auVar159 = vpslld_avx2(auVar164,0x1f);
            uVar141 = vpmovd2m_avx512vl(auVar159);
            uVar140 = vpcmpgtd_avx512vl(auVar183,auVar353);
            auVar159 = vpcmpeqd_avx2(auVar159,auVar159);
            auVar159 = vpaddd_avx2(auVar183,auVar159);
            uVar17 = vpcmpud_avx512vl(auVar159,auVar356,1);
            fVar324 = auVar180._0_4_ * auVar180._0_4_;
            fVar336 = auVar180._4_4_ * auVar180._4_4_;
            auVar54._4_4_ = fVar336;
            auVar54._0_4_ = fVar324;
            fVar338 = auVar180._8_4_ * auVar180._8_4_;
            auVar54._8_4_ = fVar338;
            fVar340 = auVar180._12_4_ * auVar180._12_4_;
            auVar54._12_4_ = fVar340;
            fVar342 = auVar180._16_4_ * auVar180._16_4_;
            auVar54._16_4_ = fVar342;
            fVar343 = auVar180._20_4_ * auVar180._20_4_;
            auVar54._20_4_ = fVar343;
            fVar344 = auVar180._24_4_ * auVar180._24_4_;
            auVar54._24_4_ = fVar344;
            auVar54._28_4_ = auVar159._28_4_;
            auVar28._8_4_ = 0xb2d70013;
            auVar28._0_8_ = 0xb2d70013b2d70013;
            auVar28._12_4_ = 0xb2d70013;
            auVar28._16_4_ = 0xb2d70013;
            auVar28._20_4_ = 0xb2d70013;
            auVar28._24_4_ = 0xb2d70013;
            auVar28._28_4_ = 0xb2d70013;
            auVar159 = vmulps_avx512vl(auVar54,auVar28);
            auVar29._8_4_ = 0x363938a8;
            auVar29._0_8_ = 0x363938a8363938a8;
            auVar29._12_4_ = 0x363938a8;
            auVar29._16_4_ = 0x363938a8;
            auVar29._20_4_ = 0x363938a8;
            auVar29._24_4_ = 0x363938a8;
            auVar29._28_4_ = 0x363938a8;
            auVar159 = vaddps_avx512vl(auVar159,auVar29);
            auVar30._8_4_ = 0xb48b634d;
            auVar30._0_8_ = 0xb48b634db48b634d;
            auVar30._12_4_ = 0xb48b634d;
            auVar30._16_4_ = 0xb48b634d;
            auVar30._20_4_ = 0xb48b634d;
            auVar30._24_4_ = 0xb48b634d;
            auVar30._28_4_ = 0xb48b634d;
            auVar164 = vmulps_avx512vl(auVar54,auVar30);
            auVar31._8_4_ = 0x37cfab9c;
            auVar31._0_8_ = 0x37cfab9c37cfab9c;
            auVar31._12_4_ = 0x37cfab9c;
            auVar31._16_4_ = 0x37cfab9c;
            auVar31._20_4_ = 0x37cfab9c;
            auVar31._24_4_ = 0x37cfab9c;
            auVar31._28_4_ = 0x37cfab9c;
            auVar164 = vaddps_avx512vl(auVar164,auVar31);
            auVar55._4_4_ = fVar336 * auVar159._4_4_;
            auVar55._0_4_ = fVar324 * auVar159._0_4_;
            auVar55._8_4_ = fVar338 * auVar159._8_4_;
            auVar55._12_4_ = fVar340 * auVar159._12_4_;
            auVar55._16_4_ = fVar342 * auVar159._16_4_;
            auVar55._20_4_ = fVar343 * auVar159._20_4_;
            auVar55._24_4_ = fVar344 * auVar159._24_4_;
            auVar55._28_4_ = auVar159._28_4_;
            auVar32._8_4_ = 0xb9501096;
            auVar32._0_8_ = 0xb9501096b9501096;
            auVar32._12_4_ = 0xb9501096;
            auVar32._16_4_ = 0xb9501096;
            auVar32._20_4_ = 0xb9501096;
            auVar32._24_4_ = 0xb9501096;
            auVar32._28_4_ = 0xb9501096;
            auVar159 = vaddps_avx512vl(auVar55,auVar32);
            auVar164 = vmulps_avx512vl(auVar54,auVar164);
            auVar33._8_4_ = 0xbab60981;
            auVar33._0_8_ = 0xbab60981bab60981;
            auVar33._12_4_ = 0xbab60981;
            auVar33._16_4_ = 0xbab60981;
            auVar33._20_4_ = 0xbab60981;
            auVar33._24_4_ = 0xbab60981;
            auVar33._28_4_ = 0xbab60981;
            auVar164 = vaddps_avx512vl(auVar164,auVar33);
            auVar56._4_4_ = fVar336 * auVar159._4_4_;
            auVar56._0_4_ = fVar324 * auVar159._0_4_;
            auVar56._8_4_ = fVar338 * auVar159._8_4_;
            auVar56._12_4_ = fVar340 * auVar159._12_4_;
            auVar56._16_4_ = fVar342 * auVar159._16_4_;
            auVar56._20_4_ = fVar343 * auVar159._20_4_;
            auVar56._24_4_ = fVar344 * auVar159._24_4_;
            auVar56._28_4_ = auVar159._28_4_;
            auVar34._8_4_ = 0x3c088898;
            auVar34._0_8_ = 0x3c0888983c088898;
            auVar34._12_4_ = 0x3c088898;
            auVar34._16_4_ = 0x3c088898;
            auVar34._20_4_ = 0x3c088898;
            auVar34._24_4_ = 0x3c088898;
            auVar34._28_4_ = 0x3c088898;
            auVar159 = vaddps_avx512vl(auVar56,auVar34);
            auVar164 = vmulps_avx512vl(auVar54,auVar164);
            auVar35._8_4_ = 0x3d2aaaa4;
            auVar35._0_8_ = 0x3d2aaaa43d2aaaa4;
            auVar35._12_4_ = 0x3d2aaaa4;
            auVar35._16_4_ = 0x3d2aaaa4;
            auVar35._20_4_ = 0x3d2aaaa4;
            auVar35._24_4_ = 0x3d2aaaa4;
            auVar35._28_4_ = 0x3d2aaaa4;
            auVar164 = vaddps_avx512vl(auVar164,auVar35);
            auVar57._4_4_ = fVar336 * auVar159._4_4_;
            auVar57._0_4_ = fVar324 * auVar159._0_4_;
            auVar57._8_4_ = fVar338 * auVar159._8_4_;
            auVar57._12_4_ = fVar340 * auVar159._12_4_;
            auVar57._16_4_ = fVar342 * auVar159._16_4_;
            auVar57._20_4_ = fVar343 * auVar159._20_4_;
            auVar57._24_4_ = fVar344 * auVar159._24_4_;
            auVar57._28_4_ = auVar159._28_4_;
            auVar36._8_4_ = 0xbe2aaaab;
            auVar36._0_8_ = 0xbe2aaaabbe2aaaab;
            auVar36._12_4_ = 0xbe2aaaab;
            auVar36._16_4_ = 0xbe2aaaab;
            auVar36._20_4_ = 0xbe2aaaab;
            auVar36._24_4_ = 0xbe2aaaab;
            auVar36._28_4_ = 0xbe2aaaab;
            auVar159 = vaddps_avx512vl(auVar57,auVar36);
            auVar164 = vmulps_avx512vl(auVar54,auVar164);
            auVar347._8_4_ = 0xbf000000;
            auVar347._0_8_ = 0xbf000000bf000000;
            auVar347._12_4_ = 0xbf000000;
            auVar347._16_4_ = 0xbf000000;
            auVar347._20_4_ = 0xbf000000;
            auVar347._24_4_ = 0xbf000000;
            auVar347._28_4_ = 0xbf000000;
            auVar164 = vaddps_avx512vl(auVar164,auVar347);
            auVar159 = vmulps_avx512vl(auVar54,auVar159);
            auVar164 = vmulps_avx512vl(auVar54,auVar164);
            auVar159 = vaddps_avx512vl(auVar159,auVar181);
            auVar180 = vmulps_avx512vl(auVar180,auVar159);
            auVar164 = vaddps_avx512vl(auVar164,auVar181);
            auVar183 = vblendmps_avx512vl(auVar180,auVar164);
            bVar7 = (bool)((byte)uVar141 & 1);
            auVar185._0_4_ = (uint)bVar7 * auVar183._0_4_ | (uint)!bVar7 * auVar159._0_4_;
            bVar7 = (bool)((byte)(uVar141 >> 1) & 1);
            auVar185._4_4_ = (uint)bVar7 * auVar183._4_4_ | (uint)!bVar7 * auVar159._4_4_;
            bVar7 = (bool)((byte)(uVar141 >> 2) & 1);
            auVar185._8_4_ = (uint)bVar7 * auVar183._8_4_ | (uint)!bVar7 * auVar159._8_4_;
            bVar7 = (bool)((byte)(uVar141 >> 3) & 1);
            auVar185._12_4_ = (uint)bVar7 * auVar183._12_4_ | (uint)!bVar7 * auVar159._12_4_;
            bVar7 = (bool)((byte)(uVar141 >> 4) & 1);
            auVar185._16_4_ = (uint)bVar7 * auVar183._16_4_ | (uint)!bVar7 * auVar159._16_4_;
            bVar7 = (bool)((byte)(uVar141 >> 5) & 1);
            auVar185._20_4_ = (uint)bVar7 * auVar183._20_4_ | (uint)!bVar7 * auVar159._20_4_;
            bVar7 = (bool)((byte)(uVar141 >> 6) & 1);
            auVar185._24_4_ = (uint)bVar7 * auVar183._24_4_ | (uint)!bVar7 * auVar159._24_4_;
            bVar7 = (bool)((byte)(uVar141 >> 7) & 1);
            auVar185._28_4_ = (uint)bVar7 * auVar183._28_4_ | (uint)!bVar7 * auVar159._28_4_;
            bVar7 = (bool)((byte)uVar19 & 1);
            auVar186._0_4_ = (uint)bVar7 * auVar164._0_4_ | (uint)!bVar7 * auVar180._0_4_;
            bVar7 = (bool)((byte)(uVar19 >> 1) & 1);
            auVar186._4_4_ = (uint)bVar7 * auVar164._4_4_ | (uint)!bVar7 * auVar180._4_4_;
            bVar7 = (bool)((byte)(uVar19 >> 2) & 1);
            auVar186._8_4_ = (uint)bVar7 * auVar164._8_4_ | (uint)!bVar7 * auVar180._8_4_;
            bVar7 = (bool)((byte)(uVar19 >> 3) & 1);
            auVar186._12_4_ = (uint)bVar7 * auVar164._12_4_ | (uint)!bVar7 * auVar180._12_4_;
            bVar7 = (bool)((byte)(uVar19 >> 4) & 1);
            auVar186._16_4_ = (uint)bVar7 * auVar164._16_4_ | (uint)!bVar7 * auVar180._16_4_;
            bVar7 = (bool)((byte)(uVar19 >> 5) & 1);
            auVar186._20_4_ = (uint)bVar7 * auVar164._20_4_ | (uint)!bVar7 * auVar180._20_4_;
            bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
            auVar186._24_4_ = (uint)bVar7 * auVar164._24_4_ | (uint)!bVar7 * auVar180._24_4_;
            bVar7 = SUB81(uVar19 >> 7,0);
            auVar186._28_4_ = (uint)bVar7 * auVar164._28_4_ | (uint)!bVar7 * auVar180._28_4_;
            auVar159 = vxorps_avx512vl(auVar179,auVar312);
            bVar138 = (byte)uVar135;
            auVar187._0_4_ =
                 (uint)(bVar138 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar138 & 1) * auVar179._0_4_;
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            auVar187._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * auVar179._4_4_;
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            auVar187._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * auVar179._8_4_;
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            auVar187._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * auVar179._12_4_;
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            auVar187._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * auVar179._16_4_;
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            auVar187._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * auVar179._20_4_;
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            auVar187._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * auVar179._24_4_;
            bVar7 = SUB81(uVar135 >> 7,0);
            auVar187._28_4_ = (uint)bVar7 * auVar159._28_4_ | (uint)!bVar7 * auVar179._28_4_;
            auVar159 = vxorps_avx512vl(auVar176,auVar312);
            auVar188._0_4_ =
                 (uint)(bVar138 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar138 & 1) * auVar176._0_4_;
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            auVar188._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * auVar176._4_4_;
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            auVar188._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * auVar176._8_4_;
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            auVar188._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * auVar176._12_4_;
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            auVar188._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * auVar176._16_4_;
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            auVar188._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * auVar176._20_4_;
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            auVar188._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * auVar176._24_4_;
            bVar7 = SUB81(uVar135 >> 7,0);
            auVar188._28_4_ = (uint)bVar7 * auVar159._28_4_ | (uint)!bVar7 * auVar176._28_4_;
            auVar159 = vfmsub213ps_avx512vl(auVar156,auVar182,auVar187);
            auVar164 = vfmsub213ps_avx512vl(auVar160,auVar182,auVar188);
            fVar324 = auVar159._0_4_;
            fVar342 = auVar159._4_4_;
            fVar266 = auVar159._8_4_;
            fVar269 = auVar159._12_4_;
            fVar304 = auVar159._16_4_;
            fVar319 = auVar159._20_4_;
            fVar322 = auVar159._24_4_;
            auVar159 = vmulps_avx512vl(auVar164,auVar164);
            auVar180 = vxorps_avx512vl(auVar177,auVar312);
            auVar189._0_4_ =
                 (uint)(bVar138 & 1) * auVar180._0_4_ | (uint)!(bool)(bVar138 & 1) * auVar177._0_4_;
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            auVar189._4_4_ = (uint)bVar7 * auVar180._4_4_ | (uint)!bVar7 * auVar177._4_4_;
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            auVar189._8_4_ = (uint)bVar7 * auVar180._8_4_ | (uint)!bVar7 * auVar177._8_4_;
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            auVar189._12_4_ = (uint)bVar7 * auVar180._12_4_ | (uint)!bVar7 * auVar177._12_4_;
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            auVar189._16_4_ = (uint)bVar7 * auVar180._16_4_ | (uint)!bVar7 * auVar177._16_4_;
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            auVar189._20_4_ = (uint)bVar7 * auVar180._20_4_ | (uint)!bVar7 * auVar177._20_4_;
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            auVar189._24_4_ = (uint)bVar7 * auVar180._24_4_ | (uint)!bVar7 * auVar177._24_4_;
            bVar7 = SUB81(uVar135 >> 7,0);
            auVar189._28_4_ = (uint)bVar7 * auVar180._28_4_ | (uint)!bVar7 * auVar177._28_4_;
            auVar180 = vfmsub213ps_avx512vl(auVar162,auVar182,auVar189);
            fVar336 = auVar180._0_4_;
            fVar343 = auVar180._4_4_;
            fVar267 = auVar180._8_4_;
            fVar270 = auVar180._12_4_;
            fVar317 = auVar180._16_4_;
            fVar320 = auVar180._20_4_;
            fVar323 = auVar180._24_4_;
            auVar180 = vxorps_avx512vl(auVar178,auVar312);
            auVar190._0_4_ =
                 (uint)(bVar138 & 1) * auVar180._0_4_ | (uint)!(bool)(bVar138 & 1) * auVar178._0_4_;
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            auVar190._4_4_ = (uint)bVar7 * auVar180._4_4_ | (uint)!bVar7 * auVar178._4_4_;
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            auVar190._8_4_ = (uint)bVar7 * auVar180._8_4_ | (uint)!bVar7 * auVar178._8_4_;
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            auVar190._12_4_ = (uint)bVar7 * auVar180._12_4_ | (uint)!bVar7 * auVar178._12_4_;
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            auVar190._16_4_ = (uint)bVar7 * auVar180._16_4_ | (uint)!bVar7 * auVar178._16_4_;
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            auVar190._20_4_ = (uint)bVar7 * auVar180._20_4_ | (uint)!bVar7 * auVar178._20_4_;
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            auVar190._24_4_ = (uint)bVar7 * auVar180._24_4_ | (uint)!bVar7 * auVar178._24_4_;
            bVar7 = SUB81(uVar135 >> 7,0);
            auVar190._28_4_ = (uint)bVar7 * auVar180._28_4_ | (uint)!bVar7 * auVar178._28_4_;
            auVar180 = vfmsub213ps_avx512vl(auVar150,auVar182,auVar190);
            fVar338 = auVar180._0_4_;
            fVar344 = auVar180._4_4_;
            fVar268 = auVar180._8_4_;
            fVar271 = auVar180._12_4_;
            fVar318 = auVar180._16_4_;
            fVar321 = auVar180._20_4_;
            fVar213 = auVar180._24_4_;
            auVar261._0_4_ =
                 fVar338 * fVar338 + fVar336 * fVar336 + fVar324 * fVar324 + auVar159._0_4_;
            auVar261._4_4_ =
                 fVar344 * fVar344 + fVar343 * fVar343 + fVar342 * fVar342 + auVar159._4_4_;
            auVar261._8_4_ =
                 fVar268 * fVar268 + fVar267 * fVar267 + fVar266 * fVar266 + auVar159._8_4_;
            auVar261._12_4_ =
                 fVar271 * fVar271 + fVar270 * fVar270 + fVar269 * fVar269 + auVar159._12_4_;
            auVar261._16_4_ =
                 fVar318 * fVar318 + fVar317 * fVar317 + fVar304 * fVar304 + auVar159._16_4_;
            auVar261._20_4_ =
                 fVar321 * fVar321 + fVar320 * fVar320 + fVar319 * fVar319 + auVar159._20_4_;
            auVar261._24_4_ =
                 fVar213 * fVar213 + fVar323 * fVar323 + fVar322 * fVar322 + auVar159._24_4_;
            auVar261._28_4_ =
                 auVar149._28_4_ + (float)local_340._4_4_ + (float)local_300._4_4_ + auVar159._28_4_
            ;
            auVar159 = vrsqrt14ps_avx512vl(auVar261);
            fVar340 = auVar159._0_4_;
            fVar259 = auVar159._4_4_;
            fVar214 = auVar159._8_4_;
            fVar212 = auVar159._12_4_;
            fVar217 = auVar159._16_4_;
            fVar218 = auVar159._20_4_;
            fVar219 = auVar159._24_4_;
            auVar58._4_4_ = fVar259 * fVar259 * fVar259 * auVar261._4_4_ * -0.5;
            auVar58._0_4_ = fVar340 * fVar340 * fVar340 * auVar261._0_4_ * -0.5;
            auVar58._8_4_ = fVar214 * fVar214 * fVar214 * auVar261._8_4_ * -0.5;
            auVar58._12_4_ = fVar212 * fVar212 * fVar212 * auVar261._12_4_ * -0.5;
            auVar58._16_4_ = fVar217 * fVar217 * fVar217 * auVar261._16_4_ * -0.5;
            auVar58._20_4_ = fVar218 * fVar218 * fVar218 * auVar261._20_4_ * -0.5;
            auVar58._24_4_ = fVar219 * fVar219 * fVar219 * auVar261._24_4_ * -0.5;
            auVar58._28_4_ = auVar261._28_4_;
            auVar294._8_4_ = 0x3fc00000;
            auVar294._0_8_ = 0x3fc000003fc00000;
            auVar294._12_4_ = 0x3fc00000;
            auVar294._16_4_ = 0x3fc00000;
            auVar294._20_4_ = 0x3fc00000;
            auVar294._24_4_ = 0x3fc00000;
            auVar294._28_4_ = 0x3fc00000;
            auVar143 = vfmadd231ps_fma(auVar58,auVar294,auVar159);
            fVar340 = auVar143._0_4_;
            fVar259 = auVar143._4_4_;
            auVar59._4_4_ = fVar342 * fVar259;
            auVar59._0_4_ = fVar324 * fVar340;
            fVar324 = auVar143._8_4_;
            auVar59._8_4_ = fVar266 * fVar324;
            fVar342 = auVar143._12_4_;
            auVar59._12_4_ = fVar269 * fVar342;
            auVar59._16_4_ = fVar304 * 0.0;
            auVar59._20_4_ = fVar319 * 0.0;
            auVar59._24_4_ = fVar322 * 0.0;
            auVar59._28_4_ = auVar159._28_4_;
            auVar164 = vmulps_avx512vl(auVar164,ZEXT1632(auVar143));
            auVar180 = vxorps_avx512vl(auVar186,auVar312);
            bVar7 = (bool)((byte)uVar17 & 1);
            auVar191._0_4_ = (uint)bVar7 * auVar180._0_4_ | !bVar7 * auVar186._0_4_;
            bVar7 = (bool)((byte)(uVar17 >> 1) & 1);
            auVar191._4_4_ = (uint)bVar7 * auVar180._4_4_ | !bVar7 * auVar186._4_4_;
            bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
            auVar191._8_4_ = (uint)bVar7 * auVar180._8_4_ | !bVar7 * auVar186._8_4_;
            bVar7 = (bool)((byte)(uVar17 >> 3) & 1);
            auVar191._12_4_ = (uint)bVar7 * auVar180._12_4_ | !bVar7 * auVar186._12_4_;
            bVar7 = (bool)((byte)(uVar17 >> 4) & 1);
            auVar191._16_4_ = (uint)bVar7 * auVar180._16_4_ | !bVar7 * auVar186._16_4_;
            bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
            auVar191._20_4_ = (uint)bVar7 * auVar180._20_4_ | !bVar7 * auVar186._20_4_;
            bVar7 = (bool)((byte)(uVar17 >> 6) & 1);
            auVar191._24_4_ = (uint)bVar7 * auVar180._24_4_ | !bVar7 * auVar186._24_4_;
            bVar7 = SUB81(uVar17 >> 7,0);
            auVar191._28_4_ = (uint)bVar7 * auVar180._28_4_ | !bVar7 * auVar186._28_4_;
            auVar180 = vxorps_avx512vl(auVar185,auVar312);
            bVar7 = (bool)((byte)uVar140 & 1);
            auVar192._0_4_ = (float)(bVar7 * auVar185._0_4_ | (uint)!bVar7 * auVar180._0_4_);
            bVar7 = (bool)((byte)(uVar140 >> 1) & 1);
            auVar192._4_4_ = (float)(bVar7 * auVar185._4_4_ | (uint)!bVar7 * auVar180._4_4_);
            bVar7 = (bool)((byte)(uVar140 >> 2) & 1);
            auVar192._8_4_ = (float)(bVar7 * auVar185._8_4_ | (uint)!bVar7 * auVar180._8_4_);
            bVar7 = (bool)((byte)(uVar140 >> 3) & 1);
            auVar192._12_4_ = (float)(bVar7 * auVar185._12_4_ | (uint)!bVar7 * auVar180._12_4_);
            bVar7 = (bool)((byte)(uVar140 >> 4) & 1);
            auVar192._16_4_ = (float)(bVar7 * auVar185._16_4_ | (uint)!bVar7 * auVar180._16_4_);
            bVar7 = (bool)((byte)(uVar140 >> 5) & 1);
            auVar192._20_4_ = (float)(bVar7 * auVar185._20_4_ | (uint)!bVar7 * auVar180._20_4_);
            bVar7 = (bool)((byte)(uVar140 >> 6) & 1);
            auVar192._24_4_ = (float)(bVar7 * auVar185._24_4_ | (uint)!bVar7 * auVar180._24_4_);
            bVar7 = SUB81(uVar140 >> 7,0);
            auVar192._28_4_ = bVar7 * auVar185._28_4_ | (uint)!bVar7 * auVar180._28_4_;
            auVar180 = vmulps_avx512vl(auVar59,auVar192);
            auVar176 = vmulps_avx512vl(auVar164,auVar192);
            auVar60._4_4_ = fVar343 * fVar259 * auVar192._4_4_;
            auVar60._0_4_ = fVar336 * fVar340 * auVar192._0_4_;
            auVar60._8_4_ = fVar267 * fVar324 * auVar192._8_4_;
            auVar60._12_4_ = fVar270 * fVar342 * auVar192._12_4_;
            auVar60._16_4_ = fVar317 * 0.0 * auVar192._16_4_;
            auVar60._20_4_ = fVar320 * 0.0 * auVar192._20_4_;
            auVar60._24_4_ = fVar323 * 0.0 * auVar192._24_4_;
            auVar60._28_4_ = 0x80000000;
            auVar61._4_4_ = fVar344 * fVar259 * auVar192._4_4_;
            auVar61._0_4_ = fVar338 * fVar340 * auVar192._0_4_;
            auVar61._8_4_ = fVar268 * fVar324 * auVar192._8_4_;
            auVar61._12_4_ = fVar271 * fVar342 * auVar192._12_4_;
            auVar61._16_4_ = fVar318 * 0.0 * auVar192._16_4_;
            auVar61._20_4_ = fVar321 * 0.0 * auVar192._20_4_;
            auVar61._24_4_ = fVar213 * 0.0 * auVar192._24_4_;
            auVar61._28_4_ = auVar164._28_4_;
            auVar164 = vfmadd231ps_avx512vl(auVar180,auVar191,auVar156);
            auVar180 = vfmadd231ps_avx512vl(auVar176,auVar191,auVar160);
            auVar176 = vfmadd231ps_avx512vl(auVar60,auVar191,auVar162);
            auVar177 = vfmadd231ps_avx512vl(auVar61,auVar150,auVar191);
            auVar178 = vsubps_avx512vl(auVar187,auVar156);
            auVar156 = vfmadd213ps_avx512vl(auVar178,auVar161,auVar156);
            auVar178 = vsubps_avx512vl(auVar188,auVar160);
            auVar160 = vfmadd213ps_avx512vl(auVar178,auVar161,auVar160);
            auVar178 = vsubps_avx512vl(auVar189,auVar162);
            auVar162 = vfmadd213ps_avx512vl(auVar178,auVar161,auVar162);
            auVar178 = vsubps_avx512vl(auVar190,auVar150);
            auVar178 = vfmadd213ps_avx512vl(auVar178,auVar161,auVar150);
            auVar62._4_4_ = auVar156._4_4_ * auVar156._4_4_;
            auVar62._0_4_ = auVar156._0_4_ * auVar156._0_4_;
            auVar62._8_4_ = auVar156._8_4_ * auVar156._8_4_;
            auVar62._12_4_ = auVar156._12_4_ * auVar156._12_4_;
            auVar62._16_4_ = auVar156._16_4_ * auVar156._16_4_;
            auVar62._20_4_ = auVar156._20_4_ * auVar156._20_4_;
            auVar62._24_4_ = auVar156._24_4_ * auVar156._24_4_;
            auVar62._28_4_ = auVar159._28_4_;
            auVar159 = vmulps_avx512vl(auVar160,auVar160);
            auVar159 = vaddps_avx512vl(auVar62,auVar159);
            auVar179 = vmulps_avx512vl(auVar162,auVar162);
            auVar159 = vaddps_avx512vl(auVar179,auVar159);
            auVar179 = vmulps_avx512vl(auVar178,auVar178);
            auVar159 = vaddps_avx512vl(auVar179,auVar159);
            auVar179 = vrsqrt14ps_avx512vl(auVar159);
            auVar63._4_4_ = auVar159._4_4_ * -0.5 * auVar179._4_4_;
            auVar63._0_4_ = auVar159._0_4_ * -0.5 * auVar179._0_4_;
            auVar63._8_4_ = auVar159._8_4_ * -0.5 * auVar179._8_4_;
            auVar63._12_4_ = auVar159._12_4_ * -0.5 * auVar179._12_4_;
            auVar63._16_4_ = auVar159._16_4_ * -0.5 * auVar179._16_4_;
            auVar63._20_4_ = auVar159._20_4_ * -0.5 * auVar179._20_4_;
            auVar63._24_4_ = auVar159._24_4_ * -0.5 * auVar179._24_4_;
            auVar63._28_4_ = 0xbf000000;
            auVar159 = vmulps_avx512vl(auVar179,auVar179);
            auVar159 = vmulps_avx512vl(auVar159,auVar63);
            auVar143 = vfmadd231ps_fma(auVar159,auVar179,auVar294);
            auVar37._8_4_ = 0x3f7fdf3b;
            auVar37._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar37._12_4_ = 0x3f7fdf3b;
            auVar37._16_4_ = 0x3f7fdf3b;
            auVar37._20_4_ = 0x3f7fdf3b;
            auVar37._24_4_ = 0x3f7fdf3b;
            auVar37._28_4_ = 0x3f7fdf3b;
            uVar135 = vcmpps_avx512vl(auVar182,auVar37,6);
            auVar156 = vmulps_avx512vl(auVar156,ZEXT1632(auVar143));
            bVar138 = (byte)uVar135;
            auVar193._0_4_ =
                 (uint)(bVar138 & 1) * auVar156._0_4_ | (uint)!(bool)(bVar138 & 1) * auVar164._0_4_;
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            auVar193._4_4_ = (uint)bVar7 * auVar156._4_4_ | (uint)!bVar7 * auVar164._4_4_;
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            auVar193._8_4_ = (uint)bVar7 * auVar156._8_4_ | (uint)!bVar7 * auVar164._8_4_;
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            auVar193._12_4_ = (uint)bVar7 * auVar156._12_4_ | (uint)!bVar7 * auVar164._12_4_;
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            auVar193._16_4_ = (uint)bVar7 * auVar156._16_4_ | (uint)!bVar7 * auVar164._16_4_;
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            auVar193._20_4_ = (uint)bVar7 * auVar156._20_4_ | (uint)!bVar7 * auVar164._20_4_;
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            auVar193._24_4_ = (uint)bVar7 * auVar156._24_4_ | (uint)!bVar7 * auVar164._24_4_;
            bVar7 = SUB81(uVar135 >> 7,0);
            auVar193._28_4_ = (uint)bVar7 * auVar156._28_4_ | (uint)!bVar7 * auVar164._28_4_;
            auVar156 = vmulps_avx512vl(auVar160,ZEXT1632(auVar143));
            auVar194._0_4_ =
                 (uint)(bVar138 & 1) * auVar156._0_4_ | (uint)!(bool)(bVar138 & 1) * auVar180._0_4_;
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            auVar194._4_4_ = (uint)bVar7 * auVar156._4_4_ | (uint)!bVar7 * auVar180._4_4_;
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            auVar194._8_4_ = (uint)bVar7 * auVar156._8_4_ | (uint)!bVar7 * auVar180._8_4_;
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            auVar194._12_4_ = (uint)bVar7 * auVar156._12_4_ | (uint)!bVar7 * auVar180._12_4_;
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            auVar194._16_4_ = (uint)bVar7 * auVar156._16_4_ | (uint)!bVar7 * auVar180._16_4_;
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            auVar194._20_4_ = (uint)bVar7 * auVar156._20_4_ | (uint)!bVar7 * auVar180._20_4_;
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            auVar194._24_4_ = (uint)bVar7 * auVar156._24_4_ | (uint)!bVar7 * auVar180._24_4_;
            bVar7 = SUB81(uVar135 >> 7,0);
            auVar194._28_4_ = (uint)bVar7 * auVar156._28_4_ | (uint)!bVar7 * auVar180._28_4_;
            auVar156 = vbroadcastss_avx512vl(auVar168._0_16_);
            auVar159 = vmulps_avx512vl(auVar162,ZEXT1632(auVar143));
            auVar195._0_4_ =
                 (float)((uint)(bVar138 & 1) * auVar159._0_4_ |
                        (uint)!(bool)(bVar138 & 1) * auVar176._0_4_);
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            auVar195._4_4_ = (float)((uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * auVar176._4_4_);
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            auVar195._8_4_ = (float)((uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * auVar176._8_4_);
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            auVar195._12_4_ =
                 (float)((uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * auVar176._12_4_);
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            auVar195._16_4_ =
                 (float)((uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * auVar176._16_4_);
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            auVar195._20_4_ =
                 (float)((uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * auVar176._20_4_);
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            auVar195._24_4_ =
                 (float)((uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * auVar176._24_4_);
            bVar7 = SUB81(uVar135 >> 7,0);
            auVar195._28_4_ = (uint)bVar7 * auVar159._28_4_ | (uint)!bVar7 * auVar176._28_4_;
            auVar159 = vpermps_avx512vl(auVar353,auVar168);
            auVar168 = vpermps_avx512vl(auVar356,auVar168);
            auVar160 = vmulps_avx512vl(auVar178,ZEXT1632(auVar143));
            auVar196._0_4_ =
                 (float)((uint)(bVar138 & 1) * auVar160._0_4_ |
                        (uint)!(bool)(bVar138 & 1) * auVar177._0_4_);
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            auVar196._4_4_ = (float)((uint)bVar7 * auVar160._4_4_ | (uint)!bVar7 * auVar177._4_4_);
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            auVar196._8_4_ = (float)((uint)bVar7 * auVar160._8_4_ | (uint)!bVar7 * auVar177._8_4_);
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            auVar196._12_4_ =
                 (float)((uint)bVar7 * auVar160._12_4_ | (uint)!bVar7 * auVar177._12_4_);
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            auVar196._16_4_ =
                 (float)((uint)bVar7 * auVar160._16_4_ | (uint)!bVar7 * auVar177._16_4_);
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            auVar196._20_4_ =
                 (float)((uint)bVar7 * auVar160._20_4_ | (uint)!bVar7 * auVar177._20_4_);
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            auVar196._24_4_ =
                 (float)((uint)bVar7 * auVar160._24_4_ | (uint)!bVar7 * auVar177._24_4_);
            bVar7 = SUB81(uVar135 >> 7,0);
            auVar196._28_4_ = (uint)bVar7 * auVar160._28_4_ | (uint)!bVar7 * auVar177._28_4_;
            auVar160 = vbroadcastss_avx512vl(auVar165._0_16_);
            auVar162 = vpermps_avx512vl(auVar353,auVar165);
            auVar165 = vpermps_avx512vl(auVar356,auVar165);
            auVar164 = vsubps_avx512vl(auVar181,auVar161);
            auVar64._4_4_ = fVar234 * auVar156._4_4_;
            auVar64._0_4_ = fVar226 * auVar156._0_4_;
            auVar64._8_4_ = fVar235 * auVar156._8_4_;
            auVar64._12_4_ = fVar236 * auVar156._12_4_;
            auVar64._16_4_ = fVar237 * auVar156._16_4_;
            auVar64._20_4_ = fVar238 * auVar156._20_4_;
            auVar64._24_4_ = fVar239 * auVar156._24_4_;
            auVar64._28_4_ = auVar156._28_4_;
            auVar180 = vfmadd213ps_avx512vl(local_2c0,auVar164,auVar64);
            auVar156 = vbroadcastss_avx512vl(auVar167._0_16_);
            auVar65._4_4_ = fVar234 * auVar159._4_4_;
            auVar65._0_4_ = fVar226 * auVar159._0_4_;
            auVar65._8_4_ = fVar235 * auVar159._8_4_;
            auVar65._12_4_ = fVar236 * auVar159._12_4_;
            auVar65._16_4_ = fVar237 * auVar159._16_4_;
            auVar65._20_4_ = fVar238 * auVar159._20_4_;
            auVar65._24_4_ = fVar239 * auVar159._24_4_;
            auVar65._28_4_ = auVar159._28_4_;
            auVar159 = vfmadd213ps_avx512vl(auVar158,auVar164,auVar65);
            auVar158 = vpermps_avx512vl(auVar353,auVar167);
            auVar167 = vpermps_avx512vl(auVar356,auVar167);
            auVar176 = vpermps_avx512vl(auVar353,auVar155);
            auVar177 = vpermps_avx512vl(auVar356,auVar155);
            auVar155 = vbroadcastss_avx512vl(auVar155._0_16_);
            auVar66._4_4_ = fVar234 * auVar168._4_4_;
            auVar66._0_4_ = fVar226 * auVar168._0_4_;
            auVar66._8_4_ = fVar235 * auVar168._8_4_;
            auVar66._12_4_ = fVar236 * auVar168._12_4_;
            auVar66._16_4_ = fVar237 * auVar168._16_4_;
            auVar66._20_4_ = fVar238 * auVar168._20_4_;
            auVar66._24_4_ = fVar239 * auVar168._24_4_;
            auVar66._28_4_ = auVar168._28_4_;
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar164,auVar66);
            auVar67._4_4_ = fVar234 * auVar160._4_4_;
            auVar67._0_4_ = fVar226 * auVar160._0_4_;
            auVar67._8_4_ = fVar235 * auVar160._8_4_;
            auVar67._12_4_ = fVar236 * auVar160._12_4_;
            auVar67._16_4_ = fVar237 * auVar160._16_4_;
            auVar67._20_4_ = fVar238 * auVar160._20_4_;
            auVar67._24_4_ = fVar239 * auVar160._24_4_;
            auVar67._28_4_ = auVar168._28_4_;
            auVar68._4_4_ = fVar234 * auVar162._4_4_;
            auVar68._0_4_ = fVar226 * auVar162._0_4_;
            auVar68._8_4_ = fVar235 * auVar162._8_4_;
            auVar68._12_4_ = fVar236 * auVar162._12_4_;
            auVar68._16_4_ = fVar237 * auVar162._16_4_;
            auVar68._20_4_ = fVar238 * auVar162._20_4_;
            fVar324 = auVar160._28_4_;
            auVar68._24_4_ = fVar239 * auVar162._24_4_;
            auVar68._28_4_ = fVar324;
            auVar69._4_4_ = fVar234 * auVar165._4_4_;
            auVar69._0_4_ = fVar226 * auVar165._0_4_;
            auVar69._8_4_ = fVar235 * auVar165._8_4_;
            auVar69._12_4_ = fVar236 * auVar165._12_4_;
            auVar69._16_4_ = fVar237 * auVar165._16_4_;
            auVar69._20_4_ = fVar238 * auVar165._20_4_;
            auVar69._24_4_ = fVar239 * auVar165._24_4_;
            auVar69._28_4_ = auVar162._28_4_;
            auVar168 = vfmadd213ps_avx512vl(local_320,auVar164,auVar67);
            auVar143 = vfmadd213ps_fma(auVar153,auVar164,auVar68);
            auVar148 = vfmadd213ps_fma(auVar154,auVar164,auVar69);
            auVar70._4_4_ = fVar234 * auVar156._4_4_;
            auVar70._0_4_ = fVar226 * auVar156._0_4_;
            auVar70._8_4_ = fVar235 * auVar156._8_4_;
            auVar70._12_4_ = fVar236 * auVar156._12_4_;
            auVar70._16_4_ = fVar237 * auVar156._16_4_;
            auVar70._20_4_ = fVar238 * auVar156._20_4_;
            auVar70._24_4_ = fVar239 * auVar156._24_4_;
            auVar70._28_4_ = auVar156._28_4_;
            auVar71._4_4_ = fVar234 * auVar158._4_4_;
            auVar71._0_4_ = fVar226 * auVar158._0_4_;
            auVar71._8_4_ = fVar235 * auVar158._8_4_;
            auVar71._12_4_ = fVar236 * auVar158._12_4_;
            auVar71._16_4_ = fVar237 * auVar158._16_4_;
            auVar71._20_4_ = fVar238 * auVar158._20_4_;
            auVar71._24_4_ = fVar239 * auVar158._24_4_;
            auVar71._28_4_ = auVar158._28_4_;
            auVar167 = vmulps_avx512vl(auVar161,auVar167);
            auVar165 = vfmadd213ps_avx512vl(_local_340,auVar164,auVar70);
            auVar144 = vfmadd213ps_fma(auVar166,auVar164,auVar71);
            auVar166 = vfmadd213ps_avx512vl(_local_1c0,auVar164,auVar167);
            auVar156 = vmulps_avx512vl(auVar161,auVar155);
            auVar72._4_4_ = auVar176._4_4_ * fVar234;
            auVar72._0_4_ = auVar176._0_4_ * fVar226;
            auVar72._8_4_ = auVar176._8_4_ * fVar235;
            auVar72._12_4_ = auVar176._12_4_ * fVar236;
            auVar72._16_4_ = auVar176._16_4_ * fVar237;
            auVar72._20_4_ = auVar176._20_4_ * fVar238;
            auVar72._24_4_ = auVar176._24_4_ * fVar239;
            auVar72._28_4_ = auVar158._28_4_;
            auVar132._4_4_ = auVar177._4_4_ * fVar234;
            auVar132._0_4_ = auVar177._0_4_ * fVar226;
            auVar132._8_4_ = auVar177._8_4_ * fVar235;
            auVar132._12_4_ = auVar177._12_4_ * fVar236;
            auVar132._16_4_ = auVar177._16_4_ * fVar237;
            auVar132._20_4_ = auVar177._20_4_ * fVar238;
            auVar132._24_4_ = auVar177._24_4_ * fVar239;
            auVar132._28_4_ = auVar161._28_4_;
            auVar155 = vfmadd213ps_avx512vl(_local_300,auVar164,auVar156);
            auVar153 = vfmadd213ps_avx512vl(auVar149,auVar164,auVar72);
            auVar154 = vfmadd213ps_avx512vl(auVar157,auVar164,auVar132);
            auVar158 = vmulps_avx512vl(auVar193,auVar193);
            auVar161 = vmulps_avx512vl(auVar194,auVar194);
            auVar229._0_4_ = auVar158._0_4_ + auVar161._0_4_;
            auVar229._4_4_ = auVar158._4_4_ + auVar161._4_4_;
            auVar229._8_4_ = auVar158._8_4_ + auVar161._8_4_;
            auVar229._12_4_ = auVar158._12_4_ + auVar161._12_4_;
            auVar229._16_4_ = auVar158._16_4_ + auVar161._16_4_;
            auVar229._20_4_ = auVar158._20_4_ + auVar161._20_4_;
            auVar229._24_4_ = auVar158._24_4_ + auVar161._24_4_;
            auVar229._28_4_ = auVar158._28_4_ + auVar161._28_4_;
            auVar73._4_4_ = auVar195._4_4_ * auVar195._4_4_;
            auVar73._0_4_ = auVar195._0_4_ * auVar195._0_4_;
            auVar73._8_4_ = auVar195._8_4_ * auVar195._8_4_;
            auVar73._12_4_ = auVar195._12_4_ * auVar195._12_4_;
            auVar73._16_4_ = auVar195._16_4_ * auVar195._16_4_;
            auVar73._20_4_ = auVar195._20_4_ * auVar195._20_4_;
            auVar73._24_4_ = auVar195._24_4_ * auVar195._24_4_;
            auVar73._28_4_ = auVar167._28_4_;
            auVar149 = vsubps_avx(auVar229,auVar73);
            auVar74._4_4_ = auVar196._4_4_ * auVar196._4_4_;
            auVar74._0_4_ = auVar196._0_4_ * auVar196._0_4_;
            auVar74._8_4_ = auVar196._8_4_ * auVar196._8_4_;
            auVar74._12_4_ = auVar196._12_4_ * auVar196._12_4_;
            auVar74._16_4_ = auVar196._16_4_ * auVar196._16_4_;
            auVar74._20_4_ = auVar196._20_4_ * auVar196._20_4_;
            auVar74._24_4_ = auVar196._24_4_ * auVar196._24_4_;
            auVar74._28_4_ = fVar324;
            auVar149 = vsubps_avx(auVar149,auVar74);
            auVar156 = vmulps_avx512vl(auVar194,auVar195);
            auVar157 = vmulps_avx512vl(auVar193,auVar196);
            fVar226 = auVar156._0_4_ + auVar157._0_4_;
            fVar234 = auVar156._4_4_ + auVar157._4_4_;
            fVar235 = auVar156._8_4_ + auVar157._8_4_;
            fVar236 = auVar156._12_4_ + auVar157._12_4_;
            fVar237 = auVar156._16_4_ + auVar157._16_4_;
            fVar238 = auVar156._20_4_ + auVar157._20_4_;
            fVar239 = auVar156._24_4_ + auVar157._24_4_;
            fVar336 = auVar156._28_4_ + auVar157._28_4_;
            auVar230._0_4_ = fVar226 + fVar226;
            auVar230._4_4_ = fVar234 + fVar234;
            auVar230._8_4_ = fVar235 + fVar235;
            auVar230._12_4_ = fVar236 + fVar236;
            auVar230._16_4_ = fVar237 + fVar237;
            auVar230._20_4_ = fVar238 + fVar238;
            auVar230._24_4_ = fVar239 + fVar239;
            auVar230._28_4_ = fVar336 + fVar336;
            auVar160 = vmulps_avx512vl(auVar194,auVar196);
            auVar162 = vmulps_avx512vl(auVar193,auVar195);
            auVar164 = vsubps_avx512vl(auVar160,auVar162);
            auVar164 = vaddps_avx512vl(auVar164,auVar164);
            auVar156 = vsubps_avx(auVar156,auVar157);
            auVar289._0_4_ = auVar156._0_4_ + auVar156._0_4_;
            auVar289._4_4_ = auVar156._4_4_ + auVar156._4_4_;
            auVar289._8_4_ = auVar156._8_4_ + auVar156._8_4_;
            auVar289._12_4_ = auVar156._12_4_ + auVar156._12_4_;
            auVar289._16_4_ = auVar156._16_4_ + auVar156._16_4_;
            auVar289._20_4_ = auVar156._20_4_ + auVar156._20_4_;
            auVar289._24_4_ = auVar156._24_4_ + auVar156._24_4_;
            auVar289._28_4_ = auVar156._28_4_ + auVar156._28_4_;
            auVar156 = vsubps_avx(auVar158,auVar161);
            auVar262._0_4_ = auVar195._0_4_ * auVar195._0_4_ + auVar156._0_4_;
            auVar262._4_4_ = auVar195._4_4_ * auVar195._4_4_ + auVar156._4_4_;
            auVar262._8_4_ = auVar195._8_4_ * auVar195._8_4_ + auVar156._8_4_;
            auVar262._12_4_ = auVar195._12_4_ * auVar195._12_4_ + auVar156._12_4_;
            auVar262._16_4_ = auVar195._16_4_ * auVar195._16_4_ + auVar156._16_4_;
            auVar262._20_4_ = auVar195._20_4_ * auVar195._20_4_ + auVar156._20_4_;
            auVar262._24_4_ = auVar195._24_4_ * auVar195._24_4_ + auVar156._24_4_;
            auVar262._28_4_ = auVar167._28_4_ + auVar156._28_4_;
            auVar158 = vsubps_avx(auVar262,auVar74);
            auVar75._4_4_ = auVar195._4_4_ * auVar196._4_4_;
            auVar75._0_4_ = auVar195._0_4_ * auVar196._0_4_;
            auVar75._8_4_ = auVar195._8_4_ * auVar196._8_4_;
            auVar75._12_4_ = auVar195._12_4_ * auVar196._12_4_;
            auVar75._16_4_ = auVar195._16_4_ * auVar196._16_4_;
            auVar75._20_4_ = auVar195._20_4_ * auVar196._20_4_;
            auVar75._24_4_ = auVar195._24_4_ * auVar196._24_4_;
            auVar75._28_4_ = auVar262._28_4_;
            auVar161 = vmulps_avx512vl(auVar193,auVar194);
            fVar226 = auVar195._0_4_ * auVar196._0_4_ + auVar161._0_4_;
            fVar234 = auVar195._4_4_ * auVar196._4_4_ + auVar161._4_4_;
            fVar235 = auVar195._8_4_ * auVar196._8_4_ + auVar161._8_4_;
            fVar236 = auVar195._12_4_ * auVar196._12_4_ + auVar161._12_4_;
            fVar237 = auVar195._16_4_ * auVar196._16_4_ + auVar161._16_4_;
            fVar238 = auVar195._20_4_ * auVar196._20_4_ + auVar161._20_4_;
            fVar239 = auVar195._24_4_ * auVar196._24_4_ + auVar161._24_4_;
            fVar336 = auVar262._28_4_ + auVar161._28_4_;
            auVar313._0_4_ = fVar226 + fVar226;
            auVar313._4_4_ = fVar234 + fVar234;
            auVar313._8_4_ = fVar235 + fVar235;
            auVar313._12_4_ = fVar236 + fVar236;
            auVar313._16_4_ = fVar237 + fVar237;
            auVar313._20_4_ = fVar238 + fVar238;
            auVar313._24_4_ = fVar239 + fVar239;
            auVar313._28_4_ = fVar336 + fVar336;
            auVar167 = vaddps_avx512vl(auVar160,auVar162);
            auVar348._0_4_ = auVar167._0_4_ + auVar167._0_4_;
            auVar348._4_4_ = auVar167._4_4_ + auVar167._4_4_;
            auVar348._8_4_ = auVar167._8_4_ + auVar167._8_4_;
            auVar348._12_4_ = auVar167._12_4_ + auVar167._12_4_;
            auVar348._16_4_ = auVar167._16_4_ + auVar167._16_4_;
            auVar348._20_4_ = auVar167._20_4_ + auVar167._20_4_;
            auVar348._24_4_ = auVar167._24_4_ + auVar167._24_4_;
            auVar348._28_4_ = auVar167._28_4_ + auVar167._28_4_;
            auVar161 = vsubps_avx(auVar75,auVar161);
            auVar161 = vaddps_avx512vl(auVar161,auVar161);
            auVar156 = vsubps_avx(auVar156,auVar73);
            auVar255._0_4_ = auVar196._0_4_ * auVar196._0_4_ + auVar156._0_4_;
            auVar255._4_4_ = auVar196._4_4_ * auVar196._4_4_ + auVar156._4_4_;
            auVar255._8_4_ = auVar196._8_4_ * auVar196._8_4_ + auVar156._8_4_;
            auVar255._12_4_ = auVar196._12_4_ * auVar196._12_4_ + auVar156._12_4_;
            auVar255._16_4_ = auVar196._16_4_ * auVar196._16_4_ + auVar156._16_4_;
            auVar255._20_4_ = auVar196._20_4_ * auVar196._20_4_ + auVar156._20_4_;
            auVar255._24_4_ = auVar196._24_4_ * auVar196._24_4_ + auVar156._24_4_;
            auVar255._28_4_ = fVar324 + auVar156._28_4_;
            auVar157 = ZEXT1632(auVar293);
            auVar156 = vmulps_avx512vl(auVar164,auVar157);
            auVar145 = vxorps_avx512vl(auVar150._0_16_,auVar150._0_16_);
            auVar167 = vfmadd213ps_avx512vl(ZEXT1632(auVar145),auVar230,auVar156);
            auVar332._0_4_ = auVar230._0_4_ + auVar156._0_4_;
            auVar332._4_4_ = auVar230._4_4_ + auVar156._4_4_;
            auVar332._8_4_ = auVar230._8_4_ + auVar156._8_4_;
            auVar332._12_4_ = auVar230._12_4_ + auVar156._12_4_;
            auVar332._16_4_ = auVar230._16_4_ + auVar156._16_4_;
            auVar332._20_4_ = auVar230._20_4_ + auVar156._20_4_;
            auVar332._24_4_ = auVar230._24_4_ + auVar156._24_4_;
            fVar226 = auVar156._28_4_;
            auVar332._28_4_ = auVar230._28_4_ + fVar226;
            auVar156 = vfmadd213ps_avx512vl(auVar230,auVar157,auVar164);
            auVar147 = vfmadd231ps_fma(auVar332,auVar149,auVar157);
            auVar292 = vfmadd231ps_fma(auVar156,auVar157,auVar149);
            auVar150 = ZEXT1632(auVar293);
            auVar76._4_4_ = auVar313._4_4_ * 0.0;
            auVar76._0_4_ = auVar313._0_4_ * 0.0;
            auVar76._8_4_ = auVar313._8_4_ * 0.0;
            auVar76._12_4_ = auVar313._12_4_ * 0.0;
            auVar76._16_4_ = auVar313._16_4_ * 0.0;
            auVar76._20_4_ = auVar313._20_4_ * 0.0;
            auVar76._24_4_ = auVar313._24_4_ * 0.0;
            auVar76._28_4_ = fVar226;
            auVar145 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar158,auVar76);
            auVar156 = vaddps_avx512vl(auVar158,auVar76);
            auVar146 = vfmadd213ps_fma(auVar158,auVar150,auVar313);
            auVar158 = vaddps_avx512vl(auVar289,ZEXT1632(auVar145));
            auVar156 = vfmadd231ps_avx512vl(auVar156,auVar289,auVar150);
            auVar145 = vfmadd231ps_fma(ZEXT1632(auVar146),auVar150,auVar289);
            auVar77._4_4_ = auVar255._4_4_ * 0.0;
            auVar77._0_4_ = auVar255._0_4_ * 0.0;
            auVar77._8_4_ = auVar255._8_4_ * 0.0;
            auVar77._12_4_ = auVar255._12_4_ * 0.0;
            auVar77._16_4_ = auVar255._16_4_ * 0.0;
            auVar77._20_4_ = auVar255._20_4_ * 0.0;
            auVar77._24_4_ = auVar255._24_4_ * 0.0;
            auVar77._28_4_ = fVar226;
            auVar157 = vfmadd213ps_avx512vl(ZEXT832(0) << 0x20,auVar161,auVar77);
            auVar160 = vaddps_avx512vl(auVar161,auVar77);
            auVar161 = vfmadd213ps_avx512vl(auVar161,auVar150,auVar255);
            auVar256._0_4_ = auVar348._0_4_ + auVar157._0_4_;
            auVar256._4_4_ = auVar348._4_4_ + auVar157._4_4_;
            auVar256._8_4_ = auVar348._8_4_ + auVar157._8_4_;
            auVar256._12_4_ = auVar348._12_4_ + auVar157._12_4_;
            auVar256._16_4_ = auVar348._16_4_ + auVar157._16_4_;
            auVar256._20_4_ = auVar348._20_4_ + auVar157._20_4_;
            auVar256._24_4_ = auVar348._24_4_ + auVar157._24_4_;
            auVar256._28_4_ = auVar348._28_4_ + auVar157._28_4_;
            auVar146 = vfmadd231ps_fma(auVar160,auVar348,auVar150);
            auVar161 = vfmadd231ps_avx512vl(auVar161,auVar150,auVar348);
            auVar157 = vaddps_avx512vl(auVar159,auVar150);
            auVar176 = ZEXT1632(auVar293);
            auVar163 = vaddps_avx512vl(auVar163,auVar176);
            auVar159 = vaddps_avx512vl(ZEXT1632(auVar148),auVar176);
            auVar160 = vmulps_avx512vl(auVar256,auVar176);
            auVar78._28_4_ = auVar348._28_4_;
            auVar78._0_28_ =
                 ZEXT1628(CONCAT412(auVar146._12_4_ * 0.0,
                                    CONCAT48(auVar146._8_4_ * 0.0,
                                             CONCAT44(auVar146._4_4_ * 0.0,auVar146._0_4_ * 0.0))));
            auVar150 = vmulps_avx512vl(auVar161,auVar176);
            auVar164 = vfmadd213ps_avx512vl(ZEXT432(0) << 0x20,auVar158,auVar160);
            auVar148 = vxorps_avx512vl(auVar162._0_16_,auVar162._0_16_);
            auVar162 = vfmadd213ps_avx512vl(ZEXT1632(auVar148),auVar156,auVar78);
            auVar148 = vfmadd213ps_fma(auVar176,ZEXT1632(auVar145),auVar150);
            auVar160 = vfmadd231ps_avx512vl(auVar160,ZEXT1632(auVar143),auVar158);
            auVar176 = vfmadd231ps_avx512vl(auVar78,ZEXT1632(auVar143),auVar156);
            auVar143 = vfmadd213ps_fma(ZEXT1632(auVar143),ZEXT1632(auVar145),auVar150);
            auVar150 = vmulps_avx512vl(auVar166,auVar256);
            auVar177 = vmulps_avx512vl(auVar166,ZEXT1632(auVar146));
            auVar166 = vmulps_avx512vl(auVar166,auVar161);
            auVar150 = vfmadd231ps_avx512vl(auVar150,ZEXT1632(auVar144),auVar158);
            auVar177 = vfmadd231ps_avx512vl(auVar177,ZEXT1632(auVar144),auVar156);
            auVar144 = vfmadd231ps_fma(auVar166,ZEXT1632(auVar145),ZEXT1632(auVar144));
            auVar166 = vmulps_avx512vl(auVar154,auVar256);
            auVar178 = vmulps_avx512vl(auVar154,ZEXT1632(auVar146));
            auVar161 = vmulps_avx512vl(auVar154,auVar161);
            auVar158 = vfmadd231ps_avx512vl(auVar166,auVar153,auVar158);
            auVar156 = vfmadd231ps_avx512vl(auVar178,auVar153,auVar156);
            auVar161 = vfmadd231ps_avx512vl(auVar161,auVar153,ZEXT1632(auVar145));
            auVar149 = vaddps_avx512vl(auVar149,auVar167);
            auVar166 = vfmadd231ps_avx512vl(auVar164,auVar180,auVar149);
            auVar167 = vfmadd231ps_avx512vl(auVar162,auVar180,ZEXT1632(auVar147));
            auVar153 = vfmadd231ps_avx512vl(ZEXT1632(auVar148),ZEXT1632(auVar292),auVar180);
            auVar154 = vfmadd231ps_avx512vl(auVar160,auVar168,auVar149);
            auVar160 = vfmadd231ps_avx512vl(auVar176,auVar168,ZEXT1632(auVar147));
            auVar168 = vfmadd231ps_avx512vl(ZEXT1632(auVar143),ZEXT1632(auVar292),auVar168);
            auVar162 = vfmadd231ps_avx512vl(auVar150,auVar165,auVar149);
            auVar150 = vfmadd231ps_avx512vl(auVar177,auVar165,ZEXT1632(auVar147));
            auVar165 = vfmadd231ps_avx512vl(ZEXT1632(auVar144),ZEXT1632(auVar292),auVar165);
            auVar158 = vfmadd231ps_avx512vl(auVar158,auVar155,auVar149);
            auVar157 = vaddps_avx512vl(auVar157,auVar158);
            auVar156 = vfmadd231ps_avx512vl(auVar156,auVar155,ZEXT1632(auVar147));
            auVar164 = vaddps_avx512vl(auVar163,auVar156);
            auVar156 = vfmadd231ps_avx512vl(auVar161,auVar155,ZEXT1632(auVar292));
            auVar159 = vaddps_avx512vl(auVar159,auVar156);
            auVar231._0_4_ = auVar150._0_4_ * auVar168._0_4_;
            auVar231._4_4_ = auVar150._4_4_ * auVar168._4_4_;
            auVar231._8_4_ = auVar150._8_4_ * auVar168._8_4_;
            auVar231._12_4_ = auVar150._12_4_ * auVar168._12_4_;
            auVar231._16_4_ = auVar150._16_4_ * auVar168._16_4_;
            auVar231._20_4_ = auVar150._20_4_ * auVar168._20_4_;
            auVar231._24_4_ = auVar150._24_4_ * auVar168._24_4_;
            auVar231._28_4_ = 0;
            auVar148 = vfmsub231ps_fma(auVar231,auVar160,auVar165);
            auVar158 = vmulps_avx512vl(auVar165,auVar154);
            auVar144 = vfmsub231ps_fma(auVar158,auVar168,auVar162);
            auVar79._4_4_ = auVar160._4_4_ * auVar162._4_4_;
            auVar79._0_4_ = auVar160._0_4_ * auVar162._0_4_;
            auVar79._8_4_ = auVar160._8_4_ * auVar162._8_4_;
            auVar79._12_4_ = auVar160._12_4_ * auVar162._12_4_;
            auVar79._16_4_ = auVar160._16_4_ * auVar162._16_4_;
            auVar79._20_4_ = auVar160._20_4_ * auVar162._20_4_;
            auVar79._24_4_ = auVar160._24_4_ * auVar162._24_4_;
            auVar79._28_4_ = auVar156._28_4_;
            auVar155 = vfmsub231ps_avx512vl(auVar79,auVar154,auVar150);
            fVar226 = auVar153._0_4_;
            fVar234 = auVar153._4_4_;
            auVar80._4_4_ = fVar234 * auVar162._4_4_;
            auVar80._0_4_ = fVar226 * auVar162._0_4_;
            fVar235 = auVar153._8_4_;
            auVar80._8_4_ = fVar235 * auVar162._8_4_;
            fVar236 = auVar153._12_4_;
            auVar80._12_4_ = fVar236 * auVar162._12_4_;
            fVar237 = auVar153._16_4_;
            auVar80._16_4_ = fVar237 * auVar162._16_4_;
            fVar238 = auVar153._20_4_;
            auVar80._20_4_ = fVar238 * auVar162._20_4_;
            fVar239 = auVar153._24_4_;
            auVar80._24_4_ = fVar239 * auVar162._24_4_;
            auVar80._28_4_ = auVar149._28_4_;
            auVar145 = vfmsub231ps_fma(auVar80,auVar166,auVar165);
            auVar149 = vmulps_avx512vl(auVar167,auVar165);
            auVar146 = vfmsub231ps_fma(auVar149,auVar150,auVar153);
            auVar302._0_4_ = auVar166._0_4_ * auVar150._0_4_;
            auVar302._4_4_ = auVar166._4_4_ * auVar150._4_4_;
            auVar302._8_4_ = auVar166._8_4_ * auVar150._8_4_;
            auVar302._12_4_ = auVar166._12_4_ * auVar150._12_4_;
            auVar302._16_4_ = auVar166._16_4_ * auVar150._16_4_;
            auVar302._20_4_ = auVar166._20_4_ * auVar150._20_4_;
            auVar302._24_4_ = auVar166._24_4_ * auVar150._24_4_;
            auVar302._28_4_ = 0;
            auVar180 = vfmsub231ps_avx512vl(auVar302,auVar167,auVar162);
            auVar81._4_4_ = auVar160._4_4_ * fVar234;
            auVar81._0_4_ = auVar160._0_4_ * fVar226;
            auVar81._8_4_ = auVar160._8_4_ * fVar235;
            auVar81._12_4_ = auVar160._12_4_ * fVar236;
            auVar81._16_4_ = auVar160._16_4_ * fVar237;
            auVar81._20_4_ = auVar160._20_4_ * fVar238;
            auVar81._24_4_ = auVar160._24_4_ * fVar239;
            auVar81._28_4_ = auVar162._28_4_;
            auVar158 = vfmsub231ps_avx512vl(auVar81,auVar167,auVar168);
            auVar82._4_4_ = auVar166._4_4_ * auVar168._4_4_;
            auVar82._0_4_ = auVar166._0_4_ * auVar168._0_4_;
            auVar82._8_4_ = auVar166._8_4_ * auVar168._8_4_;
            auVar82._12_4_ = auVar166._12_4_ * auVar168._12_4_;
            auVar82._16_4_ = auVar166._16_4_ * auVar168._16_4_;
            auVar82._20_4_ = auVar166._20_4_ * auVar168._20_4_;
            auVar82._24_4_ = auVar166._24_4_ * auVar168._24_4_;
            auVar82._28_4_ = auVar150._28_4_;
            auVar168 = vfmsub231ps_avx512vl(auVar82,auVar153,auVar154);
            auVar149 = vmulps_avx512vl(auVar154,auVar167);
            auVar165 = vfmsub231ps_avx512vl(auVar149,auVar166,auVar160);
            auVar83._4_4_ = fVar234 * auVar155._4_4_;
            auVar83._0_4_ = fVar226 * auVar155._0_4_;
            auVar83._8_4_ = fVar235 * auVar155._8_4_;
            auVar83._12_4_ = fVar236 * auVar155._12_4_;
            auVar83._16_4_ = fVar237 * auVar155._16_4_;
            auVar83._20_4_ = fVar238 * auVar155._20_4_;
            auVar83._24_4_ = fVar239 * auVar155._24_4_;
            auVar83._28_4_ = auVar160._28_4_;
            auVar149 = vfmadd231ps_avx512vl(auVar83,ZEXT1632(auVar144),auVar167);
            auVar143 = vfmadd231ps_fma(auVar149,ZEXT1632(auVar148),auVar166);
            auVar149 = vdivps_avx(ZEXT1632(auVar148),ZEXT1632(auVar143));
            auVar156 = vdivps_avx(ZEXT1632(auVar146),ZEXT1632(auVar143));
            auVar167 = ZEXT1632(auVar143);
            auVar158 = vdivps_avx(auVar158,auVar167);
            auVar161 = vdivps_avx(ZEXT1632(auVar144),auVar167);
            auVar163 = vdivps_avx(ZEXT1632(auVar145),auVar167);
            auVar168 = vdivps_avx(auVar168,auVar167);
            auVar153 = ZEXT1632(auVar143);
            auVar167 = vdivps_avx(auVar155,auVar153);
            auVar155 = vdivps_avx(auVar180,auVar153);
            auVar165 = vdivps_avx512vl(auVar165,auVar153);
            fVar226 = auVar159._0_4_;
            fVar234 = auVar159._4_4_;
            auVar84._4_4_ = fVar234 * auVar167._4_4_;
            auVar84._0_4_ = fVar226 * auVar167._0_4_;
            fVar235 = auVar159._8_4_;
            auVar84._8_4_ = fVar235 * auVar167._8_4_;
            fVar236 = auVar159._12_4_;
            auVar84._12_4_ = fVar236 * auVar167._12_4_;
            fVar237 = auVar159._16_4_;
            auVar84._16_4_ = fVar237 * auVar167._16_4_;
            fVar238 = auVar159._20_4_;
            auVar84._20_4_ = fVar238 * auVar167._20_4_;
            fVar239 = auVar159._24_4_;
            auVar84._24_4_ = fVar239 * auVar167._24_4_;
            auVar84._28_4_ = auVar180._28_4_;
            auVar85._4_4_ = fVar234 * auVar155._4_4_;
            auVar85._0_4_ = fVar226 * auVar155._0_4_;
            auVar85._8_4_ = fVar235 * auVar155._8_4_;
            auVar85._12_4_ = fVar236 * auVar155._12_4_;
            auVar85._16_4_ = fVar237 * auVar155._16_4_;
            auVar85._20_4_ = fVar238 * auVar155._20_4_;
            auVar85._24_4_ = fVar239 * auVar155._24_4_;
            auVar85._28_4_ = auVar166._28_4_;
            auVar349._0_4_ = fVar226 * auVar165._0_4_;
            auVar349._4_4_ = fVar234 * auVar165._4_4_;
            auVar349._8_4_ = fVar235 * auVar165._8_4_;
            auVar349._12_4_ = fVar236 * auVar165._12_4_;
            auVar349._16_4_ = fVar237 * auVar165._16_4_;
            auVar349._20_4_ = fVar238 * auVar165._20_4_;
            auVar349._24_4_ = fVar239 * auVar165._24_4_;
            auVar349._28_4_ = 0;
            auVar143 = vfmadd231ps_fma(auVar84,auVar164,auVar161);
            auVar148 = vfmadd231ps_fma(auVar85,auVar164,auVar163);
            auVar144 = vfmadd231ps_fma(auVar349,auVar168,auVar164);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar157,auVar149);
            auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar157,auVar156);
            auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar158,auVar157);
          }
          else {
            auVar149._8_4_ = 1;
            auVar149._0_8_ = 0x100000001;
            auVar149._12_4_ = 1;
            auVar149._16_4_ = 1;
            auVar149._20_4_ = 1;
            auVar149._24_4_ = 1;
            auVar149._28_4_ = 1;
            auVar156._8_4_ = 2;
            auVar156._0_8_ = 0x200000002;
            auVar156._12_4_ = 2;
            auVar156._16_4_ = 2;
            auVar156._20_4_ = 2;
            auVar156._24_4_ = 2;
            auVar156._28_4_ = 2;
            auVar168._8_4_ = 3;
            auVar168._0_8_ = 0x300000003;
            auVar168._12_4_ = 3;
            auVar168._16_4_ = 3;
            auVar168._20_4_ = 3;
            auVar168._24_4_ = 3;
            auVar168._28_4_ = 3;
            pRVar6 = (this_00->l2w_buf).items;
            uVar140 = uVar139 & 0xffffffff;
            while( true ) {
              bVar138 = (byte)uVar140;
              auVar163 = in_ZMM28._0_32_;
              auVar167 = in_ZMM30._0_32_;
              auVar155 = in_ZMM31._0_32_;
              auVar158 = auVar258._0_32_;
              if (bVar138 == 0) break;
              uVar142 = 0;
              for (uVar208 = (uint)uVar140 & 0xff; (uVar208 & 1) == 0;
                  uVar208 = uVar208 >> 1 | 0x80000000) {
                uVar142 = uVar142 + 1;
              }
              pRVar4 = pRVar6 + *(int *)(local_1e0 + (ulong)uVar142 * 4);
              RVar2 = pRVar6[*(int *)(local_1e0 + (ulong)uVar142 * 4)].format;
              if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar5 = pRVar4->ptr_ofs;
                lVar137 = pRVar4->stride * uVar135;
                auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137)),
                                         ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x10)),0x1c);
                auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x20)),0x28);
                in_ZMM7 = ZEXT1664(auVar143);
                auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),
                                         ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x14)),0x1c);
                auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),0x28);
                in_ZMM10 = ZEXT1664(auVar143);
                auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),
                                         ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),0x1c);
                auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x28)),0x28);
                in_ZMM9 = ZEXT1664(auVar143);
                auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                         ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x1c)),0x1c);
                auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x2c)),0x28);
                in_ZMM12 = ZEXT1664(auVar143);
              }
              else {
                auVar198._16_16_ = auVar154._16_16_;
                if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                  pcVar5 = pRVar4->ptr_ofs;
                  lVar137 = pRVar4->stride * uVar135;
                  auVar144._8_8_ = 0;
                  auVar144._0_8_ = *(ulong *)(pcVar5 + lVar137 + 4);
                  auVar145._8_8_ = 0;
                  auVar145._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
                  auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137)),_DAT_01fbb140,
                                                auVar144);
                  in_ZMM7 = ZEXT1664(auVar143);
                  auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                                _DAT_01fbb140,auVar145);
                  in_ZMM10 = ZEXT1664(auVar143);
                  auVar146._8_8_ = 0;
                  auVar146._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
                  auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),
                                                _DAT_01fbb140,auVar146);
                  in_ZMM9 = ZEXT1664(auVar143);
                  auVar147._8_8_ = 0;
                  auVar147._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x28);
                  auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),
                                                _DAT_01fbb140,auVar147);
                  in_ZMM12 = ZEXT1664(auVar143);
                }
                else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                  pcVar5 = pRVar4->ptr_ofs;
                  lVar137 = pRVar4->stride * uVar135;
                  auVar292._8_8_ = 0;
                  auVar292._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
                  auVar143 = vinsertps_avx(auVar292,ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),0x20);
                  auVar293._8_8_ = 0;
                  auVar293._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x34);
                  auVar144 = vpermt2ps_avx512vl(auVar293,_DAT_01fbb150,
                                                ZEXT416(*(uint *)(pcVar5 + lVar137)));
                  auVar310._8_8_ = 0;
                  auVar310._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
                  auVar148 = vpermt2ps_avx512vl(auVar310,_DAT_01fbb150,
                                                ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)));
                  uVar142 = *(uint *)(pcVar5 + lVar137 + 0x24);
                  uVar208 = *(uint *)(pcVar5 + lVar137 + 0x28);
                  uVar209 = *(uint *)(pcVar5 + lVar137 + 0x2c);
                  uVar210 = *(uint *)(pcVar5 + lVar137 + 0x30);
                  auVar145 = vmulss_avx512f(ZEXT416(uVar208),ZEXT416(uVar208));
                  auVar145 = vfmadd231ss_avx512f(auVar145,ZEXT416(uVar142),ZEXT416(uVar142));
                  auVar145 = vfmadd231ss_avx512f(auVar145,ZEXT416(uVar209),ZEXT416(uVar209));
                  auVar145 = vfmadd231ss_avx512f(auVar145,ZEXT416(uVar210),ZEXT416(uVar210));
                  auVar198._0_16_ = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
                  auVar197._4_28_ = auVar198._4_28_;
                  auVar197._0_4_ = auVar145._0_4_;
                  auVar146 = vrsqrt14ss_avx512f(auVar198._0_16_,auVar197._0_16_);
                  auVar147 = vmulss_avx512f(auVar146,ZEXT416(0x3fc00000));
                  in_ZMM20 = ZEXT1664(auVar147);
                  auVar145 = vmulss_avx512f(auVar145,ZEXT416(0xbf000000));
                  auVar145 = vmulss_avx512f(auVar146,auVar145);
                  auVar146 = vmulss_avx512f(auVar146,auVar146);
                  auVar145 = vmulss_avx512f(auVar146,auVar145);
                  auVar145 = vaddss_avx512f(auVar147,auVar145);
                  auVar146 = vmulss_avx512f(ZEXT416(uVar142),auVar145);
                  auVar148 = vinsertps_avx(auVar148,auVar146,0x30);
                  in_ZMM12 = ZEXT1664(auVar148);
                  auVar148 = vmulss_avx512f(ZEXT416(uVar208),auVar145);
                  auVar148 = vinsertps_avx(auVar144,auVar148,0x30);
                  in_ZMM7 = ZEXT1664(auVar148);
                  auVar148 = vmulss_avx512f(ZEXT416(uVar209),auVar145);
                  auVar144 = vmulss_avx512f(ZEXT416(uVar210),auVar145);
                  auVar143 = vinsertps_avx(auVar143,auVar144,0x30);
                  in_ZMM9 = ZEXT1664(auVar143);
                  auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                           ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),0x10);
                  auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x3c)),0x20
                                          );
                  auVar143 = vinsertps_avx(auVar143,auVar148,0x30);
                  in_ZMM10 = ZEXT1664(auVar143);
                }
                else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                  pcVar5 = pRVar4->ptr_ofs;
                  lVar137 = pRVar4->stride * uVar135;
                  in_ZMM7 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar137));
                  in_ZMM10 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x10));
                  in_ZMM9 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x20));
                  in_ZMM12 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x30));
                }
              }
              auVar158 = vpbroadcastd_avx512vl();
              uVar18 = vpcmpeqd_avx512vl(auVar158,local_1e0);
              RVar2 = pRVar4[1].format;
              if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar5 = pRVar4[1].ptr_ofs;
                lVar137 = pRVar4[1].stride * uVar135;
                auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137)),
                                         ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x10)),0x1c);
                auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x20)),0x28);
                in_ZMM8 = ZEXT1664(auVar143);
                auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),
                                         ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x14)),0x1c);
                auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),0x28);
                in_ZMM11 = ZEXT1664(auVar143);
                auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),
                                         ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),0x1c);
                auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x28)),0x28);
                auVar265 = ZEXT1664(auVar143);
                auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                         ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x1c)),0x1c);
                auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x2c)),0x28);
                in_ZMM13 = ZEXT1664(auVar143);
              }
              else {
                auVar200._16_16_ = auVar158._16_16_;
                if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                  pcVar5 = pRVar4[1].ptr_ofs;
                  lVar137 = pRVar4[1].stride * uVar135;
                  auVar245._8_8_ = 0;
                  auVar245._0_8_ = *(ulong *)(pcVar5 + lVar137 + 4);
                  auVar351._8_8_ = 0;
                  auVar351._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
                  auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137)),_DAT_01fbb140,
                                                auVar245);
                  in_ZMM8 = ZEXT1664(auVar143);
                  auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                                _DAT_01fbb140,auVar351);
                  in_ZMM11 = ZEXT1664(auVar143);
                  auVar352._8_8_ = 0;
                  auVar352._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
                  auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),
                                                _DAT_01fbb140,auVar352);
                  auVar265 = ZEXT1664(auVar143);
                  auVar355._8_8_ = 0;
                  auVar355._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x28);
                  auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),
                                                _DAT_01fbb140,auVar355);
                  in_ZMM13 = ZEXT1664(auVar143);
                }
                else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                  pcVar5 = pRVar4[1].ptr_ofs;
                  lVar137 = pRVar4[1].stride * uVar135;
                  auVar246._8_8_ = 0;
                  auVar246._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
                  auVar143 = vinsertps_avx(auVar246,ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),0x20);
                  auVar296._8_8_ = 0;
                  auVar296._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x34);
                  auVar144 = vpermt2ps_avx512vl(auVar296,_DAT_01fbb150,
                                                ZEXT416(*(uint *)(pcVar5 + lVar137)));
                  auVar328._8_8_ = 0;
                  auVar328._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
                  auVar148 = vpermt2ps_avx512vl(auVar328,_DAT_01fbb150,
                                                ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)));
                  uVar142 = *(uint *)(pcVar5 + lVar137 + 0x24);
                  uVar208 = *(uint *)(pcVar5 + lVar137 + 0x28);
                  uVar209 = *(uint *)(pcVar5 + lVar137 + 0x2c);
                  uVar210 = *(uint *)(pcVar5 + lVar137 + 0x30);
                  auVar145 = vmulss_avx512f(ZEXT416(uVar208),ZEXT416(uVar208));
                  auVar145 = vfmadd231ss_avx512f(auVar145,ZEXT416(uVar142),ZEXT416(uVar142));
                  auVar145 = vfmadd231ss_avx512f(auVar145,ZEXT416(uVar209),ZEXT416(uVar209));
                  auVar145 = vfmadd231ss_avx512f(auVar145,ZEXT416(uVar210),ZEXT416(uVar210));
                  auVar200._0_16_ = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
                  auVar199._4_28_ = auVar200._4_28_;
                  auVar199._0_4_ = auVar145._0_4_;
                  auVar146 = vrsqrt14ss_avx512f(auVar200._0_16_,auVar199._0_16_);
                  auVar147 = vmulss_avx512f(auVar146,ZEXT416(0x3fc00000));
                  in_ZMM20 = ZEXT1664(auVar147);
                  auVar145 = vmulss_avx512f(auVar145,ZEXT416(0xbf000000));
                  auVar145 = vmulss_avx512f(auVar146,auVar145);
                  auVar146 = vmulss_avx512f(auVar146,auVar146);
                  auVar145 = vmulss_avx512f(auVar146,auVar145);
                  auVar145 = vaddss_avx512f(auVar147,auVar145);
                  auVar146 = vmulss_avx512f(ZEXT416(uVar142),auVar145);
                  auVar148 = vinsertps_avx(auVar148,auVar146,0x30);
                  in_ZMM13 = ZEXT1664(auVar148);
                  auVar148 = vmulss_avx512f(ZEXT416(uVar208),auVar145);
                  auVar148 = vinsertps_avx(auVar144,auVar148,0x30);
                  in_ZMM8 = ZEXT1664(auVar148);
                  auVar148 = vmulss_avx512f(ZEXT416(uVar209),auVar145);
                  auVar144 = vmulss_avx512f(ZEXT416(uVar210),auVar145);
                  auVar143 = vinsertps_avx(auVar143,auVar144,0x30);
                  auVar265 = ZEXT1664(auVar143);
                  auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                           ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),0x10);
                  auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x3c)),0x20
                                          );
                  auVar143 = vinsertps_avx(auVar143,auVar148,0x30);
                  in_ZMM11 = ZEXT1664(auVar143);
                }
                else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                  pcVar5 = pRVar4[1].ptr_ofs;
                  lVar137 = pRVar4[1].stride * uVar135;
                  in_ZMM8 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar137));
                  in_ZMM11 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x10));
                  auVar265 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x20));
                  in_ZMM13 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x30));
                }
              }
              bVar136 = bVar138 & (byte)uVar18;
              uVar140 = (ulong)(~bVar136 & bVar138);
              auVar158 = vbroadcastss_avx512vl(in_ZMM7._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM23 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar158._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM23._28_4_,
                                            CONCAT424((uint)bVar12 * auVar158._24_4_ |
                                                      (uint)!bVar12 * in_ZMM23._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar158._20_4_ |
                                                                (uint)!bVar11 * in_ZMM23._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar158._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM23._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar158._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM23.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar158._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM23._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar158._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM23._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar158._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM23._0_4_))))))));
              auVar163 = in_ZMM7._0_32_;
              auVar158 = vpermps_avx512vl(auVar149,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM22 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar158._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM22._28_4_,
                                            CONCAT424((uint)bVar12 * auVar158._24_4_ |
                                                      (uint)!bVar12 * in_ZMM22._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar158._20_4_ |
                                                                (uint)!bVar11 * in_ZMM22._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar158._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM22._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar158._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM22.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar158._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM22._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar158._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM22._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar158._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM22._0_4_))))))));
              auVar158 = vpermps_avx512vl(auVar156,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM21 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar158._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM21._28_4_,
                                            CONCAT424((uint)bVar12 * auVar158._24_4_ |
                                                      (uint)!bVar12 * in_ZMM21._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar158._20_4_ |
                                                                (uint)!bVar11 * in_ZMM21._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar158._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM21._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar158._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM21.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar158._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM21._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar158._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM21._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar158._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM21._0_4_))))))));
              auVar158 = vpermps_avx512vl(auVar168,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM28 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar158._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM28._28_4_,
                                            CONCAT424((uint)bVar12 * auVar158._24_4_ |
                                                      (uint)!bVar12 * in_ZMM28._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar158._20_4_ |
                                                                (uint)!bVar11 * in_ZMM28._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar158._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM28._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar158._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM28.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar158._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM28._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar158._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM28._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar158._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM28._0_4_))))))));
              auVar158 = vbroadcastss_avx512vl(in_ZMM10._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM24 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar158._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM24._28_4_,
                                            CONCAT424((uint)bVar12 * auVar158._24_4_ |
                                                      (uint)!bVar12 * in_ZMM24._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar158._20_4_ |
                                                                (uint)!bVar11 * in_ZMM24._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar158._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM24._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar158._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM24.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar158._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM24._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar158._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM24._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar158._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM24._0_4_))))))));
              auVar163 = in_ZMM10._0_32_;
              auVar158 = vpermps_avx512vl(auVar149,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_220._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_220._4_4_;
              local_220._0_4_ =
                   (uint)(bVar136 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar136 & 1) * local_220._0_4_;
              local_220._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_220._8_4_;
              local_220._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_220._12_4_;
              local_220._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_220._16_4_;
              local_220._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_220._20_4_;
              local_220._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_220._24_4_;
              local_220._28_4_ =
                   (uint)(bVar136 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar136 >> 7) * local_220._28_4_;
              auVar158 = vpermps_avx512vl(auVar156,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_240._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_240._4_4_;
              local_240._0_4_ =
                   (uint)(bVar136 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar136 & 1) * local_240._0_4_;
              local_240._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_240._8_4_;
              local_240._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_240._12_4_;
              local_240._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_240._16_4_;
              local_240._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_240._20_4_;
              local_240._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_240._24_4_;
              local_240._28_4_ =
                   (uint)(bVar136 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar136 >> 7) * local_240._28_4_;
              auVar158 = vpermps_avx512vl(auVar168,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM30 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar158._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM30._28_4_,
                                            CONCAT424((uint)bVar12 * auVar158._24_4_ |
                                                      (uint)!bVar12 * in_ZMM30._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar158._20_4_ |
                                                                (uint)!bVar11 * in_ZMM30._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar158._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM30._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar158._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM30.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar158._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM30._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar158._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM30._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar158._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM30._0_4_))))))));
              auVar158 = vbroadcastss_avx512vl(in_ZMM9._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_2a0._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_2a0._4_4_;
              local_2a0._0_4_ =
                   (uint)(bVar136 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar136 & 1) * local_2a0._0_4_;
              local_2a0._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_2a0._8_4_;
              local_2a0._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_2a0._12_4_;
              local_2a0._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_2a0._16_4_;
              local_2a0._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_2a0._20_4_;
              local_2a0._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_2a0._24_4_;
              local_2a0._28_4_ =
                   (uint)(bVar136 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar136 >> 7) * local_2a0._28_4_;
              auVar163 = in_ZMM9._0_32_;
              auVar158 = vpermps_avx512vl(auVar149,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_340._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_340._4_4_;
              local_340._0_4_ =
                   (uint)(bVar136 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar136 & 1) * local_340._0_4_;
              uStack_338._0_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)uStack_338;
              uStack_338._4_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * uStack_338._4_4_;
              uStack_330._0_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)uStack_330;
              uStack_330._4_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * uStack_330._4_4_;
              uStack_328._0_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)uStack_328;
              uStack_328._4_4_ =
                   (uint)(bVar136 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar136 >> 7) * uStack_328._4_4_;
              auVar158 = vpermps_avx512vl(auVar156,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_2e0._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_2e0._4_4_;
              local_2e0._0_4_ =
                   (uint)(bVar136 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar136 & 1) * local_2e0._0_4_;
              local_2e0._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_2e0._8_4_;
              local_2e0._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_2e0._12_4_;
              local_2e0._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_2e0._16_4_;
              local_2e0._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_2e0._20_4_;
              local_2e0._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_2e0._24_4_;
              local_2e0._28_4_ =
                   (uint)(bVar136 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar136 >> 7) * local_2e0._28_4_;
              auVar158 = vpermps_avx512vl(auVar168,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM31 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar158._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM31._28_4_,
                                            CONCAT424((uint)bVar12 * auVar158._24_4_ |
                                                      (uint)!bVar12 * in_ZMM31._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar158._20_4_ |
                                                                (uint)!bVar11 * in_ZMM31._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar158._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM31._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar158._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM31.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar158._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM31._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar158._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM31._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar158._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM31._0_4_))))))));
              auVar158 = vbroadcastss_avx512vl(in_ZMM12._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_2c0._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_2c0._4_4_;
              local_2c0._0_4_ =
                   (uint)(bVar136 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar136 & 1) * local_2c0._0_4_;
              local_2c0._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_2c0._8_4_;
              local_2c0._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_2c0._12_4_;
              local_2c0._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_2c0._16_4_;
              local_2c0._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_2c0._20_4_;
              local_2c0._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_2c0._24_4_;
              local_2c0._28_4_ =
                   (uint)(bVar136 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar136 >> 7) * local_2c0._28_4_;
              auVar163 = in_ZMM12._0_32_;
              auVar158 = vpermps_avx512vl(auVar149,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_300._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_300._4_4_;
              local_300._0_4_ =
                   (uint)(bVar136 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar136 & 1) * local_300._0_4_;
              uStack_2f8._0_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)uStack_2f8;
              uStack_2f8._4_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * uStack_2f8._4_4_;
              uStack_2f0._0_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)uStack_2f0;
              uStack_2f0._4_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * uStack_2f0._4_4_;
              uStack_2e8._0_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)uStack_2e8;
              uStack_2e8._4_4_ =
                   (uint)(bVar136 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar136 >> 7) * uStack_2e8._4_4_;
              auVar158 = vpermps_avx512vl(auVar156,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_320._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_320._4_4_;
              local_320._0_4_ =
                   (uint)(bVar136 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar136 & 1) * local_320._0_4_;
              local_320._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_320._8_4_;
              local_320._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_320._12_4_;
              local_320._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_320._16_4_;
              local_320._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_320._20_4_;
              local_320._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_320._24_4_;
              local_320._28_4_ =
                   (uint)(bVar136 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar136 >> 7) * local_320._28_4_;
              auVar158 = vpermps_avx512vl(auVar168,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              auVar258 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar158._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * auVar258._28_4_,
                                            CONCAT424((uint)bVar12 * auVar158._24_4_ |
                                                      (uint)!bVar12 * auVar258._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar158._20_4_ |
                                                                (uint)!bVar11 * auVar258._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar158._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          auVar258._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar158._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      auVar258.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar158._8_4_ |
                                                                  (uint)!bVar8 * auVar258._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar158._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           auVar258._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar158._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           auVar258._0_4_))))))));
              auVar158 = vbroadcastss_avx512vl(in_ZMM8._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_1a0 = (float)((uint)(bVar136 & 1) * auVar158._0_4_ |
                                 (uint)!(bool)(bVar136 & 1) * (int)local_1a0);
              fStack_19c = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_19c);
              fStack_198 = (float)((uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)fStack_198);
              fStack_194 = (float)((uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * (int)fStack_194);
              fStack_190 = (float)((uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)fStack_190)
              ;
              fStack_18c = (float)((uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * (int)fStack_18c)
              ;
              fStack_188 = (float)((uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)fStack_188)
              ;
              uStack_184 = (uint)(bVar136 >> 7) * auVar158._28_4_ |
                           !(bool)(bVar136 >> 7) * uStack_184;
              auVar163 = in_ZMM8._0_32_;
              auVar158 = vpermps_avx512vl(auVar149,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_180 = (float)((uint)(bVar136 & 1) * auVar158._0_4_ |
                                 (uint)!(bool)(bVar136 & 1) * (int)local_180);
              fStack_17c = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_17c);
              fStack_178 = (float)((uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)fStack_178);
              fStack_174 = (float)((uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * (int)fStack_174);
              fStack_170 = (float)((uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)fStack_170)
              ;
              fStack_16c = (float)((uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * (int)fStack_16c)
              ;
              fStack_168 = (float)((uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)fStack_168)
              ;
              uStack_164 = (uint)(bVar136 >> 7) * auVar158._28_4_ |
                           !(bool)(bVar136 >> 7) * uStack_164;
              auVar158 = vpermps_avx512vl(auVar156,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_160 = (float)((uint)(bVar136 & 1) * auVar158._0_4_ |
                                 (uint)!(bool)(bVar136 & 1) * (int)local_160);
              fStack_15c = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_15c);
              fStack_158 = (float)((uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)fStack_158);
              fStack_154 = (float)((uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * (int)fStack_154);
              fStack_150 = (float)((uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)fStack_150)
              ;
              fStack_14c = (float)((uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * (int)fStack_14c)
              ;
              fStack_148 = (float)((uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)fStack_148)
              ;
              uStack_144 = (uint)(bVar136 >> 7) * auVar158._28_4_ |
                           !(bool)(bVar136 >> 7) * uStack_144;
              auVar158 = vpermps_avx512vl(auVar168,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM25 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar158._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM25._28_4_,
                                            CONCAT424((uint)bVar12 * auVar158._24_4_ |
                                                      (uint)!bVar12 * in_ZMM25._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar158._20_4_ |
                                                                (uint)!bVar11 * in_ZMM25._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar158._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM25._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar158._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM25.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar158._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM25._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar158._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM25._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar158._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM25._0_4_))))))));
              auVar158 = vbroadcastss_avx512vl(in_ZMM11._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_100 = (float)((uint)(bVar136 & 1) * auVar158._0_4_ |
                                 (uint)!(bool)(bVar136 & 1) * (int)local_100);
              fStack_fc = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_fc);
              fStack_f8 = (float)((uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)fStack_f8);
              fStack_f4 = (float)((uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * (int)fStack_f4);
              fStack_f0 = (float)((uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)fStack_f0);
              fStack_ec = (float)((uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * (int)fStack_ec);
              fStack_e8 = (float)((uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)fStack_e8);
              uStack_e4 = (uint)(bVar136 >> 7) * auVar158._28_4_ | !(bool)(bVar136 >> 7) * uStack_e4
              ;
              auVar163 = in_ZMM11._0_32_;
              auVar158 = vpermps_avx512vl(auVar149,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_120 = (float)((uint)(bVar136 & 1) * auVar158._0_4_ |
                                 (uint)!(bool)(bVar136 & 1) * (int)local_120);
              fStack_11c = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_11c);
              fStack_118 = (float)((uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)fStack_118);
              fStack_114 = (float)((uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * (int)fStack_114);
              fStack_110 = (float)((uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)fStack_110)
              ;
              fStack_10c = (float)((uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * (int)fStack_10c)
              ;
              fStack_108 = (float)((uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)fStack_108)
              ;
              uStack_104 = (uint)(bVar136 >> 7) * auVar158._28_4_ |
                           !(bool)(bVar136 >> 7) * uStack_104;
              auVar158 = vpermps_avx512vl(auVar156,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_140 = (float)((uint)(bVar136 & 1) * auVar158._0_4_ |
                                 (uint)!(bool)(bVar136 & 1) * (int)local_140);
              fStack_13c = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_13c);
              fStack_138 = (float)((uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)fStack_138);
              fStack_134 = (float)((uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * (int)fStack_134);
              fStack_130 = (float)((uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)fStack_130)
              ;
              fStack_12c = (float)((uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * (int)fStack_12c)
              ;
              fStack_128 = (float)((uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)fStack_128)
              ;
              uStack_124 = (uint)(bVar136 >> 7) * auVar158._28_4_ |
                           !(bool)(bVar136 >> 7) * uStack_124;
              auVar158 = vpermps_avx512vl(auVar168,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM26 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar158._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM26._28_4_,
                                            CONCAT424((uint)bVar12 * auVar158._24_4_ |
                                                      (uint)!bVar12 * in_ZMM26._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar158._20_4_ |
                                                                (uint)!bVar11 * in_ZMM26._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar158._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM26._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar158._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM26.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar158._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM26._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar158._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM26._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar158._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM26._0_4_))))))));
              auVar158 = vbroadcastss_avx512vl(auVar265._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_a0 = (float)((uint)(bVar136 & 1) * auVar158._0_4_ |
                                (uint)!(bool)(bVar136 & 1) * (int)local_a0);
              fStack_9c = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_9c);
              fStack_98 = (float)((uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)fStack_98);
              fStack_94 = (float)((uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * (int)fStack_94);
              fStack_90 = (float)((uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)fStack_90);
              fStack_8c = (float)((uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * (int)fStack_8c);
              fStack_88 = (float)((uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)fStack_88);
              uStack_84 = (uint)(bVar136 >> 7) * auVar158._28_4_ | !(bool)(bVar136 >> 7) * uStack_84
              ;
              auVar163 = auVar265._0_32_;
              auVar158 = vpermps_avx512vl(auVar149,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_c0 = (float)((uint)(bVar136 & 1) * auVar158._0_4_ |
                                (uint)!(bool)(bVar136 & 1) * (int)local_c0);
              fStack_bc = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_bc);
              fStack_b8 = (float)((uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)fStack_b8);
              fStack_b4 = (float)((uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * (int)fStack_b4);
              fStack_b0 = (float)((uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)fStack_b0);
              fStack_ac = (float)((uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * (int)fStack_ac);
              fStack_a8 = (float)((uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)fStack_a8);
              uStack_a4 = (uint)(bVar136 >> 7) * auVar158._28_4_ | !(bool)(bVar136 >> 7) * uStack_a4
              ;
              auVar158 = vpermps_avx512vl(auVar156,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              local_e0 = (float)((uint)(bVar136 & 1) * auVar158._0_4_ |
                                (uint)!(bool)(bVar136 & 1) * (int)local_e0);
              fStack_dc = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_dc);
              fStack_d8 = (float)((uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)fStack_d8);
              fStack_d4 = (float)((uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * (int)fStack_d4);
              fStack_d0 = (float)((uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)fStack_d0);
              fStack_cc = (float)((uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * (int)fStack_cc);
              fStack_c8 = (float)((uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)fStack_c8);
              uStack_c4 = (uint)(bVar136 >> 7) * auVar158._28_4_ | !(bool)(bVar136 >> 7) * uStack_c4
              ;
              auVar158 = vpermps_avx512vl(auVar168,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM27 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar158._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM27._28_4_,
                                            CONCAT424((uint)bVar12 * auVar158._24_4_ |
                                                      (uint)!bVar12 * in_ZMM27._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar158._20_4_ |
                                                                (uint)!bVar11 * in_ZMM27._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar158._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM27._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar158._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM27.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar158._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM27._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar158._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM27._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar158._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM27._0_4_))))))));
              auVar158 = vbroadcastss_avx512vl(in_ZMM13._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              fStack_25c = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_25c);
              local_260 = (float)((uint)(bVar136 & 1) * auVar158._0_4_ |
                                 (uint)!(bool)(bVar136 & 1) * (int)local_260);
              fStack_258 = (float)((uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)fStack_258);
              fStack_254 = (float)((uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * (int)fStack_254);
              fStack_250 = (float)((uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)fStack_250)
              ;
              fStack_24c = (float)((uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * (int)fStack_24c)
              ;
              fStack_248 = (float)((uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)fStack_248)
              ;
              uStack_244 = (uint)(bVar136 >> 7) * auVar158._28_4_ |
                           !(bool)(bVar136 >> 7) * uStack_244;
              auVar163 = in_ZMM13._0_32_;
              auVar158 = vpermps_avx512vl(auVar149,auVar163);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              fStack_1fc = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_1fc);
              local_200 = (float)((uint)(bVar136 & 1) * auVar158._0_4_ |
                                 (uint)!(bool)(bVar136 & 1) * (int)local_200);
              fStack_1f8 = (float)((uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)fStack_1f8);
              fStack_1f4 = (float)((uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * (int)fStack_1f4);
              fStack_1f0 = (float)((uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)fStack_1f0)
              ;
              fStack_1ec = (float)((uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * (int)fStack_1ec)
              ;
              fStack_1e8 = (float)((uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)fStack_1e8)
              ;
              uStack_1e4 = (uint)(bVar136 >> 7) * auVar158._28_4_ |
                           !(bool)(bVar136 >> 7) * uStack_1e4;
              auVar158 = vpermps_avx512vl(auVar156,auVar163);
              local_1c0._0_4_ =
                   (uint)(bVar136 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar136 & 1) * local_1c0._0_4_;
              bVar7 = (bool)(bVar136 >> 1 & 1);
              local_1c0._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_1c0._4_4_;
              bVar7 = (bool)(bVar136 >> 2 & 1);
              fStack_1b8 = (float)((uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * (int)fStack_1b8);
              bVar7 = (bool)(bVar136 >> 3 & 1);
              fStack_1b4 = (float)((uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * (int)fStack_1b4);
              bVar7 = (bool)(bVar136 >> 4 & 1);
              fStack_1b0 = (float)((uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * (int)fStack_1b0);
              bVar7 = (bool)(bVar136 >> 5 & 1);
              fStack_1ac = (float)((uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * (int)fStack_1ac);
              bVar7 = (bool)(bVar136 >> 6 & 1);
              fStack_1a8 = (float)((uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * (int)fStack_1a8);
              iStack_1a4 = (uint)(bVar136 >> 7) * auVar158._28_4_ |
                           (uint)!(bool)(bVar136 >> 7) * iStack_1a4;
              in_ZMM14 = ZEXT3264(_local_1c0);
              auVar158 = vpermps_avx512vl(auVar168,auVar163);
              auVar154._0_4_ =
                   (uint)(bVar136 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar136 & 1) * in_ZMM29._0_4_;
              bVar7 = (bool)(bVar136 >> 1 & 1);
              auVar154._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM29._4_4_;
              bVar7 = (bool)(bVar136 >> 2 & 1);
              auVar154._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM29._8_4_;
              bVar7 = (bool)(bVar136 >> 3 & 1);
              auVar154._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM29._12_4_;
              bVar7 = (bool)(bVar136 >> 4 & 1);
              auVar154._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM29._16_4_;
              bVar7 = (bool)(bVar136 >> 5 & 1);
              auVar154._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM29._20_4_;
              bVar7 = (bool)(bVar136 >> 6 & 1);
              auVar154._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM29._24_4_;
              auVar154._28_4_ =
                   (uint)(bVar136 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar136 >> 7) * in_ZMM29._28_4_;
              in_ZMM29 = ZEXT3264(auVar154);
            }
            auVar156 = vmulps_avx512vl(in_ZMM29._0_32_,auVar158);
            auVar168 = vmulps_avx512vl(in_ZMM25._0_32_,auVar163);
            auVar165 = vmulps_avx512vl(in_ZMM26._0_32_,auVar167);
            auVar166 = vmulps_avx512vl(in_ZMM27._0_32_,auVar155);
            fVar324 = auVar166._0_4_;
            auVar249._0_4_ = fVar324 + auVar165._0_4_ + auVar168._0_4_ + auVar156._0_4_;
            fVar336 = auVar166._4_4_;
            auVar249._4_4_ = fVar336 + auVar165._4_4_ + auVar168._4_4_ + auVar156._4_4_;
            fVar338 = auVar166._8_4_;
            auVar249._8_4_ = fVar338 + auVar165._8_4_ + auVar168._8_4_ + auVar156._8_4_;
            fVar340 = auVar166._12_4_;
            auVar249._12_4_ = fVar340 + auVar165._12_4_ + auVar168._12_4_ + auVar156._12_4_;
            fVar342 = auVar166._16_4_;
            auVar249._16_4_ = fVar342 + auVar165._16_4_ + auVar168._16_4_ + auVar156._16_4_;
            fVar343 = auVar166._20_4_;
            auVar249._20_4_ = fVar343 + auVar165._20_4_ + auVar168._20_4_ + auVar156._20_4_;
            fVar344 = auVar166._24_4_;
            auVar249._24_4_ = fVar344 + auVar165._24_4_ + auVar168._24_4_ + auVar156._24_4_;
            auVar249._28_4_ = auVar166._28_4_ + auVar165._28_4_ + auVar168._28_4_ + auVar156._28_4_;
            auVar290._8_4_ = 0x80000000;
            auVar290._0_8_ = 0x8000000080000000;
            auVar290._12_4_ = 0x80000000;
            auVar290._16_4_ = 0x80000000;
            auVar290._20_4_ = 0x80000000;
            auVar290._24_4_ = 0x80000000;
            auVar290._28_4_ = 0x80000000;
            uVar135 = CONCAT44(auVar249._4_4_,auVar249._0_4_);
            auVar277._0_8_ = uVar135 ^ 0x8000000080000000;
            auVar277._8_4_ = -auVar249._8_4_;
            auVar277._12_4_ = -auVar249._12_4_;
            auVar277._16_4_ = -auVar249._16_4_;
            auVar277._20_4_ = -auVar249._20_4_;
            auVar277._24_4_ = -auVar249._24_4_;
            auVar277._28_4_ = -auVar249._28_4_;
            uVar135 = vcmpps_avx512vl(auVar249,auVar277,1);
            auVar165._8_4_ = 0x7fffffff;
            auVar165._0_8_ = 0x7fffffff7fffffff;
            auVar165._12_4_ = 0x7fffffff;
            auVar165._16_4_ = 0x7fffffff;
            auVar165._20_4_ = 0x7fffffff;
            auVar165._24_4_ = 0x7fffffff;
            auVar165._28_4_ = 0x7fffffff;
            vandps_avx512vl(auVar249,auVar165);
            auVar157._8_4_ = 0xbb8d3753;
            auVar157._0_8_ = 0xbb8d3753bb8d3753;
            auVar157._12_4_ = 0xbb8d3753;
            auVar157._16_4_ = 0xbb8d3753;
            auVar157._20_4_ = 0xbb8d3753;
            auVar157._24_4_ = 0xbb8d3753;
            auVar157._28_4_ = 0xbb8d3753;
            auVar156 = vmulps_avx512vl(auVar166,auVar157);
            auVar159._8_4_ = 0x3c9df1b8;
            auVar159._0_8_ = 0x3c9df1b83c9df1b8;
            auVar159._12_4_ = 0x3c9df1b8;
            auVar159._16_4_ = 0x3c9df1b8;
            auVar159._20_4_ = 0x3c9df1b8;
            auVar159._24_4_ = 0x3c9df1b8;
            auVar159._28_4_ = 0x3c9df1b8;
            auVar156 = vaddps_avx512vl(auVar156,auVar159);
            auVar86._4_4_ = fVar336 * auVar156._4_4_;
            auVar86._0_4_ = fVar324 * auVar156._0_4_;
            auVar86._8_4_ = fVar338 * auVar156._8_4_;
            auVar86._12_4_ = fVar340 * auVar156._12_4_;
            auVar86._16_4_ = fVar342 * auVar156._16_4_;
            auVar86._20_4_ = fVar343 * auVar156._20_4_;
            auVar86._24_4_ = fVar344 * auVar156._24_4_;
            auVar86._28_4_ = auVar156._28_4_;
            auVar160._8_4_ = 0xbd37e81c;
            auVar160._0_8_ = 0xbd37e81cbd37e81c;
            auVar160._12_4_ = 0xbd37e81c;
            auVar160._16_4_ = 0xbd37e81c;
            auVar160._20_4_ = 0xbd37e81c;
            auVar160._24_4_ = 0xbd37e81c;
            auVar160._28_4_ = 0xbd37e81c;
            auVar156 = vaddps_avx512vl(auVar86,auVar160);
            auVar87._4_4_ = fVar336 * auVar156._4_4_;
            auVar87._0_4_ = fVar324 * auVar156._0_4_;
            auVar87._8_4_ = fVar338 * auVar156._8_4_;
            auVar87._12_4_ = fVar340 * auVar156._12_4_;
            auVar87._16_4_ = fVar342 * auVar156._16_4_;
            auVar87._20_4_ = fVar343 * auVar156._20_4_;
            auVar87._24_4_ = fVar344 * auVar156._24_4_;
            auVar87._28_4_ = auVar156._28_4_;
            auVar162._8_4_ = 0x3db3edac;
            auVar162._0_8_ = 0x3db3edac3db3edac;
            auVar162._12_4_ = 0x3db3edac;
            auVar162._16_4_ = 0x3db3edac;
            auVar162._20_4_ = 0x3db3edac;
            auVar162._24_4_ = 0x3db3edac;
            auVar162._28_4_ = 0x3db3edac;
            auVar156 = vaddps_avx512vl(auVar87,auVar162);
            auVar168 = vmaxps_avx(auVar277,auVar249);
            auVar88._4_4_ = auVar156._4_4_ * fVar336;
            auVar88._0_4_ = auVar156._0_4_ * fVar324;
            auVar88._8_4_ = auVar156._8_4_ * fVar338;
            auVar88._12_4_ = auVar156._12_4_ * fVar340;
            auVar88._16_4_ = auVar156._16_4_ * fVar342;
            auVar88._20_4_ = auVar156._20_4_ * fVar343;
            auVar88._24_4_ = auVar156._24_4_ * fVar344;
            auVar88._28_4_ = auVar249._28_4_;
            auVar150._8_4_ = 0xbe5ba881;
            auVar150._0_8_ = 0xbe5ba881be5ba881;
            auVar150._12_4_ = 0xbe5ba881;
            auVar150._16_4_ = 0xbe5ba881;
            auVar150._20_4_ = 0xbe5ba881;
            auVar150._24_4_ = 0xbe5ba881;
            auVar150._28_4_ = 0xbe5ba881;
            auVar156 = vaddps_avx512vl(auVar88,auVar150);
            auVar278._8_4_ = 0x3f800000;
            auVar278._0_8_ = 0x3f8000003f800000;
            auVar278._12_4_ = 0x3f800000;
            auVar278._16_4_ = 0x3f800000;
            auVar278._20_4_ = 0x3f800000;
            auVar278._24_4_ = 0x3f800000;
            auVar278._28_4_ = 0x3f800000;
            uVar140 = vcmpps_avx512vl(auVar166,auVar278,6);
            auVar89._4_4_ = fVar336 * auVar156._4_4_;
            auVar89._0_4_ = fVar324 * auVar156._0_4_;
            auVar89._8_4_ = fVar338 * auVar156._8_4_;
            auVar89._12_4_ = fVar340 * auVar156._12_4_;
            auVar89._16_4_ = fVar342 * auVar156._16_4_;
            auVar89._20_4_ = fVar343 * auVar156._20_4_;
            auVar89._24_4_ = fVar344 * auVar156._24_4_;
            auVar89._28_4_ = auVar156._28_4_;
            auVar164._8_4_ = 0x3fc90fd1;
            auVar164._0_8_ = 0x3fc90fd13fc90fd1;
            auVar164._12_4_ = 0x3fc90fd1;
            auVar164._16_4_ = 0x3fc90fd1;
            auVar164._20_4_ = 0x3fc90fd1;
            auVar164._24_4_ = 0x3fc90fd1;
            auVar164._28_4_ = 0x3fc90fd1;
            auVar165 = vaddps_avx512vl(auVar89,auVar164);
            auVar156 = vsubps_avx(auVar278,auVar166);
            auVar156 = vsqrtps_avx(auVar156);
            auVar90._4_4_ = auVar156._4_4_ * auVar165._4_4_;
            auVar90._0_4_ = auVar156._0_4_ * auVar165._0_4_;
            auVar90._8_4_ = auVar156._8_4_ * auVar165._8_4_;
            auVar90._12_4_ = auVar156._12_4_ * auVar165._12_4_;
            auVar90._16_4_ = auVar156._16_4_ * auVar165._16_4_;
            auVar90._20_4_ = auVar156._20_4_ * auVar165._20_4_;
            auVar90._24_4_ = auVar156._24_4_ * auVar165._24_4_;
            auVar90._28_4_ = auVar156._28_4_;
            uVar17 = vcmpps_avx512vl(auVar168,ZEXT832(0) << 0x20,1);
            auVar297._8_4_ = 0x3fc90fdb;
            auVar297._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar297._12_4_ = 0x3fc90fdb;
            auVar297._16_4_ = 0x3fc90fdb;
            auVar297._20_4_ = 0x3fc90fdb;
            auVar297._24_4_ = 0x3fc90fdb;
            auVar297._28_4_ = 0x3fc90fdb;
            auVar156 = vsubps_avx(auVar297,auVar90);
            auVar156 = vmaxps_avx(ZEXT832(0) << 0x20,auVar156);
            auVar165 = vxorps_avx512vl(auVar156,auVar290);
            bVar7 = (bool)((byte)uVar17 & 1);
            auVar201._0_4_ = (uint)bVar7 * auVar165._0_4_ | (uint)!bVar7 * auVar156._0_4_;
            bVar7 = (bool)((byte)(uVar17 >> 1) & 1);
            auVar201._4_4_ = (uint)bVar7 * auVar165._4_4_ | (uint)!bVar7 * auVar156._4_4_;
            bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
            auVar201._8_4_ = (uint)bVar7 * auVar165._8_4_ | (uint)!bVar7 * auVar156._8_4_;
            bVar7 = (bool)((byte)(uVar17 >> 3) & 1);
            auVar201._12_4_ = (uint)bVar7 * auVar165._12_4_ | (uint)!bVar7 * auVar156._12_4_;
            bVar7 = (bool)((byte)(uVar17 >> 4) & 1);
            auVar201._16_4_ = (uint)bVar7 * auVar165._16_4_ | (uint)!bVar7 * auVar156._16_4_;
            bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
            auVar201._20_4_ = (uint)bVar7 * auVar165._20_4_ | (uint)!bVar7 * auVar156._20_4_;
            bVar7 = (bool)((byte)(uVar17 >> 6) & 1);
            auVar201._24_4_ = (uint)bVar7 * auVar165._24_4_ | (uint)!bVar7 * auVar156._24_4_;
            bVar7 = SUB81(uVar17 >> 7,0);
            auVar201._28_4_ = (uint)bVar7 * auVar165._28_4_ | (uint)!bVar7 * auVar156._28_4_;
            auVar156 = vsubps_avx(auVar297,auVar201);
            auVar165 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
            bVar7 = (bool)((byte)uVar140 & 1);
            bVar8 = (bool)((byte)(uVar140 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar140 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar140 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar140 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar140 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar140 >> 6) & 1);
            bVar14 = SUB81(uVar140 >> 7,0);
            auVar91._4_4_ =
                 fVar234 * (float)((uint)bVar8 * auVar165._4_4_ | (uint)!bVar8 * auVar156._4_4_);
            auVar91._0_4_ =
                 fVar226 * (float)((uint)bVar7 * auVar165._0_4_ | (uint)!bVar7 * auVar156._0_4_);
            auVar91._8_4_ =
                 fVar235 * (float)((uint)bVar9 * auVar165._8_4_ | (uint)!bVar9 * auVar156._8_4_);
            auVar91._12_4_ =
                 fVar236 * (float)((uint)bVar10 * auVar165._12_4_ | (uint)!bVar10 * auVar156._12_4_)
            ;
            auVar91._16_4_ =
                 fVar237 * (float)((uint)bVar11 * auVar165._16_4_ | (uint)!bVar11 * auVar156._16_4_)
            ;
            auVar91._20_4_ =
                 fVar238 * (float)((uint)bVar12 * auVar165._20_4_ | (uint)!bVar12 * auVar156._20_4_)
            ;
            auVar91._24_4_ =
                 fVar239 * (float)((uint)bVar13 * auVar165._24_4_ | (uint)!bVar13 * auVar156._24_4_)
            ;
            auVar91._28_4_ = (uint)bVar14 * auVar165._28_4_ | (uint)!bVar14 * auVar156._28_4_;
            auVar180._8_4_ = 0x3f22f983;
            auVar180._0_8_ = 0x3f22f9833f22f983;
            auVar180._12_4_ = 0x3f22f983;
            auVar180._16_4_ = 0x3f22f983;
            auVar180._20_4_ = 0x3f22f983;
            auVar180._24_4_ = 0x3f22f983;
            auVar180._28_4_ = 0x3f22f983;
            auVar156 = vmulps_avx512vl(auVar91,auVar180);
            auVar156 = vroundps_avx(auVar156,1);
            auVar92._4_4_ = auVar156._4_4_ * 1.5707964;
            auVar92._0_4_ = auVar156._0_4_ * 1.5707964;
            auVar92._8_4_ = auVar156._8_4_ * 1.5707964;
            auVar92._12_4_ = auVar156._12_4_ * 1.5707964;
            auVar92._16_4_ = auVar156._16_4_ * 1.5707964;
            auVar92._20_4_ = auVar156._20_4_ * 1.5707964;
            auVar92._24_4_ = auVar156._24_4_ * 1.5707964;
            auVar92._28_4_ = 0x3fc90fdb;
            auVar165 = vsubps_avx(auVar91,auVar92);
            auVar156 = vcvtps2dq_avx(auVar156);
            auVar166 = vpslld_avx2(auVar156,0x1f);
            uVar141 = vpmovd2m_avx512vl(auVar166);
            uVar19 = vptestnmd_avx512vl(auVar156,auVar149);
            auVar176._8_4_ = 3;
            auVar176._0_8_ = 0x300000003;
            auVar176._12_4_ = 3;
            auVar176._16_4_ = 3;
            auVar176._20_4_ = 3;
            auVar176._24_4_ = 3;
            auVar176._28_4_ = 3;
            auVar156 = vpandd_avx512vl(auVar156,auVar176);
            uVar140 = vpcmpgtd_avx512vl(auVar156,auVar149);
            auVar149 = vpcmpeqd_avx2(auVar149,auVar149);
            auVar149 = vpaddd_avx2(auVar156,auVar149);
            auVar177._8_4_ = 2;
            auVar177._0_8_ = 0x200000002;
            auVar177._12_4_ = 2;
            auVar177._16_4_ = 2;
            auVar177._20_4_ = 2;
            auVar177._24_4_ = 2;
            auVar177._28_4_ = 2;
            uVar17 = vpcmpud_avx512vl(auVar149,auVar177,1);
            fVar324 = auVar165._0_4_;
            fVar259 = fVar324 * fVar324;
            fVar336 = auVar165._4_4_;
            fVar266 = fVar336 * fVar336;
            auVar93._4_4_ = fVar266;
            auVar93._0_4_ = fVar259;
            fVar338 = auVar165._8_4_;
            fVar267 = fVar338 * fVar338;
            auVar93._8_4_ = fVar267;
            fVar340 = auVar165._12_4_;
            fVar268 = fVar340 * fVar340;
            auVar93._12_4_ = fVar268;
            fVar342 = auVar165._16_4_;
            fVar269 = fVar342 * fVar342;
            auVar93._16_4_ = fVar269;
            fVar343 = auVar165._20_4_;
            fVar270 = fVar343 * fVar343;
            auVar93._20_4_ = fVar270;
            fVar344 = auVar165._24_4_;
            fVar271 = fVar344 * fVar344;
            auVar93._24_4_ = fVar271;
            auVar93._28_4_ = auVar149._28_4_;
            auVar178._8_4_ = 0xb2d70013;
            auVar178._0_8_ = 0xb2d70013b2d70013;
            auVar178._12_4_ = 0xb2d70013;
            auVar178._16_4_ = 0xb2d70013;
            auVar178._20_4_ = 0xb2d70013;
            auVar178._24_4_ = 0xb2d70013;
            auVar178._28_4_ = 0xb2d70013;
            auVar156 = vmulps_avx512vl(auVar93,auVar178);
            auVar179._8_4_ = 0x363938a8;
            auVar179._0_8_ = 0x363938a8363938a8;
            auVar179._12_4_ = 0x363938a8;
            auVar179._16_4_ = 0x363938a8;
            auVar179._20_4_ = 0x363938a8;
            auVar179._24_4_ = 0x363938a8;
            auVar179._28_4_ = 0x363938a8;
            auVar156 = vaddps_avx512vl(auVar156,auVar179);
            auVar181._8_4_ = 0xb48b634d;
            auVar181._0_8_ = 0xb48b634db48b634d;
            auVar181._12_4_ = 0xb48b634d;
            auVar181._16_4_ = 0xb48b634d;
            auVar181._20_4_ = 0xb48b634d;
            auVar181._24_4_ = 0xb48b634d;
            auVar181._28_4_ = 0xb48b634d;
            auVar166 = vmulps_avx512vl(auVar93,auVar181);
            auVar182._8_4_ = 0x37cfab9c;
            auVar182._0_8_ = 0x37cfab9c37cfab9c;
            auVar182._12_4_ = 0x37cfab9c;
            auVar182._16_4_ = 0x37cfab9c;
            auVar182._20_4_ = 0x37cfab9c;
            auVar182._24_4_ = 0x37cfab9c;
            auVar182._28_4_ = 0x37cfab9c;
            auVar166 = vaddps_avx512vl(auVar166,auVar182);
            auVar94._4_4_ = auVar156._4_4_ * fVar266;
            auVar94._0_4_ = auVar156._0_4_ * fVar259;
            auVar94._8_4_ = auVar156._8_4_ * fVar267;
            auVar94._12_4_ = auVar156._12_4_ * fVar268;
            auVar94._16_4_ = auVar156._16_4_ * fVar269;
            auVar94._20_4_ = auVar156._20_4_ * fVar270;
            auVar94._24_4_ = auVar156._24_4_ * fVar271;
            auVar94._28_4_ = auVar156._28_4_;
            auVar183._8_4_ = 0xb9501096;
            auVar183._0_8_ = 0xb9501096b9501096;
            auVar183._12_4_ = 0xb9501096;
            auVar183._16_4_ = 0xb9501096;
            auVar183._20_4_ = 0xb9501096;
            auVar183._24_4_ = 0xb9501096;
            auVar183._28_4_ = 0xb9501096;
            auVar156 = vaddps_avx512vl(auVar94,auVar183);
            auVar95._4_4_ = auVar166._4_4_ * fVar266;
            auVar95._0_4_ = auVar166._0_4_ * fVar259;
            auVar95._8_4_ = auVar166._8_4_ * fVar267;
            auVar95._12_4_ = auVar166._12_4_ * fVar268;
            auVar95._16_4_ = auVar166._16_4_ * fVar269;
            auVar95._20_4_ = auVar166._20_4_ * fVar270;
            auVar95._24_4_ = auVar166._24_4_ * fVar271;
            auVar95._28_4_ = auVar166._28_4_;
            auVar38._8_4_ = 0xbab60981;
            auVar38._0_8_ = 0xbab60981bab60981;
            auVar38._12_4_ = 0xbab60981;
            auVar38._16_4_ = 0xbab60981;
            auVar38._20_4_ = 0xbab60981;
            auVar38._24_4_ = 0xbab60981;
            auVar38._28_4_ = 0xbab60981;
            auVar166 = vaddps_avx512vl(auVar95,auVar38);
            auVar96._4_4_ = auVar156._4_4_ * fVar266;
            auVar96._0_4_ = auVar156._0_4_ * fVar259;
            auVar96._8_4_ = auVar156._8_4_ * fVar267;
            auVar96._12_4_ = auVar156._12_4_ * fVar268;
            auVar96._16_4_ = auVar156._16_4_ * fVar269;
            auVar96._20_4_ = auVar156._20_4_ * fVar270;
            auVar96._24_4_ = auVar156._24_4_ * fVar271;
            auVar96._28_4_ = auVar156._28_4_;
            auVar39._8_4_ = 0x3c088898;
            auVar39._0_8_ = 0x3c0888983c088898;
            auVar39._12_4_ = 0x3c088898;
            auVar39._16_4_ = 0x3c088898;
            auVar39._20_4_ = 0x3c088898;
            auVar39._24_4_ = 0x3c088898;
            auVar39._28_4_ = 0x3c088898;
            auVar156 = vaddps_avx512vl(auVar96,auVar39);
            auVar97._4_4_ = auVar166._4_4_ * fVar266;
            auVar97._0_4_ = auVar166._0_4_ * fVar259;
            auVar97._8_4_ = auVar166._8_4_ * fVar267;
            auVar97._12_4_ = auVar166._12_4_ * fVar268;
            auVar97._16_4_ = auVar166._16_4_ * fVar269;
            auVar97._20_4_ = auVar166._20_4_ * fVar270;
            auVar97._24_4_ = auVar166._24_4_ * fVar271;
            auVar97._28_4_ = auVar166._28_4_;
            auVar40._8_4_ = 0x3d2aaaa4;
            auVar40._0_8_ = 0x3d2aaaa43d2aaaa4;
            auVar40._12_4_ = 0x3d2aaaa4;
            auVar40._16_4_ = 0x3d2aaaa4;
            auVar40._20_4_ = 0x3d2aaaa4;
            auVar40._24_4_ = 0x3d2aaaa4;
            auVar40._28_4_ = 0x3d2aaaa4;
            auVar166 = vaddps_avx512vl(auVar97,auVar40);
            auVar98._4_4_ = auVar156._4_4_ * fVar266;
            auVar98._0_4_ = auVar156._0_4_ * fVar259;
            auVar98._8_4_ = auVar156._8_4_ * fVar267;
            auVar98._12_4_ = auVar156._12_4_ * fVar268;
            auVar98._16_4_ = auVar156._16_4_ * fVar269;
            auVar98._20_4_ = auVar156._20_4_ * fVar270;
            auVar98._24_4_ = auVar156._24_4_ * fVar271;
            auVar98._28_4_ = auVar156._28_4_;
            auVar41._8_4_ = 0xbe2aaaab;
            auVar41._0_8_ = 0xbe2aaaabbe2aaaab;
            auVar41._12_4_ = 0xbe2aaaab;
            auVar41._16_4_ = 0xbe2aaaab;
            auVar41._20_4_ = 0xbe2aaaab;
            auVar41._24_4_ = 0xbe2aaaab;
            auVar41._28_4_ = 0xbe2aaaab;
            auVar156 = vaddps_avx512vl(auVar98,auVar41);
            fVar323 = in_ZMM10._28_4_ + -0.5;
            fVar304 = (auVar156._0_4_ * fVar259 + 1.0) * fVar324;
            fVar317 = (auVar156._4_4_ * fVar266 + 1.0) * fVar336;
            auVar99._4_4_ = fVar317;
            auVar99._0_4_ = fVar304;
            fVar318 = (auVar156._8_4_ * fVar267 + 1.0) * fVar338;
            auVar99._8_4_ = fVar318;
            fVar319 = (auVar156._12_4_ * fVar268 + 1.0) * fVar340;
            auVar99._12_4_ = fVar319;
            fVar320 = (auVar156._16_4_ * fVar269 + 1.0) * fVar342;
            auVar99._16_4_ = fVar320;
            fVar321 = (auVar156._20_4_ * fVar270 + 1.0) * fVar343;
            auVar99._20_4_ = fVar321;
            fVar322 = (auVar156._24_4_ * fVar271 + 1.0) * fVar344;
            auVar99._24_4_ = fVar322;
            auVar99._28_4_ = fVar323;
            auVar263._0_4_ = (auVar166._0_4_ * fVar259 + -0.5) * fVar259 + 1.0;
            auVar263._4_4_ = (auVar166._4_4_ * fVar266 + -0.5) * fVar266 + 1.0;
            auVar263._8_4_ = (auVar166._8_4_ * fVar267 + -0.5) * fVar267 + 1.0;
            auVar263._12_4_ = (auVar166._12_4_ * fVar268 + -0.5) * fVar268 + 1.0;
            auVar263._16_4_ = (auVar166._16_4_ * fVar269 + -0.5) * fVar269 + 1.0;
            auVar263._20_4_ = (auVar166._20_4_ * fVar270 + -0.5) * fVar270 + 1.0;
            auVar263._24_4_ = (auVar166._24_4_ * fVar271 + -0.5) * fVar271 + 1.0;
            auVar263._28_4_ = auVar149._28_4_ + 1.0;
            auVar149 = vblendmps_avx512vl(auVar99,auVar263);
            bVar7 = (bool)((byte)uVar141 & 1);
            uVar142 = (uint)bVar7 * auVar149._0_4_ | (uint)!bVar7 * (int)fVar324;
            bVar7 = (bool)((byte)(uVar141 >> 1) & 1);
            uVar208 = (uint)bVar7 * auVar149._4_4_ | (uint)!bVar7 * (int)fVar336;
            bVar7 = (bool)((byte)(uVar141 >> 2) & 1);
            uVar209 = (uint)bVar7 * auVar149._8_4_ | (uint)!bVar7 * (int)fVar338;
            bVar7 = (bool)((byte)(uVar141 >> 3) & 1);
            uVar210 = (uint)bVar7 * auVar149._12_4_ | (uint)!bVar7 * (int)fVar340;
            bVar7 = (bool)((byte)(uVar141 >> 4) & 1);
            uVar211 = (uint)bVar7 * auVar149._16_4_ | (uint)!bVar7 * (int)fVar342;
            bVar7 = (bool)((byte)(uVar141 >> 5) & 1);
            uVar215 = (uint)bVar7 * auVar149._20_4_ | (uint)!bVar7 * (int)fVar343;
            bVar7 = (bool)((byte)(uVar141 >> 6) & 1);
            uVar220 = (uint)bVar7 * auVar149._24_4_ | (uint)!bVar7 * (int)fVar344;
            bVar7 = (bool)((byte)(uVar141 >> 7) & 1);
            uVar224 = (uint)bVar7 * auVar149._28_4_ | (uint)!bVar7 * auVar165._28_4_;
            bVar7 = (bool)((byte)uVar19 & 1);
            auVar202._0_4_ = (uint)bVar7 * (int)auVar263._0_4_ | (uint)!bVar7 * (int)fVar304;
            bVar7 = (bool)((byte)(uVar19 >> 1) & 1);
            auVar202._4_4_ = (uint)bVar7 * (int)auVar263._4_4_ | (uint)!bVar7 * (int)fVar317;
            bVar7 = (bool)((byte)(uVar19 >> 2) & 1);
            auVar202._8_4_ = (uint)bVar7 * (int)auVar263._8_4_ | (uint)!bVar7 * (int)fVar318;
            bVar7 = (bool)((byte)(uVar19 >> 3) & 1);
            auVar202._12_4_ = (uint)bVar7 * (int)auVar263._12_4_ | (uint)!bVar7 * (int)fVar319;
            bVar7 = (bool)((byte)(uVar19 >> 4) & 1);
            auVar202._16_4_ = (uint)bVar7 * (int)auVar263._16_4_ | (uint)!bVar7 * (int)fVar320;
            bVar7 = (bool)((byte)(uVar19 >> 5) & 1);
            auVar202._20_4_ = (uint)bVar7 * (int)auVar263._20_4_ | (uint)!bVar7 * (int)fVar321;
            bVar7 = (bool)((byte)(uVar19 >> 6) & 1);
            auVar202._24_4_ = (uint)bVar7 * (int)auVar263._24_4_ | (uint)!bVar7 * (int)fVar322;
            bVar7 = SUB81(uVar19 >> 7,0);
            auVar202._28_4_ = (uint)bVar7 * (int)auVar263._28_4_ | (uint)!bVar7 * (int)fVar323;
            auVar149 = vxorps_avx512vl(in_ZMM29._0_32_,auVar290);
            bVar138 = (byte)uVar135;
            auVar203._0_4_ =
                 (uint)(bVar138 & 1) * auVar149._0_4_ | (uint)!(bool)(bVar138 & 1) * in_ZMM29._0_4_;
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            auVar203._4_4_ = (uint)bVar7 * auVar149._4_4_ | (uint)!bVar7 * in_ZMM29._4_4_;
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            auVar203._8_4_ = (uint)bVar7 * auVar149._8_4_ | (uint)!bVar7 * in_ZMM29._8_4_;
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            auVar203._12_4_ = (uint)bVar7 * auVar149._12_4_ | (uint)!bVar7 * in_ZMM29._12_4_;
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            auVar203._16_4_ = (uint)bVar7 * auVar149._16_4_ | (uint)!bVar7 * in_ZMM29._16_4_;
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            auVar203._20_4_ = (uint)bVar7 * auVar149._20_4_ | (uint)!bVar7 * in_ZMM29._20_4_;
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            auVar203._24_4_ = (uint)bVar7 * auVar149._24_4_ | (uint)!bVar7 * in_ZMM29._24_4_;
            bVar7 = SUB81(uVar135 >> 7,0);
            auVar203._28_4_ = (uint)bVar7 * auVar149._28_4_ | (uint)!bVar7 * in_ZMM29._28_4_;
            auVar149 = vxorps_avx512vl(in_ZMM25._0_32_,auVar290);
            auVar204._0_4_ =
                 (uint)(bVar138 & 1) * auVar149._0_4_ | (uint)!(bool)(bVar138 & 1) * in_ZMM25._0_4_;
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            auVar204._4_4_ = (uint)bVar7 * auVar149._4_4_ | (uint)!bVar7 * in_ZMM25._4_4_;
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            auVar204._8_4_ = (uint)bVar7 * auVar149._8_4_ | (uint)!bVar7 * in_ZMM25._8_4_;
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            auVar204._12_4_ = (uint)bVar7 * auVar149._12_4_ | (uint)!bVar7 * in_ZMM25._12_4_;
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            auVar204._16_4_ = (uint)bVar7 * auVar149._16_4_ | (uint)!bVar7 * in_ZMM25._16_4_;
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            auVar204._20_4_ = (uint)bVar7 * auVar149._20_4_ | (uint)!bVar7 * in_ZMM25._20_4_;
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            auVar204._24_4_ = (uint)bVar7 * auVar149._24_4_ | (uint)!bVar7 * in_ZMM25._24_4_;
            bVar7 = SUB81(uVar135 >> 7,0);
            auVar204._28_4_ = (uint)bVar7 * auVar149._28_4_ | (uint)!bVar7 * in_ZMM25._28_4_;
            auVar149 = vfmsub213ps_avx512vl(auVar158,auVar168,auVar203);
            auVar156 = vfmsub213ps_avx512vl(auVar163,auVar168,auVar204);
            fVar324 = auVar149._0_4_;
            fVar343 = auVar149._4_4_;
            fVar268 = auVar149._8_4_;
            fVar317 = auVar149._12_4_;
            fVar322 = auVar149._16_4_;
            fVar217 = auVar149._20_4_;
            fVar223 = auVar149._24_4_;
            fVar336 = auVar156._0_4_;
            fVar344 = auVar156._4_4_;
            fVar269 = auVar156._8_4_;
            fVar318 = auVar156._12_4_;
            fVar323 = auVar156._16_4_;
            fVar218 = auVar156._20_4_;
            fVar225 = auVar156._24_4_;
            auVar165 = vxorps_avx512vl(in_ZMM26._0_32_,auVar290);
            auVar205._0_4_ =
                 (uint)(bVar138 & 1) * auVar165._0_4_ | (uint)!(bool)(bVar138 & 1) * in_ZMM26._0_4_;
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            auVar205._4_4_ = (uint)bVar7 * auVar165._4_4_ | (uint)!bVar7 * in_ZMM26._4_4_;
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            auVar205._8_4_ = (uint)bVar7 * auVar165._8_4_ | (uint)!bVar7 * in_ZMM26._8_4_;
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            auVar205._12_4_ = (uint)bVar7 * auVar165._12_4_ | (uint)!bVar7 * in_ZMM26._12_4_;
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            auVar205._16_4_ = (uint)bVar7 * auVar165._16_4_ | (uint)!bVar7 * in_ZMM26._16_4_;
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            auVar205._20_4_ = (uint)bVar7 * auVar165._20_4_ | (uint)!bVar7 * in_ZMM26._20_4_;
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            auVar205._24_4_ = (uint)bVar7 * auVar165._24_4_ | (uint)!bVar7 * in_ZMM26._24_4_;
            bVar7 = SUB81(uVar135 >> 7,0);
            auVar205._28_4_ = (uint)bVar7 * auVar165._28_4_ | (uint)!bVar7 * in_ZMM26._28_4_;
            auVar165 = vfmsub213ps_avx512vl(auVar167,auVar168,auVar205);
            fVar338 = auVar165._0_4_;
            fVar259 = auVar165._4_4_;
            fVar270 = auVar165._8_4_;
            fVar319 = auVar165._12_4_;
            fVar213 = auVar165._16_4_;
            fVar219 = auVar165._20_4_;
            fVar15 = auVar165._24_4_;
            auVar165 = vxorps_avx512vl(in_ZMM27._0_32_,auVar290);
            auVar206._0_4_ =
                 (uint)(bVar138 & 1) * auVar165._0_4_ | (uint)!(bool)(bVar138 & 1) * in_ZMM27._0_4_;
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            auVar206._4_4_ = (uint)bVar7 * auVar165._4_4_ | (uint)!bVar7 * in_ZMM27._4_4_;
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            auVar206._8_4_ = (uint)bVar7 * auVar165._8_4_ | (uint)!bVar7 * in_ZMM27._8_4_;
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            auVar206._12_4_ = (uint)bVar7 * auVar165._12_4_ | (uint)!bVar7 * in_ZMM27._12_4_;
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            auVar206._16_4_ = (uint)bVar7 * auVar165._16_4_ | (uint)!bVar7 * in_ZMM27._16_4_;
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            auVar206._20_4_ = (uint)bVar7 * auVar165._20_4_ | (uint)!bVar7 * in_ZMM27._20_4_;
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            auVar206._24_4_ = (uint)bVar7 * auVar165._24_4_ | (uint)!bVar7 * in_ZMM27._24_4_;
            bVar7 = SUB81(uVar135 >> 7,0);
            auVar206._28_4_ = (uint)bVar7 * auVar165._28_4_ | (uint)!bVar7 * in_ZMM27._28_4_;
            auVar165 = vfmsub213ps_avx512vl(auVar155,auVar168,auVar206);
            fVar340 = auVar165._0_4_;
            fVar266 = auVar165._4_4_;
            fVar271 = auVar165._8_4_;
            fVar320 = auVar165._12_4_;
            fVar214 = auVar165._16_4_;
            fVar222 = auVar165._20_4_;
            fVar16 = auVar165._24_4_;
            auVar333._0_4_ =
                 fVar340 * fVar340 + fVar338 * fVar338 + fVar324 * fVar324 + fVar336 * fVar336;
            auVar333._4_4_ =
                 fVar266 * fVar266 + fVar259 * fVar259 + fVar343 * fVar343 + fVar344 * fVar344;
            auVar333._8_4_ =
                 fVar271 * fVar271 + fVar270 * fVar270 + fVar268 * fVar268 + fVar269 * fVar269;
            auVar333._12_4_ =
                 fVar320 * fVar320 + fVar319 * fVar319 + fVar317 * fVar317 + fVar318 * fVar318;
            auVar333._16_4_ =
                 fVar214 * fVar214 + fVar213 * fVar213 + fVar322 * fVar322 + fVar323 * fVar323;
            auVar333._20_4_ =
                 fVar222 * fVar222 + fVar219 * fVar219 + fVar217 * fVar217 + fVar218 * fVar218;
            auVar333._24_4_ =
                 fVar16 * fVar16 + fVar15 * fVar15 + fVar223 * fVar223 + fVar225 * fVar225;
            auVar333._28_4_ = in_ZMM14._28_4_ + in_ZMM13._28_4_ + in_ZMM11._28_4_ + in_ZMM12._28_4_;
            auVar165 = vrsqrt14ps_avx512vl(auVar333);
            fVar342 = auVar165._0_4_;
            fVar267 = auVar165._4_4_;
            fVar304 = auVar165._8_4_;
            fVar321 = auVar165._12_4_;
            fVar212 = auVar165._16_4_;
            fVar216 = auVar165._20_4_;
            fVar221 = auVar165._24_4_;
            auVar100._4_4_ = auVar333._4_4_ * -0.5 * fVar267 * fVar267 * fVar267;
            auVar100._0_4_ = auVar333._0_4_ * -0.5 * fVar342 * fVar342 * fVar342;
            auVar100._8_4_ = auVar333._8_4_ * -0.5 * fVar304 * fVar304 * fVar304;
            auVar100._12_4_ = auVar333._12_4_ * -0.5 * fVar321 * fVar321 * fVar321;
            auVar100._16_4_ = auVar333._16_4_ * -0.5 * fVar212 * fVar212 * fVar212;
            auVar100._20_4_ = auVar333._20_4_ * -0.5 * fVar216 * fVar216 * fVar216;
            auVar100._24_4_ = auVar333._24_4_ * -0.5 * fVar221 * fVar221 * fVar221;
            auVar100._28_4_ = auVar333._28_4_;
            auVar358._8_4_ = 0x3fc00000;
            auVar358._0_8_ = 0x3fc000003fc00000;
            auVar358._12_4_ = 0x3fc00000;
            auVar358._16_4_ = 0x3fc00000;
            auVar358._20_4_ = 0x3fc00000;
            auVar358._24_4_ = 0x3fc00000;
            auVar358._28_4_ = 0x3fc00000;
            auVar143 = vfmadd231ps_fma(auVar100,auVar358,auVar165);
            fVar325 = auVar143._0_4_;
            fVar337 = auVar143._4_4_;
            fVar339 = auVar143._8_4_;
            fVar341 = auVar143._12_4_;
            auVar166 = vxorps_avx512vl(auVar202,auVar290);
            bVar7 = (bool)((byte)uVar17 & 1);
            auVar207._0_4_ = (uint)bVar7 * auVar166._0_4_ | !bVar7 * auVar202._0_4_;
            bVar7 = (bool)((byte)(uVar17 >> 1) & 1);
            auVar207._4_4_ = (uint)bVar7 * auVar166._4_4_ | !bVar7 * auVar202._4_4_;
            bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
            auVar207._8_4_ = (uint)bVar7 * auVar166._8_4_ | !bVar7 * auVar202._8_4_;
            bVar7 = (bool)((byte)(uVar17 >> 3) & 1);
            auVar207._12_4_ = (uint)bVar7 * auVar166._12_4_ | !bVar7 * auVar202._12_4_;
            bVar7 = (bool)((byte)(uVar17 >> 4) & 1);
            auVar207._16_4_ = (uint)bVar7 * auVar166._16_4_ | !bVar7 * auVar202._16_4_;
            bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
            auVar207._20_4_ = (uint)bVar7 * auVar166._20_4_ | !bVar7 * auVar202._20_4_;
            bVar7 = (bool)((byte)(uVar17 >> 6) & 1);
            auVar207._24_4_ = (uint)bVar7 * auVar166._24_4_ | !bVar7 * auVar202._24_4_;
            bVar7 = SUB81(uVar17 >> 7,0);
            auVar207._28_4_ = (uint)bVar7 * auVar166._28_4_ | !bVar7 * auVar202._28_4_;
            bVar7 = (bool)((byte)uVar140 & 1);
            fVar342 = (float)(bVar7 * uVar142 | (uint)!bVar7 * (uVar142 ^ 0x80000000));
            bVar7 = (bool)((byte)(uVar140 >> 1) & 1);
            fVar267 = (float)(bVar7 * uVar208 | (uint)!bVar7 * (uVar208 ^ 0x80000000));
            bVar7 = (bool)((byte)(uVar140 >> 2) & 1);
            fVar304 = (float)(bVar7 * uVar209 | (uint)!bVar7 * (uVar209 ^ 0x80000000));
            bVar7 = (bool)((byte)(uVar140 >> 3) & 1);
            fVar321 = (float)(bVar7 * uVar210 | (uint)!bVar7 * (uVar210 ^ 0x80000000));
            bVar7 = (bool)((byte)(uVar140 >> 4) & 1);
            fVar212 = (float)(bVar7 * uVar211 | (uint)!bVar7 * (uVar211 ^ 0x80000000));
            bVar7 = (bool)((byte)(uVar140 >> 5) & 1);
            fVar216 = (float)(bVar7 * uVar215 | (uint)!bVar7 * (uVar215 ^ 0x80000000));
            bVar7 = (bool)((byte)(uVar140 >> 6) & 1);
            fVar221 = (float)(bVar7 * uVar220 | (uint)!bVar7 * (uVar220 ^ 0x80000000));
            bVar7 = SUB81(uVar140 >> 7,0);
            auVar101._4_4_ = fVar267 * fVar337 * fVar343;
            auVar101._0_4_ = fVar342 * fVar325 * fVar324;
            auVar101._8_4_ = fVar304 * fVar339 * fVar268;
            auVar101._12_4_ = fVar321 * fVar341 * fVar317;
            auVar101._16_4_ = fVar212 * fVar322 * 0.0;
            auVar101._20_4_ = fVar216 * fVar217 * 0.0;
            auVar101._24_4_ = fVar221 * fVar223 * 0.0;
            auVar101._28_4_ = auVar149._28_4_;
            auVar102._4_4_ = fVar344 * fVar337 * fVar267;
            auVar102._0_4_ = fVar336 * fVar325 * fVar342;
            auVar102._8_4_ = fVar269 * fVar339 * fVar304;
            auVar102._12_4_ = fVar318 * fVar341 * fVar321;
            auVar102._16_4_ = fVar323 * 0.0 * fVar212;
            auVar102._20_4_ = fVar218 * 0.0 * fVar216;
            auVar102._24_4_ = fVar225 * 0.0 * fVar221;
            auVar102._28_4_ = 0x80000000;
            auVar103._4_4_ = fVar259 * fVar337 * fVar267;
            auVar103._0_4_ = fVar338 * fVar325 * fVar342;
            auVar103._8_4_ = fVar270 * fVar339 * fVar304;
            auVar103._12_4_ = fVar319 * fVar341 * fVar321;
            auVar103._16_4_ = fVar213 * 0.0 * fVar212;
            auVar103._20_4_ = fVar219 * 0.0 * fVar216;
            auVar103._24_4_ = fVar15 * 0.0 * fVar221;
            auVar103._28_4_ = uVar224;
            auVar104._4_4_ = fVar266 * fVar337 * fVar267;
            auVar104._0_4_ = fVar340 * fVar325 * fVar342;
            auVar104._8_4_ = fVar271 * fVar339 * fVar304;
            auVar104._12_4_ = fVar320 * fVar341 * fVar321;
            auVar104._16_4_ = fVar214 * 0.0 * fVar212;
            auVar104._20_4_ = fVar222 * 0.0 * fVar216;
            auVar104._24_4_ = fVar16 * 0.0 * fVar221;
            auVar104._28_4_ = auVar156._28_4_;
            auVar148 = vfmadd231ps_fma(auVar101,auVar207,auVar158);
            auVar149 = vfmadd231ps_avx512vl(auVar102,auVar207,auVar163);
            auVar156 = vfmadd231ps_avx512vl(auVar103,auVar207,auVar167);
            auVar166 = vfmadd231ps_avx512vl(auVar104,auVar155,auVar207);
            auVar153 = vsubps_avx512vl(auVar203,auVar158);
            auVar143 = vfmadd213ps_fma(auVar153,auVar161,auVar158);
            auVar158 = vsubps_avx512vl(auVar204,auVar163);
            auVar158 = vfmadd213ps_avx512vl(auVar158,auVar161,auVar163);
            auVar163 = vsubps_avx512vl(auVar205,auVar167);
            auVar163 = vfmadd213ps_avx512vl(auVar163,auVar161,auVar167);
            auVar167 = vsubps_avx512vl(auVar206,auVar155);
            auVar153 = vfmadd213ps_avx512vl(auVar167,auVar161,auVar155);
            fVar259 = auVar165._28_4_;
            auVar354._0_4_ =
                 auVar153._0_4_ * auVar153._0_4_ +
                 auVar163._0_4_ * auVar163._0_4_ +
                 auVar143._0_4_ * auVar143._0_4_ + auVar158._0_4_ * auVar158._0_4_;
            auVar354._4_4_ =
                 auVar153._4_4_ * auVar153._4_4_ +
                 auVar163._4_4_ * auVar163._4_4_ +
                 auVar143._4_4_ * auVar143._4_4_ + auVar158._4_4_ * auVar158._4_4_;
            auVar354._8_4_ =
                 auVar153._8_4_ * auVar153._8_4_ +
                 auVar163._8_4_ * auVar163._8_4_ +
                 auVar143._8_4_ * auVar143._8_4_ + auVar158._8_4_ * auVar158._8_4_;
            auVar354._12_4_ =
                 auVar153._12_4_ * auVar153._12_4_ +
                 auVar163._12_4_ * auVar163._12_4_ +
                 auVar143._12_4_ * auVar143._12_4_ + auVar158._12_4_ * auVar158._12_4_;
            auVar354._16_4_ =
                 auVar153._16_4_ * auVar153._16_4_ +
                 auVar163._16_4_ * auVar163._16_4_ + auVar158._16_4_ * auVar158._16_4_ + 0.0;
            auVar354._20_4_ =
                 auVar153._20_4_ * auVar153._20_4_ +
                 auVar163._20_4_ * auVar163._20_4_ + auVar158._20_4_ * auVar158._20_4_ + 0.0;
            auVar354._24_4_ =
                 auVar153._24_4_ * auVar153._24_4_ +
                 auVar163._24_4_ * auVar163._24_4_ + auVar158._24_4_ * auVar158._24_4_ + 0.0;
            auVar354._28_4_ =
                 fVar259 + fVar259 + (float)(bVar7 * uVar224 | (uint)!bVar7 * (uVar224 ^ 0x80000000)
                                            ) + fVar259;
            auVar165 = vrsqrt14ps_avx512vl(auVar354);
            fVar324 = auVar165._0_4_;
            fVar336 = auVar165._4_4_;
            fVar338 = auVar165._8_4_;
            fVar340 = auVar165._12_4_;
            fVar342 = auVar165._16_4_;
            fVar343 = auVar165._20_4_;
            fVar344 = auVar165._24_4_;
            auVar155._4_4_ = auVar354._4_4_ * -0.5 * fVar336 * fVar336 * fVar336;
            auVar155._0_4_ = auVar354._0_4_ * -0.5 * fVar324 * fVar324 * fVar324;
            auVar155._8_4_ = auVar354._8_4_ * -0.5 * fVar338 * fVar338 * fVar338;
            auVar155._12_4_ = auVar354._12_4_ * -0.5 * fVar340 * fVar340 * fVar340;
            auVar155._16_4_ = auVar354._16_4_ * -0.5 * fVar342 * fVar342 * fVar342;
            auVar155._20_4_ = auVar354._20_4_ * -0.5 * fVar343 * fVar343 * fVar343;
            auVar155._24_4_ = auVar354._24_4_ * -0.5 * fVar344 * fVar344 * fVar344;
            auVar155._28_4_ = 0xbf000000;
            auVar144 = vfmadd231ps_fma(auVar155,auVar165,auVar358);
            auVar167._8_4_ = 0x3f7fdf3b;
            auVar167._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar167._12_4_ = 0x3f7fdf3b;
            auVar167._16_4_ = 0x3f7fdf3b;
            auVar167._20_4_ = 0x3f7fdf3b;
            auVar167._24_4_ = 0x3f7fdf3b;
            auVar167._28_4_ = 0x3f7fdf3b;
            uVar135 = vcmpps_avx512vl(auVar168,auVar167,6);
            auVar167 = vmulps_avx512vl(ZEXT1632(auVar143),ZEXT1632(auVar144));
            bVar138 = (byte)uVar135;
            fVar343 = (float)((uint)(bVar138 & 1) * auVar167._0_4_ |
                             (uint)!(bool)(bVar138 & 1) * auVar148._0_4_);
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            fVar268 = (float)((uint)bVar7 * auVar167._4_4_ | (uint)!bVar7 * auVar148._4_4_);
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            fVar304 = (float)((uint)bVar7 * auVar167._8_4_ | (uint)!bVar7 * auVar148._8_4_);
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            fVar320 = (float)((uint)bVar7 * auVar167._12_4_ | (uint)!bVar7 * auVar148._12_4_);
            fVar340 = (float)((uint)((byte)(uVar135 >> 4) & 1) * auVar167._16_4_);
            fVar324 = (float)((uint)((byte)(uVar135 >> 5) & 1) * auVar167._20_4_);
            fVar338 = (float)((uint)((byte)(uVar135 >> 6) & 1) * auVar167._24_4_);
            fVar336 = (float)((uint)(byte)(uVar135 >> 7) * auVar167._28_4_);
            auVar158 = vmulps_avx512vl(auVar158,ZEXT1632(auVar144));
            fVar344 = (float)((uint)(bVar138 & 1) * auVar158._0_4_ |
                             (uint)!(bool)(bVar138 & 1) * auVar149._0_4_);
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            fVar269 = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * auVar149._4_4_);
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            fVar317 = (float)((uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * auVar149._8_4_);
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            fVar321 = (float)((uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * auVar149._12_4_);
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            fVar213 = (float)((uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * auVar149._16_4_);
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            fVar217 = (float)((uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * auVar149._20_4_);
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            fVar222 = (float)((uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * auVar149._24_4_);
            auVar149 = vmulps_avx512vl(auVar163,ZEXT1632(auVar144));
            fVar266 = (float)((uint)(bVar138 & 1) * auVar149._0_4_ |
                             (uint)!(bool)(bVar138 & 1) * auVar156._0_4_);
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            fVar270 = (float)((uint)bVar7 * auVar149._4_4_ | (uint)!bVar7 * auVar156._4_4_);
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            fVar318 = (float)((uint)bVar7 * auVar149._8_4_ | (uint)!bVar7 * auVar156._8_4_);
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            fVar322 = (float)((uint)bVar7 * auVar149._12_4_ | (uint)!bVar7 * auVar156._12_4_);
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            fVar214 = (float)((uint)bVar7 * auVar149._16_4_ | (uint)!bVar7 * auVar156._16_4_);
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            fVar218 = (float)((uint)bVar7 * auVar149._20_4_ | (uint)!bVar7 * auVar156._20_4_);
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            fVar216 = (float)((uint)bVar7 * auVar149._24_4_ | (uint)!bVar7 * auVar156._24_4_);
            bVar7 = SUB81(uVar135 >> 7,0);
            fVar225 = (float)((uint)bVar7 * auVar149._28_4_ | (uint)!bVar7 * auVar156._28_4_);
            auVar149 = vmulps_avx512vl(auVar153,ZEXT1632(auVar144));
            fVar267 = (float)((uint)(bVar138 & 1) * auVar149._0_4_ |
                             (uint)!(bool)(bVar138 & 1) * auVar166._0_4_);
            bVar7 = (bool)((byte)(uVar135 >> 1) & 1);
            fVar271 = (float)((uint)bVar7 * auVar149._4_4_ | (uint)!bVar7 * auVar166._4_4_);
            bVar7 = (bool)((byte)(uVar135 >> 2) & 1);
            fVar319 = (float)((uint)bVar7 * auVar149._8_4_ | (uint)!bVar7 * auVar166._8_4_);
            bVar7 = (bool)((byte)(uVar135 >> 3) & 1);
            fVar323 = (float)((uint)bVar7 * auVar149._12_4_ | (uint)!bVar7 * auVar166._12_4_);
            bVar7 = (bool)((byte)(uVar135 >> 4) & 1);
            fVar212 = (float)((uint)bVar7 * auVar149._16_4_ | (uint)!bVar7 * auVar166._16_4_);
            bVar7 = (bool)((byte)(uVar135 >> 5) & 1);
            fVar219 = (float)((uint)bVar7 * auVar149._20_4_ | (uint)!bVar7 * auVar166._20_4_);
            bVar7 = (bool)((byte)(uVar135 >> 6) & 1);
            fVar223 = (float)((uint)bVar7 * auVar149._24_4_ | (uint)!bVar7 * auVar166._24_4_);
            auVar149 = vsubps_avx(auVar278,auVar161);
            auVar105._4_4_ = fVar234 * fStack_19c;
            auVar105._0_4_ = fVar226 * local_1a0;
            auVar105._8_4_ = fVar235 * fStack_198;
            auVar105._12_4_ = fVar236 * fStack_194;
            auVar105._16_4_ = fVar237 * fStack_190;
            auVar105._20_4_ = fVar238 * fStack_18c;
            auVar105._24_4_ = fVar239 * fStack_188;
            auVar105._28_4_ = 0x3f800000;
            auVar167 = vfmadd213ps_avx512vl(in_ZMM23._0_32_,auVar149,auVar105);
            auVar106._4_4_ = fVar234 * fStack_17c;
            auVar106._0_4_ = fVar226 * local_180;
            auVar106._8_4_ = fVar235 * fStack_178;
            auVar106._12_4_ = fVar236 * fStack_174;
            auVar106._16_4_ = fVar237 * fStack_170;
            auVar106._20_4_ = fVar238 * fStack_16c;
            auVar106._24_4_ = fVar239 * fStack_168;
            auVar106._28_4_ = 0x3f800000;
            auVar155 = vfmadd213ps_avx512vl(in_ZMM22._0_32_,auVar149,auVar106);
            auVar107._4_4_ = fVar234 * fStack_15c;
            auVar107._0_4_ = fVar226 * local_160;
            auVar107._8_4_ = fVar235 * fStack_158;
            auVar107._12_4_ = fVar236 * fStack_154;
            auVar107._16_4_ = fVar237 * fStack_150;
            auVar107._20_4_ = fVar238 * fStack_14c;
            auVar107._24_4_ = fVar239 * fStack_148;
            auVar107._28_4_ = 0x3f800000;
            auVar166 = vfmadd213ps_avx512vl(in_ZMM21._0_32_,auVar149,auVar107);
            auVar108._4_4_ = fVar234 * fStack_fc;
            auVar108._0_4_ = fVar226 * local_100;
            auVar108._8_4_ = fVar235 * fStack_f8;
            auVar108._12_4_ = fVar236 * fStack_f4;
            auVar108._16_4_ = fVar237 * fStack_f0;
            auVar108._20_4_ = fVar238 * fStack_ec;
            auVar108._24_4_ = fVar239 * fStack_e8;
            auVar108._28_4_ = 0x3f800000;
            auVar109._4_4_ = fVar234 * fStack_11c;
            auVar109._0_4_ = fVar226 * local_120;
            auVar109._8_4_ = fVar235 * fStack_118;
            auVar109._12_4_ = fVar236 * fStack_114;
            auVar109._16_4_ = fVar237 * fStack_110;
            auVar109._20_4_ = fVar238 * fStack_10c;
            fVar342 = auVar168._28_4_;
            auVar109._24_4_ = fVar239 * fStack_108;
            auVar109._28_4_ = fVar342;
            auVar303._0_4_ = fVar226 * local_140;
            auVar303._4_4_ = fVar234 * fStack_13c;
            auVar303._8_4_ = fVar235 * fStack_138;
            auVar303._12_4_ = fVar236 * fStack_134;
            auVar303._16_4_ = fVar237 * fStack_130;
            auVar303._20_4_ = fVar238 * fStack_12c;
            auVar303._24_4_ = fVar239 * fStack_128;
            auVar303._28_4_ = 0;
            auVar168 = vfmadd213ps_avx512vl(in_ZMM24._0_32_,auVar149,auVar108);
            auVar154 = vfmadd213ps_avx512vl(local_220,auVar149,auVar109);
            auVar157 = vfmadd213ps_avx512vl(local_240,auVar149,auVar303);
            auVar110._4_4_ = fVar234 * fStack_9c;
            auVar110._0_4_ = fVar226 * local_a0;
            auVar110._8_4_ = fVar235 * fStack_98;
            auVar110._12_4_ = fVar236 * fStack_94;
            auVar110._16_4_ = fVar237 * fStack_90;
            auVar110._20_4_ = fVar238 * fStack_8c;
            auVar110._24_4_ = fVar239 * fStack_88;
            auVar110._28_4_ = 0x3f800000;
            auVar111._4_4_ = fVar234 * fStack_bc;
            auVar111._0_4_ = fVar226 * local_c0;
            auVar111._8_4_ = fVar235 * fStack_b8;
            auVar111._12_4_ = fVar236 * fStack_b4;
            auVar111._16_4_ = fVar237 * fStack_b0;
            auVar111._20_4_ = fVar238 * fStack_ac;
            auVar111._24_4_ = fVar239 * fStack_a8;
            auVar111._28_4_ = fVar342;
            auVar112._4_4_ = fVar234 * fStack_dc;
            auVar112._0_4_ = fVar226 * local_e0;
            auVar112._8_4_ = fVar235 * fStack_d8;
            auVar112._12_4_ = fVar236 * fStack_d4;
            auVar112._16_4_ = fVar237 * fStack_d0;
            auVar112._20_4_ = fVar238 * fStack_cc;
            auVar112._24_4_ = fVar239 * fStack_c8;
            auVar112._28_4_ = 0;
            auVar159 = vfmadd213ps_avx512vl(local_2a0,auVar149,auVar110);
            auVar160 = vfmadd213ps_avx512vl(_local_340,auVar149,auVar111);
            auVar162 = vfmadd213ps_avx512vl(local_2e0,auVar149,auVar112);
            auVar113._4_4_ = fVar234 * fStack_25c;
            auVar113._0_4_ = fVar226 * local_260;
            auVar113._8_4_ = fVar235 * fStack_258;
            auVar113._12_4_ = fVar236 * fStack_254;
            auVar113._16_4_ = fVar237 * fStack_250;
            auVar113._20_4_ = fVar238 * fStack_24c;
            auVar113._24_4_ = fVar239 * fStack_248;
            auVar113._28_4_ = 0x3f800000;
            auVar114._4_4_ = fVar234 * fStack_1fc;
            auVar114._0_4_ = fVar226 * local_200;
            auVar114._8_4_ = fVar235 * fStack_1f8;
            auVar114._12_4_ = fVar236 * fStack_1f4;
            auVar114._16_4_ = fVar237 * fStack_1f0;
            auVar114._20_4_ = fVar238 * fStack_1ec;
            auVar114._24_4_ = fVar239 * fStack_1e8;
            auVar114._28_4_ = fVar342;
            auVar133._4_4_ = fVar234 * (float)local_1c0._4_4_;
            auVar133._0_4_ = fVar226 * (float)local_1c0._0_4_;
            auVar133._8_4_ = fVar235 * fStack_1b8;
            auVar133._12_4_ = fVar236 * fStack_1b4;
            auVar133._16_4_ = fVar237 * fStack_1b0;
            auVar133._20_4_ = fVar238 * fStack_1ac;
            auVar133._24_4_ = fVar239 * fStack_1a8;
            auVar133._28_4_ = auVar161._28_4_;
            auVar150 = vfmadd213ps_avx512vl(local_2c0,auVar149,auVar113);
            auVar164 = vfmadd213ps_avx512vl(_local_300,auVar149,auVar114);
            auVar180 = vfmadd213ps_avx512vl(local_320,auVar149,auVar133);
            auVar115._4_4_ = fVar268 * fVar268;
            auVar115._0_4_ = fVar343 * fVar343;
            auVar115._8_4_ = fVar304 * fVar304;
            auVar115._12_4_ = fVar320 * fVar320;
            auVar115._16_4_ = fVar340 * fVar340;
            auVar115._20_4_ = fVar324 * fVar324;
            auVar115._24_4_ = fVar338 * fVar338;
            auVar115._28_4_ = 0x3f800000;
            auVar116._4_4_ = fVar269 * fVar269;
            auVar116._0_4_ = fVar344 * fVar344;
            auVar116._8_4_ = fVar317 * fVar317;
            auVar116._12_4_ = fVar321 * fVar321;
            auVar116._16_4_ = fVar213 * fVar213;
            auVar116._20_4_ = fVar217 * fVar217;
            auVar116._24_4_ = fVar222 * fVar222;
            auVar116._28_4_ = fVar342;
            auVar232._0_4_ = fVar343 * fVar343 + fVar344 * fVar344;
            auVar232._4_4_ = fVar268 * fVar268 + fVar269 * fVar269;
            auVar232._8_4_ = fVar304 * fVar304 + fVar317 * fVar317;
            auVar232._12_4_ = fVar320 * fVar320 + fVar321 * fVar321;
            auVar232._16_4_ = fVar340 * fVar340 + fVar213 * fVar213;
            auVar232._20_4_ = fVar324 * fVar324 + fVar217 * fVar217;
            auVar232._24_4_ = fVar338 * fVar338 + fVar222 * fVar222;
            auVar232._28_4_ = fVar342 + 1.0;
            auVar117._4_4_ = fVar270 * fVar270;
            auVar117._0_4_ = fVar266 * fVar266;
            auVar117._8_4_ = fVar318 * fVar318;
            auVar117._12_4_ = fVar322 * fVar322;
            auVar117._16_4_ = fVar214 * fVar214;
            auVar117._20_4_ = fVar218 * fVar218;
            auVar117._24_4_ = fVar216 * fVar216;
            auVar117._28_4_ = 0;
            auVar149 = vsubps_avx(auVar232,auVar117);
            auVar118._4_4_ = fVar271 * fVar271;
            auVar118._0_4_ = fVar267 * fVar267;
            auVar118._8_4_ = fVar319 * fVar319;
            auVar118._12_4_ = fVar323 * fVar323;
            auVar118._16_4_ = fVar212 * fVar212;
            auVar118._20_4_ = fVar219 * fVar219;
            auVar118._24_4_ = fVar223 * fVar223;
            auVar118._28_4_ = auVar163._28_4_;
            auVar149 = vsubps_avx(auVar149,auVar118);
            auVar314._0_4_ = fVar344 * fVar266;
            auVar314._4_4_ = fVar269 * fVar270;
            auVar314._8_4_ = fVar317 * fVar318;
            auVar314._12_4_ = fVar321 * fVar322;
            auVar314._16_4_ = fVar213 * fVar214;
            auVar314._20_4_ = fVar217 * fVar218;
            auVar314._24_4_ = fVar222 * fVar216;
            auVar314._28_4_ = 0;
            auVar119._4_4_ = fVar271 * fVar268;
            auVar119._0_4_ = fVar267 * fVar343;
            auVar119._8_4_ = fVar319 * fVar304;
            auVar119._12_4_ = fVar323 * fVar320;
            auVar119._16_4_ = fVar212 * fVar340;
            auVar119._20_4_ = fVar219 * fVar324;
            auVar119._24_4_ = fVar223 * fVar338;
            auVar119._28_4_ = auVar153._28_4_;
            fVar226 = auVar314._0_4_ + fVar267 * fVar343;
            fVar234 = auVar314._4_4_ + fVar271 * fVar268;
            fVar235 = auVar314._8_4_ + fVar319 * fVar304;
            fVar236 = auVar314._12_4_ + fVar323 * fVar320;
            fVar237 = auVar314._16_4_ + fVar212 * fVar340;
            fVar238 = auVar314._20_4_ + fVar219 * fVar324;
            fVar239 = auVar314._24_4_ + fVar223 * fVar338;
            fVar342 = auVar153._28_4_ + 0.0;
            auVar233._0_4_ = fVar226 + fVar226;
            auVar233._4_4_ = fVar234 + fVar234;
            auVar233._8_4_ = fVar235 + fVar235;
            auVar233._12_4_ = fVar236 + fVar236;
            auVar233._16_4_ = fVar237 + fVar237;
            auVar233._20_4_ = fVar238 + fVar238;
            auVar233._24_4_ = fVar239 + fVar239;
            auVar233._28_4_ = fVar342 + fVar342;
            auVar120._4_4_ = fVar271 * fVar269;
            auVar120._0_4_ = fVar267 * fVar344;
            auVar120._8_4_ = fVar319 * fVar317;
            auVar120._12_4_ = fVar323 * fVar321;
            auVar120._16_4_ = fVar212 * fVar213;
            auVar120._20_4_ = fVar219 * fVar217;
            auVar120._24_4_ = fVar223 * fVar222;
            auVar120._28_4_ = auVar165._28_4_;
            auVar121._4_4_ = fVar268 * fVar270;
            auVar121._0_4_ = fVar343 * fVar266;
            auVar121._8_4_ = fVar304 * fVar318;
            auVar121._12_4_ = fVar320 * fVar322;
            auVar121._16_4_ = fVar340 * fVar214;
            auVar121._20_4_ = fVar324 * fVar218;
            auVar121._24_4_ = fVar338 * fVar216;
            auVar121._28_4_ = fVar259;
            auVar156 = vsubps_avx(auVar120,auVar121);
            auVar359._0_4_ = auVar156._0_4_ + auVar156._0_4_;
            auVar359._4_4_ = auVar156._4_4_ + auVar156._4_4_;
            auVar359._8_4_ = auVar156._8_4_ + auVar156._8_4_;
            auVar359._12_4_ = auVar156._12_4_ + auVar156._12_4_;
            auVar359._16_4_ = auVar156._16_4_ + auVar156._16_4_;
            auVar359._20_4_ = auVar156._20_4_ + auVar156._20_4_;
            auVar359._24_4_ = auVar156._24_4_ + auVar156._24_4_;
            auVar359._28_4_ = auVar156._28_4_ + auVar156._28_4_;
            auVar156 = vsubps_avx(auVar314,auVar119);
            auVar350._0_4_ = auVar156._0_4_ + auVar156._0_4_;
            auVar350._4_4_ = auVar156._4_4_ + auVar156._4_4_;
            auVar350._8_4_ = auVar156._8_4_ + auVar156._8_4_;
            auVar350._12_4_ = auVar156._12_4_ + auVar156._12_4_;
            auVar350._16_4_ = auVar156._16_4_ + auVar156._16_4_;
            auVar350._20_4_ = auVar156._20_4_ + auVar156._20_4_;
            auVar350._24_4_ = auVar156._24_4_ + auVar156._24_4_;
            auVar350._28_4_ = auVar156._28_4_ + auVar156._28_4_;
            auVar156 = vsubps_avx(auVar115,auVar116);
            auVar285._0_4_ = fVar266 * fVar266 + auVar156._0_4_;
            auVar285._4_4_ = fVar270 * fVar270 + auVar156._4_4_;
            auVar285._8_4_ = fVar318 * fVar318 + auVar156._8_4_;
            auVar285._12_4_ = fVar322 * fVar322 + auVar156._12_4_;
            auVar285._16_4_ = fVar214 * fVar214 + auVar156._16_4_;
            auVar285._20_4_ = fVar218 * fVar218 + auVar156._20_4_;
            auVar285._24_4_ = fVar216 * fVar216 + auVar156._24_4_;
            fVar226 = auVar156._28_4_;
            auVar285._28_4_ = fVar226 + 0.0;
            auVar158 = vsubps_avx(auVar285,auVar118);
            auVar122._4_4_ = fVar271 * fVar270;
            auVar122._0_4_ = fVar267 * fVar266;
            auVar122._8_4_ = fVar319 * fVar318;
            auVar122._12_4_ = fVar323 * fVar322;
            auVar122._16_4_ = fVar212 * fVar214;
            auVar122._20_4_ = fVar219 * fVar218;
            auVar122._24_4_ = fVar223 * fVar216;
            auVar122._28_4_ = fVar225;
            auVar123._4_4_ = fVar268 * fVar269;
            auVar123._0_4_ = fVar343 * fVar344;
            auVar123._8_4_ = fVar304 * fVar317;
            auVar123._12_4_ = fVar320 * fVar321;
            auVar123._16_4_ = fVar340 * fVar213;
            auVar123._20_4_ = fVar324 * fVar217;
            auVar123._24_4_ = fVar338 * fVar222;
            auVar123._28_4_ = fVar336;
            fVar234 = fVar267 * fVar266 + fVar343 * fVar344;
            fVar235 = fVar271 * fVar270 + fVar268 * fVar269;
            fVar236 = fVar319 * fVar318 + fVar304 * fVar317;
            fVar237 = fVar323 * fVar322 + fVar320 * fVar321;
            fVar238 = fVar212 * fVar214 + fVar340 * fVar213;
            fVar239 = fVar219 * fVar218 + fVar324 * fVar217;
            fVar342 = fVar223 * fVar216 + fVar338 * fVar222;
            fVar336 = fVar225 + fVar336;
            auVar291._0_4_ = fVar234 + fVar234;
            auVar291._4_4_ = fVar235 + fVar235;
            auVar291._8_4_ = fVar236 + fVar236;
            auVar291._12_4_ = fVar237 + fVar237;
            auVar291._16_4_ = fVar238 + fVar238;
            auVar291._20_4_ = fVar239 + fVar239;
            auVar291._24_4_ = fVar342 + fVar342;
            auVar291._28_4_ = fVar336 + fVar336;
            fVar234 = fVar267 * fVar344 + fVar343 * fVar266;
            fVar235 = fVar271 * fVar269 + fVar268 * fVar270;
            fVar236 = fVar319 * fVar317 + fVar304 * fVar318;
            fVar237 = fVar323 * fVar321 + fVar320 * fVar322;
            fVar238 = fVar212 * fVar213 + fVar340 * fVar214;
            fVar239 = fVar219 * fVar217 + fVar324 * fVar218;
            fVar324 = fVar223 * fVar222 + fVar338 * fVar216;
            fVar259 = auVar165._28_4_ + fVar259;
            auVar298._0_4_ = fVar234 + fVar234;
            auVar298._4_4_ = fVar235 + fVar235;
            auVar298._8_4_ = fVar236 + fVar236;
            auVar298._12_4_ = fVar237 + fVar237;
            auVar298._16_4_ = fVar238 + fVar238;
            auVar298._20_4_ = fVar239 + fVar239;
            auVar298._24_4_ = fVar324 + fVar324;
            auVar298._28_4_ = fVar259 + fVar259;
            auVar161 = vsubps_avx(auVar122,auVar123);
            auVar315._0_4_ = auVar161._0_4_ + auVar161._0_4_;
            auVar315._4_4_ = auVar161._4_4_ + auVar161._4_4_;
            auVar315._8_4_ = auVar161._8_4_ + auVar161._8_4_;
            auVar315._12_4_ = auVar161._12_4_ + auVar161._12_4_;
            auVar315._16_4_ = auVar161._16_4_ + auVar161._16_4_;
            auVar315._20_4_ = auVar161._20_4_ + auVar161._20_4_;
            auVar315._24_4_ = auVar161._24_4_ + auVar161._24_4_;
            auVar315._28_4_ = auVar161._28_4_ + auVar161._28_4_;
            auVar156 = vsubps_avx(auVar156,auVar117);
            auVar264._0_4_ = fVar267 * fVar267 + auVar156._0_4_;
            auVar264._4_4_ = fVar271 * fVar271 + auVar156._4_4_;
            auVar264._8_4_ = fVar319 * fVar319 + auVar156._8_4_;
            auVar264._12_4_ = fVar323 * fVar323 + auVar156._12_4_;
            auVar264._16_4_ = fVar212 * fVar212 + auVar156._16_4_;
            auVar264._20_4_ = fVar219 * fVar219 + auVar156._20_4_;
            auVar264._24_4_ = fVar223 * fVar223 + auVar156._24_4_;
            auVar264._28_4_ = auVar163._28_4_ + auVar156._28_4_;
            auVar156 = ZEXT832(0) << 0x20;
            auVar124._4_4_ = auVar359._4_4_ * 0.0;
            auVar124._0_4_ = auVar359._0_4_ * 0.0;
            auVar124._8_4_ = auVar359._8_4_ * 0.0;
            auVar124._12_4_ = auVar359._12_4_ * 0.0;
            auVar124._16_4_ = auVar359._16_4_ * 0.0;
            auVar124._20_4_ = auVar359._20_4_ * 0.0;
            auVar124._24_4_ = auVar359._24_4_ * 0.0;
            auVar124._28_4_ = fVar226;
            auVar143 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar233,auVar124);
            auVar279._0_4_ = auVar233._0_4_ + auVar359._0_4_ * 0.0;
            auVar279._4_4_ = auVar233._4_4_ + auVar359._4_4_ * 0.0;
            auVar279._8_4_ = auVar233._8_4_ + auVar359._8_4_ * 0.0;
            auVar279._12_4_ = auVar233._12_4_ + auVar359._12_4_ * 0.0;
            auVar279._16_4_ = auVar233._16_4_ + auVar359._16_4_ * 0.0;
            auVar279._20_4_ = auVar233._20_4_ + auVar359._20_4_ * 0.0;
            auVar279._24_4_ = auVar233._24_4_ + auVar359._24_4_ * 0.0;
            auVar279._28_4_ = auVar233._28_4_ + fVar226;
            auVar148 = vfmadd213ps_fma(auVar233,auVar156,auVar359);
            auVar145 = vfmadd231ps_fma(auVar279,auVar149,auVar156);
            auVar146 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar156,auVar149);
            auVar161 = ZEXT832(0) << 0x20;
            auVar125._4_4_ = auVar291._4_4_ * 0.0;
            auVar125._0_4_ = auVar291._0_4_ * 0.0;
            auVar125._8_4_ = auVar291._8_4_ * 0.0;
            auVar125._12_4_ = auVar291._12_4_ * 0.0;
            auVar125._16_4_ = auVar291._16_4_ * 0.0;
            auVar125._20_4_ = auVar291._20_4_ * 0.0;
            auVar125._24_4_ = auVar291._24_4_ * 0.0;
            auVar125._28_4_ = fVar225;
            auVar148 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar158,auVar125);
            auVar334._0_4_ = auVar158._0_4_ + auVar291._0_4_ * 0.0;
            auVar334._4_4_ = auVar158._4_4_ + auVar291._4_4_ * 0.0;
            auVar334._8_4_ = auVar158._8_4_ + auVar291._8_4_ * 0.0;
            auVar334._12_4_ = auVar158._12_4_ + auVar291._12_4_ * 0.0;
            auVar334._16_4_ = auVar158._16_4_ + auVar291._16_4_ * 0.0;
            auVar334._20_4_ = auVar158._20_4_ + auVar291._20_4_ * 0.0;
            auVar334._24_4_ = auVar158._24_4_ + auVar291._24_4_ * 0.0;
            auVar334._28_4_ = auVar158._28_4_ + fVar225;
            auVar144 = vfmadd213ps_fma(auVar158,auVar161,auVar291);
            auVar360._0_4_ = auVar350._0_4_ + auVar148._0_4_;
            auVar360._4_4_ = auVar350._4_4_ + auVar148._4_4_;
            auVar360._8_4_ = auVar350._8_4_ + auVar148._8_4_;
            auVar360._12_4_ = auVar350._12_4_ + auVar148._12_4_;
            auVar360._16_4_ = auVar350._16_4_ + 0.0;
            auVar360._20_4_ = auVar350._20_4_ + 0.0;
            auVar360._24_4_ = auVar350._24_4_ + 0.0;
            auVar360._28_4_ = auVar350._28_4_ + 0.0;
            auVar147 = vfmadd231ps_fma(auVar334,auVar350,auVar161);
            auVar292 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar161,auVar350);
            auVar126._4_4_ = auVar264._4_4_ * 0.0;
            auVar126._0_4_ = auVar264._0_4_ * 0.0;
            auVar126._8_4_ = auVar264._8_4_ * 0.0;
            auVar126._12_4_ = auVar264._12_4_ * 0.0;
            auVar126._16_4_ = auVar264._16_4_ * 0.0;
            auVar126._20_4_ = auVar264._20_4_ * 0.0;
            auVar126._24_4_ = auVar264._24_4_ * 0.0;
            auVar126._28_4_ = auVar291._28_4_;
            auVar148 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar315,auVar126);
            auVar156 = vaddps_avx512vl(auVar315,auVar126);
            auVar144 = vfmadd213ps_fma(auVar315,auVar161,auVar264);
            auVar158 = vaddps_avx512vl(auVar298,ZEXT1632(auVar148));
            auVar156 = vfmadd231ps_avx512vl(auVar156,auVar298,auVar161);
            auVar293 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar161,auVar298);
            auVar176 = ZEXT832(0) << 0x20;
            auVar161 = vaddps_avx512vl(auVar155,auVar176);
            auVar163 = vaddps_avx512vl(auVar166,auVar176);
            auVar166 = vaddps_avx512vl(auVar157,auVar176);
            auVar155 = vmulps_avx512vl(auVar158,auVar176);
            auVar165 = vmulps_avx512vl(auVar156,auVar176);
            auVar153 = vmulps_avx512vl(ZEXT1632(auVar293),auVar176);
            auVar148 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar360,auVar155);
            auVar144 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar147),auVar165);
            auVar157 = vfmadd213ps_avx512vl(auVar176,ZEXT1632(auVar292),auVar153);
            auVar155 = vfmadd231ps_avx512vl(auVar155,auVar154,auVar360);
            auVar165 = vfmadd231ps_avx512vl(auVar165,auVar154,ZEXT1632(auVar147));
            auVar153 = vfmadd213ps_avx512vl(auVar154,ZEXT1632(auVar292),auVar153);
            auVar154 = vmulps_avx512vl(auVar162,auVar158);
            auVar176 = vmulps_avx512vl(auVar162,auVar156);
            auVar162 = vmulps_avx512vl(auVar162,ZEXT1632(auVar293));
            auVar154 = vfmadd231ps_avx512vl(auVar154,auVar160,auVar360);
            auVar176 = vfmadd231ps_avx512vl(auVar176,auVar160,ZEXT1632(auVar147));
            auVar160 = vfmadd231ps_avx512vl(auVar162,ZEXT1632(auVar292),auVar160);
            auVar158 = vmulps_avx512vl(auVar180,auVar158);
            auVar156 = vmulps_avx512vl(auVar180,auVar156);
            auVar162 = vmulps_avx512vl(auVar180,ZEXT1632(auVar293));
            auVar158 = vfmadd231ps_avx512vl(auVar158,auVar164,auVar360);
            auVar156 = vfmadd231ps_avx512vl(auVar156,auVar164,ZEXT1632(auVar147));
            auVar162 = vfmadd231ps_avx512vl(auVar162,auVar164,ZEXT1632(auVar292));
            auVar257._0_4_ = auVar143._0_4_ + auVar149._0_4_;
            auVar257._4_4_ = auVar143._4_4_ + auVar149._4_4_;
            auVar257._8_4_ = auVar143._8_4_ + auVar149._8_4_;
            auVar257._12_4_ = auVar143._12_4_ + auVar149._12_4_;
            auVar257._16_4_ = auVar149._16_4_ + 0.0;
            auVar257._20_4_ = auVar149._20_4_ + 0.0;
            auVar257._24_4_ = auVar149._24_4_ + 0.0;
            auVar257._28_4_ = auVar149._28_4_ + 0.0;
            auVar149 = vfmadd231ps_avx512vl(ZEXT1632(auVar148),auVar167,auVar257);
            auVar164 = vfmadd231ps_avx512vl(ZEXT1632(auVar144),auVar167,ZEXT1632(auVar145));
            auVar167 = vfmadd231ps_avx512vl(auVar157,ZEXT1632(auVar146),auVar167);
            auVar155 = vfmadd231ps_avx512vl(auVar155,auVar168,auVar257);
            auVar165 = vfmadd231ps_avx512vl(auVar165,auVar168,ZEXT1632(auVar145));
            auVar168 = vfmadd231ps_avx512vl(auVar153,ZEXT1632(auVar146),auVar168);
            auVar153 = vfmadd231ps_avx512vl(auVar154,auVar159,auVar257);
            auVar154 = vfmadd231ps_avx512vl(auVar176,auVar159,ZEXT1632(auVar145));
            auVar157 = vfmadd231ps_avx512vl(auVar160,ZEXT1632(auVar146),auVar159);
            auVar158 = vfmadd231ps_avx512vl(auVar158,auVar150,auVar257);
            auVar159 = vaddps_avx512vl(auVar161,auVar158);
            auVar156 = vfmadd231ps_avx512vl(auVar156,auVar150,ZEXT1632(auVar145));
            auVar160 = vaddps_avx512vl(auVar163,auVar156);
            auVar162 = vfmadd231ps_avx512vl(auVar162,auVar150,ZEXT1632(auVar146));
            fVar226 = auVar166._0_4_ + auVar162._0_4_;
            fVar234 = auVar166._4_4_ + auVar162._4_4_;
            fVar235 = auVar166._8_4_ + auVar162._8_4_;
            fVar236 = auVar166._12_4_ + auVar162._12_4_;
            fVar237 = auVar166._16_4_ + auVar162._16_4_;
            fVar238 = auVar166._20_4_ + auVar162._20_4_;
            fVar239 = auVar166._24_4_ + auVar162._24_4_;
            auVar156 = vmulps_avx512vl(auVar154,auVar168);
            auVar156 = vfmsub231ps_avx512vl(auVar156,auVar165,auVar157);
            auVar158 = vmulps_avx512vl(auVar157,auVar155);
            auVar163 = vfmsub231ps_avx512vl(auVar158,auVar168,auVar153);
            auVar158 = vmulps_avx512vl(auVar153,auVar165);
            auVar150 = vfmsub231ps_avx512vl(auVar158,auVar155,auVar154);
            auVar158 = vmulps_avx512vl(auVar167,auVar153);
            auVar180 = vfmsub231ps_avx512vl(auVar158,auVar149,auVar157);
            auVar158 = vmulps_avx512vl(auVar164,auVar157);
            auVar158 = vfmsub231ps_avx512vl(auVar158,auVar154,auVar167);
            auVar154 = vmulps_avx512vl(auVar149,auVar154);
            auVar153 = vfmsub231ps_avx512vl(auVar154,auVar164,auVar153);
            auVar127._4_4_ = auVar165._4_4_ * auVar167._4_4_;
            auVar127._0_4_ = auVar165._0_4_ * auVar167._0_4_;
            auVar127._8_4_ = auVar165._8_4_ * auVar167._8_4_;
            auVar127._12_4_ = auVar165._12_4_ * auVar167._12_4_;
            auVar127._16_4_ = auVar165._16_4_ * auVar167._16_4_;
            auVar127._20_4_ = auVar165._20_4_ * auVar167._20_4_;
            auVar127._24_4_ = auVar165._24_4_ * auVar167._24_4_;
            auVar127._28_4_ = auVar161._28_4_;
            auVar161 = vfmsub231ps_avx512vl(auVar127,auVar164,auVar168);
            auVar168 = vmulps_avx512vl(auVar168,auVar149);
            auVar143 = vfmsub231ps_fma(auVar168,auVar167,auVar155);
            auVar128._4_4_ = auVar155._4_4_ * auVar164._4_4_;
            auVar128._0_4_ = auVar155._0_4_ * auVar164._0_4_;
            auVar128._8_4_ = auVar155._8_4_ * auVar164._8_4_;
            auVar128._12_4_ = auVar155._12_4_ * auVar164._12_4_;
            auVar128._16_4_ = auVar155._16_4_ * auVar164._16_4_;
            auVar128._20_4_ = auVar155._20_4_ * auVar164._20_4_;
            auVar128._24_4_ = auVar155._24_4_ * auVar164._24_4_;
            auVar128._28_4_ = auVar155._28_4_;
            auVar148 = vfmsub231ps_fma(auVar128,auVar149,auVar165);
            auVar168 = vmulps_avx512vl(auVar167,auVar150);
            auVar168 = vfmadd231ps_avx512vl(auVar168,auVar163,auVar164);
            auVar165 = vfmadd231ps_avx512vl(auVar168,auVar156,auVar149);
            auVar149 = vdivps_avx512vl(auVar156,auVar165);
            auVar156 = vdivps_avx512vl(auVar158,auVar165);
            auVar158 = vdivps_avx512vl(auVar161,auVar165);
            auVar161 = vdivps_avx512vl(auVar163,auVar165);
            auVar163 = vdivps_avx512vl(auVar180,auVar165);
            auVar168 = vdivps_avx512vl(ZEXT1632(auVar143),auVar165);
            auVar167 = vdivps_avx512vl(auVar150,auVar165);
            auVar155 = vdivps_avx512vl(auVar153,auVar165);
            auVar165 = vdivps_avx512vl(ZEXT1632(auVar148),auVar165);
            auVar129._4_4_ = fVar234 * auVar167._4_4_;
            auVar129._0_4_ = fVar226 * auVar167._0_4_;
            auVar129._8_4_ = fVar235 * auVar167._8_4_;
            auVar129._12_4_ = fVar236 * auVar167._12_4_;
            auVar129._16_4_ = fVar237 * auVar167._16_4_;
            auVar129._20_4_ = fVar238 * auVar167._20_4_;
            auVar129._24_4_ = fVar239 * auVar167._24_4_;
            auVar129._28_4_ = auVar150._28_4_;
            auVar130._4_4_ = fVar234 * auVar155._4_4_;
            auVar130._0_4_ = fVar226 * auVar155._0_4_;
            auVar130._8_4_ = fVar235 * auVar155._8_4_;
            auVar130._12_4_ = fVar236 * auVar155._12_4_;
            auVar130._16_4_ = fVar237 * auVar155._16_4_;
            auVar130._20_4_ = fVar238 * auVar155._20_4_;
            auVar130._24_4_ = fVar239 * auVar155._24_4_;
            auVar130._28_4_ = auVar153._28_4_;
            auVar131._4_4_ = fVar234 * auVar165._4_4_;
            auVar131._0_4_ = fVar226 * auVar165._0_4_;
            auVar131._8_4_ = fVar235 * auVar165._8_4_;
            auVar131._12_4_ = fVar236 * auVar165._12_4_;
            auVar131._16_4_ = fVar237 * auVar165._16_4_;
            auVar131._20_4_ = fVar238 * auVar165._20_4_;
            auVar131._24_4_ = fVar239 * auVar165._24_4_;
            auVar131._28_4_ = auVar166._28_4_ + auVar162._28_4_;
            auVar143 = vfmadd231ps_fma(auVar129,auVar160,auVar161);
            auVar148 = vfmadd231ps_fma(auVar130,auVar160,auVar163);
            auVar144 = vfmadd231ps_fma(auVar131,auVar168,auVar160);
            auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar159,auVar149);
            auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar159,auVar156);
            auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar158,auVar159);
          }
          auVar326._0_8_ = auVar143._0_8_ ^ 0x8000000080000000;
          auVar326._8_4_ = auVar143._8_4_ ^ 0x80000000;
          auVar326._12_4_ = auVar143._12_4_ ^ 0x80000000;
          auVar300._0_8_ = auVar148._0_8_ ^ 0x8000000080000000;
          auVar300._8_4_ = auVar148._8_4_ ^ 0x80000000;
          auVar300._12_4_ = auVar148._12_4_ ^ 0x80000000;
          auVar305._0_8_ = auVar144._0_8_ ^ 0x8000000080000000;
          auVar305._8_4_ = auVar144._8_4_ ^ 0x80000000;
          auVar305._12_4_ = auVar144._12_4_ ^ 0x80000000;
        }
        else {
          BVar1 = (this_00->super_Geometry).time_range;
          auVar227._8_8_ = 0;
          auVar227._0_4_ = BVar1.lower;
          auVar227._4_4_ = BVar1.upper;
          fVar226 = BVar1.lower;
          auVar247._4_4_ = fVar226;
          auVar247._0_4_ = fVar226;
          auVar247._8_4_ = fVar226;
          auVar247._12_4_ = fVar226;
          auVar247._16_4_ = fVar226;
          auVar247._20_4_ = fVar226;
          auVar247._24_4_ = fVar226;
          auVar247._28_4_ = fVar226;
          fVar226 = (this_00->super_Geometry).fnumTimeSegments;
          auVar149 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar247);
          auVar143 = vmovshdup_avx(auVar227);
          auVar265 = ZEXT1664(auVar143);
          auVar155 = ZEXT1632(auVar143);
          auVar143 = vsubps_avx(auVar143,auVar227);
          auVar228._0_4_ = auVar143._0_4_;
          auVar228._4_4_ = auVar228._0_4_;
          auVar228._8_4_ = auVar228._0_4_;
          auVar228._12_4_ = auVar228._0_4_;
          auVar228._16_4_ = auVar228._0_4_;
          auVar228._20_4_ = auVar228._0_4_;
          auVar228._24_4_ = auVar228._0_4_;
          auVar228._28_4_ = auVar228._0_4_;
          auVar149 = vdivps_avx(auVar149,auVar228);
          auVar42._4_4_ = fVar226 * auVar149._4_4_;
          auVar42._0_4_ = fVar226 * auVar149._0_4_;
          auVar42._8_4_ = fVar226 * auVar149._8_4_;
          auVar42._12_4_ = fVar226 * auVar149._12_4_;
          auVar42._16_4_ = fVar226 * auVar149._16_4_;
          auVar42._20_4_ = fVar226 * auVar149._20_4_;
          auVar42._24_4_ = fVar226 * auVar149._24_4_;
          auVar42._28_4_ = auVar149._28_4_;
          auVar149 = vroundps_avx(auVar42,1);
          fVar226 = fVar226 + -1.0;
          auVar253._4_4_ = fVar226;
          auVar253._0_4_ = fVar226;
          auVar253._8_4_ = fVar226;
          auVar253._12_4_ = fVar226;
          auVar253._16_4_ = fVar226;
          auVar253._20_4_ = fVar226;
          auVar253._24_4_ = fVar226;
          auVar253._28_4_ = fVar226;
          auVar149 = vminps_avx(auVar149,auVar253);
          auVar134 = ZEXT412(0);
          auVar258 = ZEXT1264(auVar134) << 0x20;
          auVar167 = ZEXT1232(auVar134) << 0x20;
          auVar149 = vmaxps_avx(auVar149,ZEXT1232(auVar134) << 0x20);
          auVar168 = vsubps_avx(auVar42,auVar149);
          auVar149 = vcvtps2dq_avx512vl(auVar149);
          local_1e0 = vmovdqa64_avx512vl(auVar149);
          uVar142 = 0;
          for (uVar208 = (uint)bVar138; (uVar208 & 1) == 0; uVar208 = uVar208 >> 1 | 0x80000000) {
            uVar142 = uVar142 + 1;
          }
          _local_340 = vpbroadcastd_avx512vl();
          uVar18 = vpcmpeqd_avx512vl(auVar149,_local_340);
          if ((byte)(~bVar138 | (byte)uVar18) == 0xff) {
            pRVar4 = (this_00->l2w_buf).items;
            pRVar6 = pRVar4 + *(int *)(local_1e0 + (ulong)uVar142 * 4);
            RVar2 = pRVar4[*(int *)(local_1e0 + (ulong)uVar142 * 4)].format;
            if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar5 = pRVar6->ptr_ofs;
              lVar137 = pRVar6->stride * uVar135;
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x10)),0x1c);
              auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x20)),0x28);
              _local_340 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x14)),0x1c);
              auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),0x28);
              auVar167 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),0x1c);
              auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x28)),0x28);
              auVar155 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x1c)),0x1c);
              auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x2c)),0x28);
              auVar156 = ZEXT1632(auVar143);
            }
            else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar5 = pRVar6->ptr_ofs;
              lVar137 = pRVar6->stride * uVar135;
              auVar260._8_8_ = 0;
              auVar260._0_8_ = *(ulong *)(pcVar5 + lVar137 + 4);
              auVar280._8_8_ = 0;
              auVar280._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
              auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137)),_DAT_01fbb140,
                                            auVar260);
              _local_340 = ZEXT1632(auVar143);
              auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),_DAT_01fbb140
                                            ,auVar280);
              auVar167 = ZEXT1632(auVar143);
              auVar281._8_8_ = 0;
              auVar281._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
              auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),
                                            _DAT_01fbb140,auVar281);
              auVar155 = ZEXT1632(auVar143);
              auVar282._8_8_ = 0;
              auVar282._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x28);
              auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),
                                            _DAT_01fbb140,auVar282);
              auVar156 = ZEXT1632(auVar143);
            }
            else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar5 = pRVar6->ptr_ofs;
              lVar137 = pRVar6->stride * uVar135;
              auVar241._8_8_ = 0;
              auVar241._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
              auVar143 = vinsertps_avx(auVar241,ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),0x20);
              auVar242._8_8_ = 0;
              auVar242._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x34);
              auVar144 = vpermt2ps_avx512vl(auVar242,_DAT_01fbb150,
                                            ZEXT416(*(uint *)(pcVar5 + lVar137)));
              auVar286._8_8_ = 0;
              auVar286._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
              fVar226 = *(float *)(pcVar5 + lVar137 + 0x24);
              fVar234 = *(float *)(pcVar5 + lVar137 + 0x28);
              fVar235 = *(float *)(pcVar5 + lVar137 + 0x2c);
              auVar145 = vpermt2ps_avx512vl(auVar286,_DAT_01fbb150,
                                            ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)));
              fVar236 = *(float *)(pcVar5 + lVar137 + 0x30);
              auVar148 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * fVar234)),ZEXT416((uint)fVar226),
                                         ZEXT416((uint)fVar226));
              auVar148 = vfmadd231ss_fma(auVar148,ZEXT416((uint)fVar235),ZEXT416((uint)fVar235));
              auVar148 = vfmadd231ss_fma(auVar148,ZEXT416((uint)fVar236),ZEXT416((uint)fVar236));
              auVar146 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar148._0_4_));
              fVar237 = auVar146._0_4_;
              fVar237 = fVar237 * 1.5 + fVar237 * fVar237 * fVar237 * auVar148._0_4_ * -0.5;
              auVar148 = vinsertps_avx(auVar145,ZEXT416((uint)(fVar226 * fVar237)),0x30);
              auVar156 = ZEXT1632(auVar148);
              auVar148 = vinsertps_avx(auVar144,ZEXT416((uint)(fVar234 * fVar237)),0x30);
              _local_340 = ZEXT1632(auVar148);
              auVar143 = vinsertps_avx(auVar143,ZEXT416((uint)(fVar236 * fVar237)),0x30);
              auVar155 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),0x10);
              auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x3c)),0x20);
              auVar143 = vinsertps_avx(auVar143,ZEXT416((uint)(fVar235 * fVar237)),0x30);
              auVar167 = ZEXT1632(auVar143);
            }
            else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar5 = pRVar6->ptr_ofs;
              lVar137 = pRVar6->stride * uVar135;
              _local_340 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137));
              auVar167 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x10));
              auVar155 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x20));
              auVar156 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x30));
            }
            auVar329._8_4_ = 1;
            auVar329._0_8_ = 0x100000001;
            auVar329._12_4_ = 1;
            auVar329._16_4_ = 1;
            auVar329._20_4_ = 1;
            auVar329._24_4_ = 1;
            auVar329._28_4_ = 1;
            auVar150 = vbroadcastss_avx512vl(ZEXT416(2));
            RVar2 = pRVar6[1].format;
            if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar5 = pRVar6[1].ptr_ofs;
              lVar137 = uVar135 * pRVar6[1].stride;
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x10)),0x1c);
              auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x20)),0x28);
              auVar158 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x14)),0x1c);
              auVar143 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),0x28
                                          );
              auVar161 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),0x1c);
              auVar143 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x28)),0x28
                                          );
              auVar163 = ZEXT1632(auVar143);
              auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                       ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x1c)),0x1c);
              auVar143 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x2c)),0x28
                                          );
              auVar149 = ZEXT1632(auVar143);
            }
            else {
              auVar152._16_16_ = auVar150._16_16_;
              if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar5 = pRVar6[1].ptr_ofs;
                lVar137 = uVar135 * pRVar6[1].stride;
                auVar272._8_8_ = 0;
                auVar272._0_8_ = *(ulong *)(pcVar5 + lVar137 + 4);
                auVar287._8_8_ = 0;
                auVar287._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
                auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137)),_DAT_01fbb140,
                                              auVar272);
                auVar158 = ZEXT1632(auVar143);
                auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                              _DAT_01fbb140,auVar287);
                auVar161 = ZEXT1632(auVar143);
                auVar273._8_8_ = 0;
                auVar273._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
                auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),
                                              _DAT_01fbb140,auVar273);
                auVar163 = ZEXT1632(auVar143);
                auVar274._8_8_ = 0;
                auVar274._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x28);
                auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),
                                              _DAT_01fbb140,auVar274);
                auVar149 = ZEXT1632(auVar143);
              }
              else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                pcVar5 = pRVar6[1].ptr_ofs;
                lVar137 = uVar135 * pRVar6[1].stride;
                auVar275._8_8_ = 0;
                auVar275._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
                auVar143 = vinsertps_avx(auVar275,ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),0x20);
                auVar283._8_8_ = 0;
                auVar283._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x34);
                auVar144 = vpermt2ps_avx512vl(auVar283,_DAT_01fbb150,
                                              ZEXT416(*(uint *)(pcVar5 + lVar137)));
                auVar299._8_8_ = 0;
                auVar299._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
                fVar226 = *(float *)(pcVar5 + lVar137 + 0x24);
                fVar234 = *(float *)(pcVar5 + lVar137 + 0x28);
                fVar235 = *(float *)(pcVar5 + lVar137 + 0x2c);
                auVar145 = vpermt2ps_avx512vl(auVar299,_DAT_01fbb150,
                                              ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)));
                fVar236 = *(float *)(pcVar5 + lVar137 + 0x30);
                auVar148 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * fVar234)),ZEXT416((uint)fVar226)
                                           ,ZEXT416((uint)fVar226));
                auVar148 = vfmadd231ss_fma(auVar148,ZEXT416((uint)fVar235),ZEXT416((uint)fVar235));
                auVar148 = vfmadd231ss_fma(auVar148,ZEXT416((uint)fVar236),ZEXT416((uint)fVar236));
                auVar152._0_16_ = ZEXT816(0) << 0x40;
                auVar151._4_28_ = auVar152._4_28_;
                auVar151._0_4_ = auVar148._0_4_;
                auVar146 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar151._0_16_);
                auVar147 = vmulss_avx512f(auVar146,ZEXT416(0x3fc00000));
                fVar237 = auVar146._0_4_;
                auVar148 = vaddss_avx512f(auVar147,ZEXT416((uint)(fVar237 * fVar237 *
                                                                 fVar237 * auVar148._0_4_ * -0.5)));
                fVar237 = auVar148._0_4_;
                auVar148 = vinsertps_avx512f(auVar145,ZEXT416((uint)(fVar226 * fVar237)),0x30);
                auVar149 = ZEXT1632(auVar148);
                auVar148 = vinsertps_avx(auVar144,ZEXT416((uint)(fVar234 * fVar237)),0x30);
                auVar158 = ZEXT1632(auVar148);
                auVar143 = vinsertps_avx512f(auVar143,ZEXT416((uint)(fVar236 * fVar237)),0x30);
                auVar163 = ZEXT1632(auVar143);
                auVar143 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                         ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),0x10);
                auVar143 = vinsertps_avx(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x3c)),0x20);
                auVar143 = vinsertps_avx512f(auVar143,ZEXT416((uint)(fVar235 * fVar237)),0x30);
                auVar161 = ZEXT1632(auVar143);
              }
              else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar5 = pRVar6[1].ptr_ofs;
                lVar137 = uVar135 * pRVar6[1].stride;
                auVar158 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137));
                auVar161 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x10));
                auVar163 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x20));
                auVar149 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x30));
              }
            }
            uVar240 = local_340._0_4_;
            auVar346._4_4_ = uVar240;
            auVar346._0_4_ = uVar240;
            auVar346._8_4_ = uVar240;
            auVar346._12_4_ = uVar240;
            auVar346._16_4_ = uVar240;
            auVar346._20_4_ = uVar240;
            auVar346._24_4_ = uVar240;
            auVar346._28_4_ = uVar240;
            auVar165 = vpermps_avx2(auVar329,_local_340);
            auVar153 = vpermps_avx512vl(auVar150,_local_340);
            uVar240 = auVar167._0_4_;
            in_ZMM7 = ZEXT3264(CONCAT428(uVar240,CONCAT424(uVar240,CONCAT420(uVar240,CONCAT416(
                                                  uVar240,CONCAT412(uVar240,CONCAT48(uVar240,
                                                  CONCAT44(uVar240,uVar240))))))));
            auVar166 = vpermps_avx2(auVar329,auVar167);
            auVar154 = vpermps_avx512vl(auVar150,auVar167);
            uVar240 = auVar155._0_4_;
            auVar276._4_4_ = uVar240;
            auVar276._0_4_ = uVar240;
            auVar276._8_4_ = uVar240;
            auVar276._12_4_ = uVar240;
            auVar276._16_4_ = uVar240;
            auVar276._20_4_ = uVar240;
            auVar276._24_4_ = uVar240;
            auVar276._28_4_ = uVar240;
            auVar167 = vpermps_avx2(auVar329,auVar155);
            auVar155 = vpermps_avx512vl(auVar150,auVar155);
            in_ZMM6 = ZEXT3264(auVar155);
            uVar240 = auVar156._0_4_;
            auVar248._4_4_ = uVar240;
            auVar248._0_4_ = uVar240;
            auVar248._8_4_ = uVar240;
            auVar248._12_4_ = uVar240;
            auVar248._16_4_ = uVar240;
            auVar248._20_4_ = uVar240;
            auVar248._24_4_ = uVar240;
            auVar248._28_4_ = uVar240;
            auVar155 = vpermps_avx2(auVar329,auVar156);
            auVar156 = vpermps_avx512vl(auVar150,auVar156);
            auVar265 = ZEXT3264(auVar156);
            auVar156 = vbroadcastss_avx512vl(auVar158._0_16_);
            auVar157 = vpermps_avx512vl(auVar329,auVar158);
            auVar158 = vpermps_avx512vl(auVar150,auVar158);
            auVar159 = vbroadcastss_avx512vl(auVar161._0_16_);
            auVar160 = vpermps_avx512vl(auVar329,auVar161);
            auVar161 = vpermps_avx512vl(auVar150,auVar161);
            auVar162 = vbroadcastss_avx512vl(auVar163._0_16_);
            auVar357 = auVar162._0_28_;
            auVar162 = vpermps_avx512vl(auVar329,auVar163);
            auVar163 = vpermps_avx512vl(auVar150,auVar163);
            auVar164 = vbroadcastss_avx512vl(auVar149._0_16_);
            in_ZMM10 = ZEXT3264(auVar164);
            auVar164 = vpermps_avx512vl(auVar329,auVar149);
            in_ZMM11 = ZEXT3264(auVar164);
            auVar150 = vpermps_avx512vl(auVar150,auVar149);
          }
          else {
            pRVar6 = (this_00->l2w_buf).items;
            uVar140 = uVar139 & 0xffffffff;
            auVar248 = _local_340;
            local_320 = _local_340;
            _local_300 = _local_340;
            local_2e0 = _local_340;
            local_2a0 = _local_340;
            while( true ) {
              auVar155 = auVar258._0_32_;
              auVar150 = in_ZMM16._0_32_;
              auVar167 = in_ZMM5._0_32_;
              auVar276 = in_ZMM4._0_32_;
              auVar163 = in_ZMM19._0_32_;
              auVar162 = in_ZMM17._0_32_;
              auVar357 = in_ZMM15._0_28_;
              auVar154 = in_ZMM9._0_32_;
              auVar166 = in_ZMM8._0_32_;
              auVar161 = in_ZMM22._0_32_;
              auVar160 = in_ZMM20._0_32_;
              auVar159 = in_ZMM18._0_32_;
              auVar153 = in_ZMM14._0_32_;
              auVar165 = in_ZMM13._0_32_;
              auVar346 = in_ZMM12._0_32_;
              auVar158 = in_ZMM24._0_32_;
              auVar157 = in_ZMM23._0_32_;
              auVar156 = in_ZMM21._0_32_;
              bVar138 = (byte)uVar140;
              if (bVar138 == 0) break;
              uVar142 = 0;
              for (uVar208 = (uint)uVar140 & 0xff; (uVar208 & 1) == 0;
                  uVar208 = uVar208 >> 1 | 0x80000000) {
                uVar142 = uVar142 + 1;
              }
              pRVar4 = pRVar6 + *(int *)(local_1e0 + (ulong)uVar142 * 4);
              RVar2 = pRVar6[*(int *)(local_1e0 + (ulong)uVar142 * 4)].format;
              auVar156 = in_ZMM28._0_32_;
              auVar158 = in_ZMM29._0_32_;
              if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar5 = pRVar4->ptr_ofs;
                lVar137 = pRVar4->stride * uVar135;
                auVar143 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar137)),
                                             ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x10)),0x1c);
                auVar148 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x20)),
                                             0x28);
                auVar143 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),
                                             ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x14)),0x1c);
                auVar144 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),
                                             0x28);
                auVar143 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),
                                             ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),0x1c);
                auVar145 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x28)),
                                             0x28);
                auVar143 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                             ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x1c)),0x1c);
                auVar143 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x2c)),
                                             0x28);
LAB_01f380dd:
                _local_300 = ZEXT1632(auVar148);
                local_320 = ZEXT1632(auVar144);
                _local_340 = ZEXT1632(auVar145);
                local_2e0 = ZEXT1632(auVar143);
              }
              else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                pcVar5 = pRVar4->ptr_ofs;
                lVar137 = pRVar4->stride * uVar135;
                auVar362._8_8_ = 0;
                auVar362._0_8_ = *(ulong *)(pcVar5 + lVar137 + 4);
                auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137)),_DAT_01fbb140,
                                              auVar362);
                _local_300 = ZEXT1632(auVar143);
                auVar369._8_8_ = 0;
                auVar369._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
                auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                              _DAT_01fbb140,auVar369);
                local_320 = ZEXT1632(auVar143);
                auVar363._8_8_ = 0;
                auVar363._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
                auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),
                                              _DAT_01fbb140,auVar363);
                _local_340 = ZEXT1632(auVar143);
                auVar364._8_8_ = 0;
                auVar364._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x28);
                auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),
                                              _DAT_01fbb140,auVar364);
                local_2e0 = ZEXT1632(auVar143);
              }
              else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                pcVar5 = pRVar4->ptr_ofs;
                lVar137 = pRVar4->stride * uVar135;
                auVar371._8_8_ = 0;
                auVar371._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
                auVar143 = vinsertps_avx512f(auVar371,ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),0x20)
                ;
                auVar170._16_16_ = in_ZMM31._16_16_;
                auVar372._8_8_ = 0;
                auVar372._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x34);
                auVar144 = vpermt2ps_avx512vl(auVar372,_DAT_01fbb150,
                                              ZEXT416(*(uint *)(pcVar5 + lVar137)));
                auVar375._8_8_ = 0;
                auVar375._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
                auVar148 = vpermt2ps_avx512vl(auVar375,_DAT_01fbb150,
                                              ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)));
                uVar142 = *(uint *)(pcVar5 + lVar137 + 0x24);
                uVar208 = *(uint *)(pcVar5 + lVar137 + 0x28);
                uVar209 = *(uint *)(pcVar5 + lVar137 + 0x30);
                auVar145 = vmulss_avx512f(ZEXT416(uVar208),ZEXT416(uVar208));
                auVar145 = vfmadd231ss_avx512f(auVar145,ZEXT416(uVar142),ZEXT416(uVar142));
                auVar146 = ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x2c));
                auVar145 = vfmadd231ss_avx512f(auVar145,auVar146,auVar146);
                auVar145 = vfmadd231ss_avx512f(auVar145,ZEXT416(uVar209),ZEXT416(uVar209));
                auVar170._0_16_ = vxorps_avx512vl(auVar146,auVar146);
                auVar169._4_28_ = auVar170._4_28_;
                auVar169._0_4_ = auVar145._0_4_;
                auVar146 = vrsqrt14ss_avx512f(auVar170._0_16_,auVar169._0_16_);
                auVar147 = vmulss_avx512f(auVar146,ZEXT416(0x3fc00000));
                auVar145 = vmulss_avx512f(auVar145,ZEXT416(0xbf000000));
                auVar145 = vmulss_avx512f(auVar146,auVar145);
                auVar146 = vmulss_avx512f(auVar146,auVar146);
                auVar145 = vmulss_avx512f(auVar146,auVar145);
                auVar145 = vaddss_avx512f(auVar147,auVar145);
                auVar146 = vmulss_avx512f(ZEXT416(uVar142),auVar145);
                auVar148 = vinsertps_avx512f(auVar148,auVar146,0x30);
                local_2e0 = ZEXT1632(auVar148);
                auVar148 = vmulss_avx512f(auVar145,ZEXT416(uVar208));
                auVar148 = vinsertps_avx512f(auVar144,auVar148,0x30);
                in_ZMM31 = ZEXT3264(in_ZMM31._0_32_);
                _local_300 = ZEXT1632(auVar148);
                auVar148 = vmulss_avx512f(auVar145,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x2c)));
                auVar144 = vmulss_avx512f(ZEXT416(uVar209),auVar145);
                auVar143 = vinsertps_avx512f(auVar143,auVar144,0x30);
                _local_340 = ZEXT1632(auVar143);
                auVar143 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                             ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),0x10);
                auVar143 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x3c)),
                                             0x20);
                auVar143 = vinsertps_avx512f(auVar143,auVar148,0x30);
                local_320 = ZEXT1632(auVar143);
              }
              else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar5 = pRVar4->ptr_ofs;
                lVar137 = pRVar4->stride * uVar135;
                auVar148 = *(undefined1 (*) [16])(pcVar5 + lVar137);
                auVar144 = *(undefined1 (*) [16])(pcVar5 + lVar137 + 0x10);
                auVar145 = *(undefined1 (*) [16])(pcVar5 + lVar137 + 0x20);
                auVar143 = *(undefined1 (*) [16])(pcVar5 + lVar137 + 0x30);
                goto LAB_01f380dd;
              }
              auVar161 = vpbroadcastd_avx512vl();
              uVar18 = vpcmpeqd_avx512vl(auVar161,auVar149);
              RVar2 = pRVar4[1].format;
              if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
                pcVar5 = pRVar4[1].ptr_ofs;
                lVar137 = pRVar4[1].stride * uVar135;
                auVar143 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar137)),
                                             ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x10)),0x1c);
                auVar143 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x20)),
                                             0x28);
                local_2a0 = ZEXT1632(auVar143);
                auVar143 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),
                                             ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x14)),0x1c);
                auVar143 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),
                                             0x28);
                auVar156 = ZEXT1632(auVar143);
                auVar143 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),
                                             ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),0x1c);
                auVar143 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x28)),
                                             0x28);
                auVar148 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                             ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x1c)),0x1c);
                auVar158 = ZEXT1632(auVar143);
                auVar143 = vinsertps_avx512f(auVar148,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x2c)),
                                             0x28);
                in_ZMM31 = ZEXT1664(auVar143);
              }
              else {
                auVar172._16_16_ = auVar161._16_16_;
                if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
                  pcVar5 = pRVar4[1].ptr_ofs;
                  lVar137 = pRVar4[1].stride * uVar135;
                  auVar365._8_8_ = 0;
                  auVar365._0_8_ = *(ulong *)(pcVar5 + lVar137 + 4);
                  auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137)),_DAT_01fbb140,
                                                auVar365);
                  local_2a0 = ZEXT1632(auVar143);
                  auVar373._8_8_ = 0;
                  auVar373._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
                  auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                                _DAT_01fbb140,auVar373);
                  auVar156 = ZEXT1632(auVar143);
                  auVar366._8_8_ = 0;
                  auVar366._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
                  auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)),
                                                _DAT_01fbb140,auVar366);
                  auVar158 = ZEXT1632(auVar143);
                  auVar367._8_8_ = 0;
                  auVar367._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x28);
                  auVar143 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x24)),
                                                _DAT_01fbb140,auVar367);
                  in_ZMM31 = ZEXT1664(auVar143);
                }
                else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
                  pcVar5 = pRVar4[1].ptr_ofs;
                  lVar137 = pRVar4[1].stride * uVar135;
                  auVar368._8_8_ = 0;
                  auVar368._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x10);
                  auVar143 = vinsertps_avx512f(auVar368,ZEXT416(*(uint *)(pcVar5 + lVar137 + 8)),
                                               0x20);
                  auVar370._8_8_ = 0;
                  auVar370._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x34);
                  auVar144 = vpermt2ps_avx512vl(auVar370,_DAT_01fbb150,
                                                ZEXT416(*(uint *)(pcVar5 + lVar137)));
                  auVar374._8_8_ = 0;
                  auVar374._0_8_ = *(ulong *)(pcVar5 + lVar137 + 0x1c);
                  auVar148 = vpermt2ps_avx512vl(auVar374,_DAT_01fbb150,
                                                ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x18)));
                  uVar142 = *(uint *)(pcVar5 + lVar137 + 0x24);
                  uVar208 = *(uint *)(pcVar5 + lVar137 + 0x28);
                  uVar209 = *(uint *)(pcVar5 + lVar137 + 0x30);
                  auVar145 = vmulss_avx512f(ZEXT416(uVar208),ZEXT416(uVar208));
                  auVar145 = vfmadd231ss_avx512f(auVar145,ZEXT416(uVar142),ZEXT416(uVar142));
                  auVar146 = ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x2c));
                  auVar145 = vfmadd231ss_avx512f(auVar145,auVar146,auVar146);
                  auVar145 = vfmadd231ss_avx512f(auVar145,ZEXT416(uVar209),ZEXT416(uVar209));
                  auVar172._0_16_ = vxorps_avx512vl(auVar146,auVar146);
                  auVar171._4_28_ = auVar172._4_28_;
                  auVar171._0_4_ = auVar145._0_4_;
                  auVar146 = vrsqrt14ss_avx512f(auVar172._0_16_,auVar171._0_16_);
                  auVar147 = vmulss_avx512f(auVar146,ZEXT416(0x3fc00000));
                  auVar145 = vmulss_avx512f(auVar145,ZEXT416(0xbf000000));
                  auVar145 = vmulss_avx512f(auVar146,auVar145);
                  auVar146 = vmulss_avx512f(auVar146,auVar146);
                  auVar145 = vmulss_avx512f(auVar146,auVar145);
                  auVar145 = vaddss_avx512f(auVar147,auVar145);
                  auVar146 = vmulss_avx512f(ZEXT416(uVar142),auVar145);
                  auVar148 = vinsertps_avx512f(auVar148,auVar146,0x30);
                  in_ZMM31 = ZEXT1664(auVar148);
                  auVar148 = vmulss_avx512f(ZEXT416(uVar208),auVar145);
                  auVar148 = vinsertps_avx512f(auVar144,auVar148,0x30);
                  local_2a0 = ZEXT1632(auVar148);
                  auVar148 = vmulss_avx512f(auVar145,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x2c)));
                  auVar144 = vmulss_avx512f(auVar145,ZEXT416(uVar209));
                  auVar143 = vinsertps_avx512f(auVar143,auVar144,0x30);
                  auVar158 = ZEXT1632(auVar143);
                  auVar143 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar137 + 0xc)),
                                               ZEXT416(*(uint *)(pcVar5 + lVar137 + 4)),0x10);
                  auVar143 = vinsertps_avx512f(auVar143,ZEXT416(*(uint *)(pcVar5 + lVar137 + 0x3c)),
                                               0x20);
                  auVar143 = vinsertps_avx512f(auVar143,auVar148,0x30);
                  auVar156 = ZEXT1632(auVar143);
                }
                else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                  pcVar5 = pRVar4[1].ptr_ofs;
                  lVar137 = pRVar4[1].stride * uVar135;
                  local_2a0 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137));
                  auVar156 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x10));
                  auVar158 = ZEXT1632(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x20));
                  in_ZMM31 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar137 + 0x30));
                }
              }
              bVar136 = bVar138 & (byte)uVar18;
              uVar140 = (ulong)(~bVar136 & bVar138);
              auVar161 = vbroadcastss_avx512vl(local_300._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM12 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar161._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM12._28_4_,
                                            CONCAT424((uint)bVar12 * auVar161._24_4_ |
                                                      (uint)!bVar12 * in_ZMM12._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar161._20_4_ |
                                                                (uint)!bVar11 * in_ZMM12._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar161._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM12._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar161._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM12.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar161._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM12._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar161._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM12._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar161._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM12._0_4_))))))));
              auVar161 = vbroadcastss_avx512vl(ZEXT416(1));
              auVar163 = vpermps_avx512vl(auVar161,_local_300);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM13 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar163._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM13._28_4_,
                                            CONCAT424((uint)bVar12 * auVar163._24_4_ |
                                                      (uint)!bVar12 * in_ZMM13._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar163._20_4_ |
                                                                (uint)!bVar11 * in_ZMM13._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar163._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM13._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar163._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM13.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar163._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM13._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar163._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM13._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar163._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM13._0_4_))))))));
              auVar163 = vbroadcastss_avx512vl(ZEXT416(2));
              auVar167 = vpermps_avx512vl(auVar163,_local_300);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM14 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM14._28_4_,
                                            CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                      (uint)!bVar12 * in_ZMM14._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                                (uint)!bVar11 * in_ZMM14._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar167._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM14._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar167._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM14.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar167._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM14._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar167._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM14._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar167._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM14._0_4_))))))));
              auVar167 = vbroadcastss_avx512vl(local_320._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM7 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                           (uint)!(bool)(bVar136 >> 7) * in_ZMM7._28_4_,
                                           CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                     (uint)!bVar12 * in_ZMM7._24_4_,
                                                     CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                               (uint)!bVar11 * in_ZMM7._20_4_,
                                                               CONCAT416((uint)bVar10 *
                                                                         auVar167._16_4_ |
                                                                         (uint)!bVar10 *
                                                                         in_ZMM7._16_4_,
                                                                         CONCAT412((uint)bVar9 *
                                                                                   auVar167._12_4_ |
                                                                                   (uint)!bVar9 *
                                                                                   in_ZMM7._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar8 * auVar167._8_4_ |
                                                  (uint)!bVar8 * in_ZMM7._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar167._4_4_ |
                                                           (uint)!bVar7 * in_ZMM7._4_4_,
                                                           (uint)(bVar136 & 1) * auVar167._0_4_ |
                                                           (uint)!(bool)(bVar136 & 1) *
                                                           in_ZMM7._0_4_))))))));
              auVar167 = vpermps_avx512vl(auVar161,local_320);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM8 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                           (uint)!(bool)(bVar136 >> 7) * in_ZMM8._28_4_,
                                           CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                     (uint)!bVar12 * in_ZMM8._24_4_,
                                                     CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                               (uint)!bVar11 * in_ZMM8._20_4_,
                                                               CONCAT416((uint)bVar10 *
                                                                         auVar167._16_4_ |
                                                                         (uint)!bVar10 *
                                                                         in_ZMM8._16_4_,
                                                                         CONCAT412((uint)bVar9 *
                                                                                   auVar167._12_4_ |
                                                                                   (uint)!bVar9 *
                                                                                   in_ZMM8._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar8 * auVar167._8_4_ |
                                                  (uint)!bVar8 * in_ZMM8._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar167._4_4_ |
                                                           (uint)!bVar7 * in_ZMM8._4_4_,
                                                           (uint)(bVar136 & 1) * auVar167._0_4_ |
                                                           (uint)!(bool)(bVar136 & 1) *
                                                           in_ZMM8._0_4_))))))));
              auVar167 = vpermps_avx512vl(auVar163,local_320);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM9 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                           (uint)!(bool)(bVar136 >> 7) * in_ZMM9._28_4_,
                                           CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                     (uint)!bVar12 * in_ZMM9._24_4_,
                                                     CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                               (uint)!bVar11 * in_ZMM9._20_4_,
                                                               CONCAT416((uint)bVar10 *
                                                                         auVar167._16_4_ |
                                                                         (uint)!bVar10 *
                                                                         in_ZMM9._16_4_,
                                                                         CONCAT412((uint)bVar9 *
                                                                                   auVar167._12_4_ |
                                                                                   (uint)!bVar9 *
                                                                                   in_ZMM9._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar8 * auVar167._8_4_ |
                                                  (uint)!bVar8 * in_ZMM9._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar167._4_4_ |
                                                           (uint)!bVar7 * in_ZMM9._4_4_,
                                                           (uint)(bVar136 & 1) * auVar167._0_4_ |
                                                           (uint)!(bool)(bVar136 & 1) *
                                                           in_ZMM9._0_4_))))))));
              auVar167 = vbroadcastss_avx512vl(local_340._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM4 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                           (uint)!(bool)(bVar136 >> 7) * in_ZMM4._28_4_,
                                           CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                     (uint)!bVar12 * in_ZMM4._24_4_,
                                                     CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                               (uint)!bVar11 * in_ZMM4._20_4_,
                                                               CONCAT416((uint)bVar10 *
                                                                         auVar167._16_4_ |
                                                                         (uint)!bVar10 *
                                                                         in_ZMM4._16_4_,
                                                                         CONCAT412((uint)bVar9 *
                                                                                   auVar167._12_4_ |
                                                                                   (uint)!bVar9 *
                                                                                   in_ZMM4._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar8 * auVar167._8_4_ |
                                                  (uint)!bVar8 * in_ZMM4._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar167._4_4_ |
                                                           (uint)!bVar7 * in_ZMM4._4_4_,
                                                           (uint)(bVar136 & 1) * auVar167._0_4_ |
                                                           (uint)!(bool)(bVar136 & 1) *
                                                           in_ZMM4._0_4_))))))));
              auVar167 = vpermps_avx512vl(auVar161,_local_340);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM5 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                           (uint)!(bool)(bVar136 >> 7) * in_ZMM5._28_4_,
                                           CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                     (uint)!bVar12 * in_ZMM5._24_4_,
                                                     CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                               (uint)!bVar11 * in_ZMM5._20_4_,
                                                               CONCAT416((uint)bVar10 *
                                                                         auVar167._16_4_ |
                                                                         (uint)!bVar10 *
                                                                         in_ZMM5._16_4_,
                                                                         CONCAT412((uint)bVar9 *
                                                                                   auVar167._12_4_ |
                                                                                   (uint)!bVar9 *
                                                                                   in_ZMM5._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar8 * auVar167._8_4_ |
                                                  (uint)!bVar8 * in_ZMM5._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar167._4_4_ |
                                                           (uint)!bVar7 * in_ZMM5._4_4_,
                                                           (uint)(bVar136 & 1) * auVar167._0_4_ |
                                                           (uint)!(bool)(bVar136 & 1) *
                                                           in_ZMM5._0_4_))))))));
              auVar167 = vpermps_avx512vl(auVar163,_local_340);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM6 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                           (uint)!(bool)(bVar136 >> 7) * in_ZMM6._28_4_,
                                           CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                     (uint)!bVar12 * in_ZMM6._24_4_,
                                                     CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                               (uint)!bVar11 * in_ZMM6._20_4_,
                                                               CONCAT416((uint)bVar10 *
                                                                         auVar167._16_4_ |
                                                                         (uint)!bVar10 *
                                                                         in_ZMM6._16_4_,
                                                                         CONCAT412((uint)bVar9 *
                                                                                   auVar167._12_4_ |
                                                                                   (uint)!bVar9 *
                                                                                   in_ZMM6._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar8 * auVar167._8_4_ |
                                                  (uint)!bVar8 * in_ZMM6._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar167._4_4_ |
                                                           (uint)!bVar7 * in_ZMM6._4_4_,
                                                           (uint)(bVar136 & 1) * auVar167._0_4_ |
                                                           (uint)!(bool)(bVar136 & 1) *
                                                           in_ZMM6._0_4_))))))));
              auVar167 = vbroadcastss_avx512vl(local_2e0._0_16_);
              auVar173._0_4_ =
                   (uint)(bVar136 & 1) * auVar167._0_4_ |
                   (uint)!(bool)(bVar136 & 1) * auVar248._0_4_;
              bVar7 = (bool)(bVar136 >> 1 & 1);
              auVar173._4_4_ = (uint)bVar7 * auVar167._4_4_ | (uint)!bVar7 * auVar248._4_4_;
              bVar7 = (bool)(bVar136 >> 2 & 1);
              auVar173._8_4_ = (uint)bVar7 * auVar167._8_4_ | (uint)!bVar7 * auVar248._8_4_;
              bVar7 = (bool)(bVar136 >> 3 & 1);
              auVar173._12_4_ = (uint)bVar7 * auVar167._12_4_ | (uint)!bVar7 * auVar248._12_4_;
              bVar7 = (bool)(bVar136 >> 4 & 1);
              auVar173._16_4_ = (uint)bVar7 * auVar167._16_4_ | (uint)!bVar7 * auVar248._16_4_;
              bVar7 = (bool)(bVar136 >> 5 & 1);
              auVar173._20_4_ = (uint)bVar7 * auVar167._20_4_ | (uint)!bVar7 * auVar248._20_4_;
              bVar7 = (bool)(bVar136 >> 6 & 1);
              auVar173._24_4_ = (uint)bVar7 * auVar167._24_4_ | (uint)!bVar7 * auVar248._24_4_;
              auVar173._28_4_ =
                   (uint)(bVar136 >> 7) * auVar167._28_4_ |
                   (uint)!(bool)(bVar136 >> 7) * auVar248._28_4_;
              auVar167 = vpermps_avx512vl(auVar161,local_2e0);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              auVar258 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * auVar258._28_4_,
                                            CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                      (uint)!bVar12 * auVar258._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                                (uint)!bVar11 * auVar258._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar167._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          auVar258._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar167._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      auVar258.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar167._8_4_ |
                                                                  (uint)!bVar8 * auVar258._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar167._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           auVar258._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar167._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           auVar258._0_4_))))))));
              auVar167 = vpermps_avx512vl(auVar163,local_2e0);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              auVar265 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * auVar265._28_4_,
                                            CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                      (uint)!bVar12 * auVar265._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                                (uint)!bVar11 * auVar265._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar167._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          auVar265._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar167._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      auVar265.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar167._8_4_ |
                                                                  (uint)!bVar8 * auVar265._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar167._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           auVar265._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar167._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           auVar265._0_4_))))))));
              auVar167 = vbroadcastss_avx512vl(local_2a0._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM21 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM21._28_4_,
                                            CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                      (uint)!bVar12 * in_ZMM21._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                                (uint)!bVar11 * in_ZMM21._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar167._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM21._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar167._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM21.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar167._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM21._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar167._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM21._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar167._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM21._0_4_))))))));
              auVar167 = vpermps_avx512vl(auVar161,local_2a0);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM23 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM23._28_4_,
                                            CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                      (uint)!bVar12 * in_ZMM23._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                                (uint)!bVar11 * in_ZMM23._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar167._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM23._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar167._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM23.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar167._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM23._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar167._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM23._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar167._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM23._0_4_))))))));
              auVar167 = vpermps_avx512vl(auVar163,local_2a0);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM24 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM24._28_4_,
                                            CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                      (uint)!bVar12 * in_ZMM24._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                                (uint)!bVar11 * in_ZMM24._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar167._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM24._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar167._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM24.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar167._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM24._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar167._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM24._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar167._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM24._0_4_))))))));
              auVar167 = vbroadcastss_avx512vl(auVar156._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM18 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM18._28_4_,
                                            CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                      (uint)!bVar12 * in_ZMM18._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                                (uint)!bVar11 * in_ZMM18._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar167._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM18._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar167._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM18.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar167._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM18._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar167._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM18._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar167._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM18._0_4_))))))));
              auVar167 = vpermps_avx512vl(auVar161,auVar156);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM20 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar167._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM20._28_4_,
                                            CONCAT424((uint)bVar12 * auVar167._24_4_ |
                                                      (uint)!bVar12 * in_ZMM20._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar167._20_4_ |
                                                                (uint)!bVar11 * in_ZMM20._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar167._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM20._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar167._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM20.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar167._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM20._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar167._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM20._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar167._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM20._0_4_))))))));
              in_ZMM28 = ZEXT3264(auVar156);
              auVar156 = vpermps_avx512vl(auVar163,auVar156);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM22 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar156._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM22._28_4_,
                                            CONCAT424((uint)bVar12 * auVar156._24_4_ |
                                                      (uint)!bVar12 * in_ZMM22._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar156._20_4_ |
                                                                (uint)!bVar11 * in_ZMM22._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar156._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM22._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar156._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM22.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar156._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM22._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar156._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM22._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar156._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM22._0_4_))))))));
              in_ZMM29 = ZEXT3264(auVar158);
              auVar156 = vbroadcastss_avx512vl(auVar158._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM15 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar156._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM15._28_4_,
                                            CONCAT424((uint)bVar12 * auVar156._24_4_ |
                                                      (uint)!bVar12 * in_ZMM15._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar156._20_4_ |
                                                                (uint)!bVar11 * in_ZMM15._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar156._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM15._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar156._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM15.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar156._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM15._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar156._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM15._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar156._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM15._0_4_))))))));
              auVar156 = vpermps_avx512vl(auVar161,auVar158);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM17 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar156._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM17._28_4_,
                                            CONCAT424((uint)bVar12 * auVar156._24_4_ |
                                                      (uint)!bVar12 * in_ZMM17._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar156._20_4_ |
                                                                (uint)!bVar11 * in_ZMM17._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar156._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM17._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar156._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM17.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar156._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM17._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar156._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM17._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar156._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM17._0_4_))))))));
              auVar156 = vpermps_avx512vl(auVar163,auVar158);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM19 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar156._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM19._28_4_,
                                            CONCAT424((uint)bVar12 * auVar156._24_4_ |
                                                      (uint)!bVar12 * in_ZMM19._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar156._20_4_ |
                                                                (uint)!bVar11 * in_ZMM19._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar156._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM19._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar156._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM19.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar156._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM19._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar156._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM19._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar156._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM19._0_4_))))))));
              auVar156 = vbroadcastss_avx512vl(in_ZMM31._0_16_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM10 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar156._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM10._28_4_,
                                            CONCAT424((uint)bVar12 * auVar156._24_4_ |
                                                      (uint)!bVar12 * in_ZMM10._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar156._20_4_ |
                                                                (uint)!bVar11 * in_ZMM10._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar156._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM10._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar156._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM10.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar156._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM10._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar156._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM10._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar156._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM10._0_4_))))))));
              auVar156 = vpermps_avx512vl(auVar161,in_ZMM31._0_32_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM11 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar156._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM11._28_4_,
                                            CONCAT424((uint)bVar12 * auVar156._24_4_ |
                                                      (uint)!bVar12 * in_ZMM11._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar156._20_4_ |
                                                                (uint)!bVar11 * in_ZMM11._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar156._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM11._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar156._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM11.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar156._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM11._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar156._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM11._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar156._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM11._0_4_))))))));
              auVar156 = vpermps_avx512vl(auVar163,in_ZMM31._0_32_);
              bVar7 = (bool)(bVar136 >> 1 & 1);
              bVar8 = (bool)(bVar136 >> 2 & 1);
              bVar9 = (bool)(bVar136 >> 3 & 1);
              bVar10 = (bool)(bVar136 >> 4 & 1);
              bVar11 = (bool)(bVar136 >> 5 & 1);
              bVar12 = (bool)(bVar136 >> 6 & 1);
              in_ZMM16 = ZEXT3264(CONCAT428((uint)(bVar136 >> 7) * auVar156._28_4_ |
                                            (uint)!(bool)(bVar136 >> 7) * in_ZMM16._28_4_,
                                            CONCAT424((uint)bVar12 * auVar156._24_4_ |
                                                      (uint)!bVar12 * in_ZMM16._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar156._20_4_ |
                                                                (uint)!bVar11 * in_ZMM16._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar156._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM16._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar156._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM16.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar156._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM16._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar156._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM16._4_4_,
                                                                           (uint)(bVar136 & 1) *
                                                                           auVar156._0_4_ |
                                                                           (uint)!(bool)(bVar136 & 1
                                                                                        ) *
                                                                           in_ZMM16._0_4_))))))));
              auVar248 = auVar173;
            }
          }
          auVar149 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar149 = vsubps_avx512vl(auVar149,auVar168);
          auVar156 = vmulps_avx512vl(auVar168,auVar156);
          auVar157 = vmulps_avx512vl(auVar168,auVar157);
          auVar158 = vmulps_avx512vl(auVar168,auVar158);
          auVar156 = vfmadd231ps_avx512vl(auVar156,auVar149,auVar346);
          auVar165 = vfmadd231ps_avx512vl(auVar157,auVar149,auVar165);
          auVar158 = vfmadd231ps_avx512vl(auVar158,auVar149,auVar153);
          auVar153 = vmulps_avx512vl(auVar168,auVar159);
          auVar157 = vmulps_avx512vl(auVar168,auVar160);
          auVar161 = vmulps_avx512vl(auVar168,auVar161);
          auVar153 = vfmadd231ps_avx512vl(auVar153,auVar149,in_ZMM7._0_32_);
          auVar166 = vfmadd231ps_avx512vl(auVar157,auVar149,auVar166);
          auVar161 = vfmadd231ps_avx512vl(auVar161,auVar149,auVar154);
          fVar226 = auVar168._0_4_;
          auVar295._0_4_ = auVar357._0_4_ * fVar226;
          fVar234 = auVar168._4_4_;
          auVar295._4_4_ = auVar357._4_4_ * fVar234;
          fVar235 = auVar168._8_4_;
          auVar295._8_4_ = auVar357._8_4_ * fVar235;
          fVar236 = auVar168._12_4_;
          auVar295._12_4_ = auVar357._12_4_ * fVar236;
          fVar237 = auVar168._16_4_;
          auVar295._16_4_ = auVar357._16_4_ * fVar237;
          fVar238 = auVar168._20_4_;
          auVar295._20_4_ = auVar357._20_4_ * fVar238;
          fVar239 = auVar168._24_4_;
          auVar295._28_36_ = in_ZMM7._28_36_;
          auVar295._24_4_ = auVar357._24_4_ * fVar239;
          auVar154 = vmulps_avx512vl(auVar168,auVar162);
          auVar163 = vmulps_avx512vl(auVar168,auVar163);
          auVar157 = vfmadd231ps_avx512vl(auVar295._0_32_,auVar149,auVar276);
          auVar167 = vfmadd231ps_avx512vl(auVar154,auVar149,auVar167);
          auVar163 = vfmadd231ps_avx512vl(auVar163,auVar149,in_ZMM6._0_32_);
          auVar316._0_4_ = in_ZMM10._0_4_ * fVar226;
          auVar316._4_4_ = in_ZMM10._4_4_ * fVar234;
          auVar316._8_4_ = in_ZMM10._8_4_ * fVar235;
          auVar316._12_4_ = in_ZMM10._12_4_ * fVar236;
          auVar316._16_4_ = in_ZMM10._16_4_ * fVar237;
          auVar316._20_4_ = in_ZMM10._20_4_ * fVar238;
          auVar316._28_36_ = in_ZMM10._28_36_;
          auVar316._24_4_ = in_ZMM10._24_4_ * fVar239;
          auVar335._0_4_ = in_ZMM11._0_4_ * fVar226;
          auVar335._4_4_ = in_ZMM11._4_4_ * fVar234;
          auVar335._8_4_ = in_ZMM11._8_4_ * fVar235;
          auVar335._12_4_ = in_ZMM11._12_4_ * fVar236;
          auVar335._16_4_ = in_ZMM11._16_4_ * fVar237;
          auVar335._20_4_ = in_ZMM11._20_4_ * fVar238;
          auVar335._28_36_ = in_ZMM11._28_36_;
          auVar335._24_4_ = in_ZMM11._24_4_ * fVar239;
          auVar154 = vmulps_avx512vl(auVar168,auVar150);
          auVar159 = vfmadd231ps_avx512vl(auVar316._0_32_,auVar149,auVar248);
          auVar160 = vfmadd231ps_avx512vl(auVar335._0_32_,auVar149,auVar155);
          auVar154 = vfmadd231ps_avx512vl(auVar154,auVar149,auVar265._0_32_);
          auVar43._4_4_ = auVar167._4_4_ * auVar161._4_4_;
          auVar43._0_4_ = auVar167._0_4_ * auVar161._0_4_;
          auVar43._8_4_ = auVar167._8_4_ * auVar161._8_4_;
          auVar43._12_4_ = auVar167._12_4_ * auVar161._12_4_;
          auVar43._16_4_ = auVar167._16_4_ * auVar161._16_4_;
          auVar43._20_4_ = auVar167._20_4_ * auVar161._20_4_;
          auVar43._24_4_ = auVar167._24_4_ * auVar161._24_4_;
          auVar43._28_4_ = auVar168._28_4_;
          auVar143 = vfmsub231ps_fma(auVar43,auVar166,auVar163);
          auVar258._0_4_ = auVar163._0_4_ * auVar153._0_4_;
          auVar258._4_4_ = auVar163._4_4_ * auVar153._4_4_;
          auVar258._8_4_ = auVar163._8_4_ * auVar153._8_4_;
          auVar258._12_4_ = auVar163._12_4_ * auVar153._12_4_;
          auVar258._16_4_ = auVar163._16_4_ * auVar153._16_4_;
          auVar258._20_4_ = auVar163._20_4_ * auVar153._20_4_;
          auVar258._28_36_ = auVar265._28_36_;
          auVar258._24_4_ = auVar163._24_4_ * auVar153._24_4_;
          auVar148 = vfmsub231ps_fma(auVar258._0_32_,auVar161,auVar157);
          auVar265._0_4_ = auVar166._0_4_ * auVar157._0_4_;
          auVar265._4_4_ = auVar166._4_4_ * auVar157._4_4_;
          auVar265._8_4_ = auVar166._8_4_ * auVar157._8_4_;
          auVar265._12_4_ = auVar166._12_4_ * auVar157._12_4_;
          auVar265._16_4_ = auVar166._16_4_ * auVar157._16_4_;
          auVar265._20_4_ = auVar166._20_4_ * auVar157._20_4_;
          auVar265._28_36_ = in_ZMM6._28_36_;
          auVar265._24_4_ = auVar166._24_4_ * auVar157._24_4_;
          auVar144 = vfmsub231ps_fma(auVar265._0_32_,auVar153,auVar167);
          auVar149 = vmulps_avx512vl(auVar165,auVar163);
          auVar168 = vfmsub231ps_avx512vl(auVar149,auVar167,auVar158);
          auVar149 = vmulps_avx512vl(auVar158,auVar157);
          auVar163 = vfmsub231ps_avx512vl(auVar149,auVar156,auVar163);
          auVar149 = vmulps_avx512vl(auVar156,auVar167);
          auVar155 = vfmsub231ps_avx512vl(auVar149,auVar165,auVar157);
          auVar149 = vmulps_avx512vl(auVar166,auVar158);
          auVar167 = vfmsub231ps_avx512vl(auVar149,auVar165,auVar161);
          auVar149 = vmulps_avx512vl(auVar161,auVar156);
          auVar157 = vfmsub231ps_avx512vl(auVar149,auVar158,auVar153);
          auVar149 = vmulps_avx512vl(auVar153,auVar165);
          auVar153 = vfmsub231ps_avx512vl(auVar149,auVar156,auVar166);
          auVar149 = vmulps_avx512vl(auVar158,ZEXT1632(auVar144));
          auVar149 = vfmadd231ps_avx512vl(auVar149,ZEXT1632(auVar148),auVar165);
          auVar162 = vfmadd231ps_avx512vl(auVar149,ZEXT1632(auVar143),auVar156);
          auVar149 = vdivps_avx(ZEXT1632(auVar143),auVar162);
          auVar156 = vdivps_avx(auVar168,auVar162);
          auVar158 = vdivps_avx(auVar167,auVar162);
          auVar161 = vdivps_avx(ZEXT1632(auVar148),auVar162);
          auVar163 = vdivps_avx(auVar163,auVar162);
          auVar168 = vdivps_avx(auVar157,auVar162);
          auVar167 = vdivps_avx(ZEXT1632(auVar144),auVar162);
          auVar155 = vdivps_avx(auVar155,auVar162);
          auVar165 = vdivps_avx(auVar153,auVar162);
          fVar226 = auVar154._0_4_;
          fVar234 = auVar154._4_4_;
          auVar44._4_4_ = fVar234 * auVar167._4_4_;
          auVar44._0_4_ = fVar226 * auVar167._0_4_;
          fVar235 = auVar154._8_4_;
          auVar44._8_4_ = fVar235 * auVar167._8_4_;
          fVar236 = auVar154._12_4_;
          auVar44._12_4_ = fVar236 * auVar167._12_4_;
          fVar237 = auVar154._16_4_;
          auVar44._16_4_ = fVar237 * auVar167._16_4_;
          fVar238 = auVar154._20_4_;
          auVar44._20_4_ = fVar238 * auVar167._20_4_;
          fVar239 = auVar154._24_4_;
          auVar44._24_4_ = fVar239 * auVar167._24_4_;
          auVar44._28_4_ = auVar153._28_4_;
          auVar45._4_4_ = fVar234 * auVar155._4_4_;
          auVar45._0_4_ = fVar226 * auVar155._0_4_;
          auVar45._8_4_ = fVar235 * auVar155._8_4_;
          auVar45._12_4_ = fVar236 * auVar155._12_4_;
          auVar45._16_4_ = fVar237 * auVar155._16_4_;
          auVar45._20_4_ = fVar238 * auVar155._20_4_;
          auVar45._24_4_ = fVar239 * auVar155._24_4_;
          auVar45._28_4_ = auVar162._28_4_;
          auVar46._4_4_ = fVar234 * auVar165._4_4_;
          auVar46._0_4_ = fVar226 * auVar165._0_4_;
          auVar46._8_4_ = fVar235 * auVar165._8_4_;
          auVar46._12_4_ = fVar236 * auVar165._12_4_;
          auVar46._16_4_ = fVar237 * auVar165._16_4_;
          auVar46._20_4_ = fVar238 * auVar165._20_4_;
          auVar46._24_4_ = fVar239 * auVar165._24_4_;
          auVar46._28_4_ = auVar166._28_4_;
          auVar143 = vfmadd231ps_fma(auVar44,auVar160,auVar161);
          auVar148 = vfmadd231ps_fma(auVar45,auVar160,auVar163);
          auVar144 = vfmadd231ps_fma(auVar46,auVar168,auVar160);
          auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar159,auVar149);
          auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar159,auVar156);
          auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar158,auVar159);
          auVar326._0_8_ = auVar143._0_8_ ^ 0x8000000080000000;
          auVar326._8_4_ = auVar143._8_4_ ^ 0x80000000;
          auVar326._12_4_ = auVar143._12_4_ ^ 0x80000000;
          auVar300._0_8_ = auVar148._0_8_ ^ 0x8000000080000000;
          auVar300._8_4_ = auVar148._8_4_ ^ 0x80000000;
          auVar300._12_4_ = auVar148._12_4_ ^ 0x80000000;
          auVar305._0_8_ = auVar144._0_8_ ^ 0x8000000080000000;
          auVar305._8_4_ = auVar144._8_4_ ^ 0x80000000;
          auVar305._12_4_ = auVar144._12_4_ ^ 0x80000000;
        }
        auVar330._16_4_ = 0x80000000;
        auVar330._0_16_ = auVar326;
        auVar311._16_4_ = 0x80000000;
        auVar311._0_16_ = auVar305;
        auVar301._16_4_ = 0x80000000;
        auVar301._0_16_ = auVar300;
        auVar330._20_4_ = 0x80000000;
        auVar311._20_4_ = 0x80000000;
        auVar301._20_4_ = 0x80000000;
        auVar330._24_4_ = 0x80000000;
        auVar311._24_4_ = 0x80000000;
        auVar301._24_4_ = 0x80000000;
        auVar330._28_4_ = 0x80000000;
        auVar311._28_4_ = 0x80000000;
        auVar301._28_4_ = 0x80000000;
        auVar166 = *(undefined1 (*) [32])ray;
        auVar153 = *(undefined1 (*) [32])(ray + 0x20);
        auVar154 = *(undefined1 (*) [32])(ray + 0x40);
        auVar157 = *(undefined1 (*) [32])(ray + 0x80);
        auVar159 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar160 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar143 = vfmadd231ps_fma(auVar330,auVar154,auVar167);
        auVar148 = vfmadd231ps_fma(auVar301,auVar154,auVar155);
        auVar144 = vfmadd231ps_fma(auVar311,auVar154,auVar165);
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar153,auVar161);
        auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar153,auVar163);
        auVar144 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar153,auVar168);
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar143),auVar166,auVar149);
        auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar166,auVar156);
        *(undefined1 (*) [32])ray = ZEXT1632(auVar143);
        auVar143 = vfmadd231ps_fma(ZEXT1632(auVar144),auVar166,auVar158);
        *(undefined1 (*) [32])(ray + 0x20) = ZEXT1632(auVar148);
        *(undefined1 (*) [32])(ray + 0x40) = ZEXT1632(auVar143);
        auVar167 = vmulps_avx512vl(auVar167,auVar160);
        auVar155 = vmulps_avx512vl(auVar155,auVar160);
        auVar165 = vmulps_avx512vl(auVar165,auVar160);
        auVar161 = vfmadd231ps_avx512vl(auVar167,auVar159,auVar161);
        auVar163 = vfmadd231ps_avx512vl(auVar155,auVar159,auVar163);
        auVar168 = vfmadd231ps_avx512vl(auVar165,auVar159,auVar168);
        auVar143 = vfmadd231ps_fma(auVar161,auVar157,auVar149);
        auVar148 = vfmadd231ps_fma(auVar163,auVar157,auVar156);
        auVar144 = vfmadd231ps_fma(auVar168,auVar157,auVar158);
        *(undefined1 (*) [32])(ray + 0x80) = ZEXT1632(auVar143);
        *(undefined1 (*) [32])(ray + 0xa0) = ZEXT1632(auVar148);
        *(undefined1 (*) [32])(ray + 0xc0) = ZEXT1632(auVar144);
        local_60 = context->args;
        local_1e0 = vpmovm2d_avx512vl(uVar139 & 0xffffffff);
        local_68 = pRVar3;
        (**(code **)&local_70->field_0xe8)(local_1e0,&(local_70->super_AccelData).field_0x58,ray);
        local_300 = auVar166._0_8_;
        uStack_2f8 = auVar166._8_8_;
        uStack_2f0 = auVar166._16_8_;
        uStack_2e8 = auVar166._24_8_;
        *(undefined1 (*) [8])ray = local_300;
        *(undefined8 *)(ray + 8) = uStack_2f8;
        *(undefined8 *)(ray + 0x10) = uStack_2f0;
        *(undefined8 *)(ray + 0x18) = uStack_2e8;
        local_2c0._0_8_ = auVar153._0_8_;
        local_2c0._8_8_ = auVar153._8_8_;
        local_2c0._16_8_ = auVar153._16_8_;
        local_2c0._24_8_ = auVar153._24_8_;
        *(undefined8 *)(ray + 0x20) = local_2c0._0_8_;
        *(undefined8 *)(ray + 0x28) = local_2c0._8_8_;
        *(undefined8 *)(ray + 0x30) = local_2c0._16_8_;
        *(undefined8 *)(ray + 0x38) = local_2c0._24_8_;
        local_280 = auVar154._0_8_;
        uStack_278 = auVar154._8_8_;
        uStack_270 = auVar154._16_8_;
        uStack_268 = auVar154._24_8_;
        *(undefined8 *)(ray + 0x40) = local_280;
        *(undefined8 *)(ray + 0x48) = uStack_278;
        *(undefined8 *)(ray + 0x50) = uStack_270;
        *(undefined8 *)(ray + 0x58) = uStack_268;
        local_2e0._0_8_ = auVar157._0_8_;
        local_2e0._8_8_ = auVar157._8_8_;
        local_2e0._16_8_ = auVar157._16_8_;
        local_2e0._24_8_ = auVar157._24_8_;
        *(undefined8 *)(ray + 0x80) = local_2e0._0_8_;
        *(undefined8 *)(ray + 0x88) = local_2e0._8_8_;
        *(undefined8 *)(ray + 0x90) = local_2e0._16_8_;
        *(undefined8 *)(ray + 0x98) = local_2e0._24_8_;
        local_340 = auVar159._0_8_;
        uStack_338 = auVar159._8_8_;
        uStack_330 = auVar159._16_8_;
        uStack_328 = auVar159._24_8_;
        *(undefined1 (*) [8])(ray + 0xa0) = local_340;
        *(undefined8 *)(ray + 0xa8) = uStack_338;
        *(undefined8 *)(ray + 0xb0) = uStack_330;
        *(undefined8 *)(ray + 0xb8) = uStack_328;
        local_320._0_8_ = auVar160._0_8_;
        local_320._8_8_ = auVar160._8_8_;
        local_320._16_8_ = auVar160._16_8_;
        local_320._24_8_ = auVar160._24_8_;
        *(undefined8 *)(ray + 0xc0) = local_320._0_8_;
        *(undefined8 *)(ray + 200) = local_320._8_8_;
        *(undefined8 *)(ray + 0xd0) = local_320._16_8_;
        *(undefined8 *)(ray + 0xd8) = local_320._24_8_;
        uVar18 = vcmpps_avx512vl(ZEXT832(0) << 0x20,*(undefined1 (*) [32])(ray + 0x100),0xe);
        *this = SUB81(uVar18,0);
        pRVar3->instID[0] = 0xffffffff;
        pRVar3->instPrimID[0] = 0xffffffff;
      }
      goto LAB_01f37c34;
    }
  }
  *this = (InstanceArrayIntersectorKMB<8>)0x0;
LAB_01f37c34:
  return (vbool<8>_conflict)(__mmask8)this;
}

Assistant:

vbool<K> InstanceArrayIntersectorKMB<K>::occluded(const vbool<K>& valid_i, const Precalculations& pre, RayK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return false;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      vbool<K> occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }